

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_doc *
duckdb_yyjson::yyjson_read_opts
          (char *dat,usize len,yyjson_read_flag flg,yyjson_alc *alc_ptr,yyjson_read_err *err)

{
  uint *puVar1;
  byte *pbVar2;
  char *pcVar3;
  char cVar4;
  byte bVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  yyjson_val_uni yVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ushort uVar75;
  yyjson_alc alc;
  bool bVar76;
  uint uVar77;
  yyjson_read_code yVar78;
  yyjson_val_uni *pyVar79;
  yyjson_doc *pyVar80;
  yyjson_val_uni *pyVar81;
  ulong uVar82;
  yyjson_doc *pyVar83;
  uint64_t uVar84;
  ulong extraout_RAX;
  yyjson_read_err *pyVar85;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  bigint *pbVar86;
  ulong extraout_RAX_02;
  yyjson_read_err *pyVar87;
  char cVar88;
  sbyte sVar89;
  byte bVar90;
  byte bVar91;
  yyjson_val_uni *pyVar92;
  yyjson_val_uni *pyVar93;
  uint64_t uVar94;
  yyjson_val_uni *sig_cut;
  ulong uVar95;
  long lVar96;
  long lVar97;
  u64 uVar98;
  yyjson_val_uni *pyVar99;
  char *pcVar100;
  bigint *pbVar101;
  u8 *cur_1;
  yyjson_val_uni *pyVar102;
  u64 *__s;
  yyjson_val_uni *pyVar103;
  size_t sVar104;
  uint uVar105;
  uint uVar106;
  ulong uVar107;
  void *pvVar108;
  yyjson_val_uni *pyVar109;
  yyjson_val_uni *pyVar110;
  code *pcVar111;
  yyjson_val_uni *pyVar112;
  u8 **ppuVar113;
  int iVar114;
  int iVar115;
  u8 *cur_4;
  ulong uVar116;
  ulong uVar117;
  yyjson_val_uni *pyVar118;
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  double dVar128;
  char *msg;
  i32 exp;
  yyjson_read_err dummy_err;
  u8 *cur;
  bigint big_full;
  yyjson_val_uni *local_560;
  yyjson_val_uni *local_558;
  yyjson_val_uni *local_550;
  yyjson_val_uni *local_548;
  yyjson_val_uni *local_540;
  yyjson_val_uni *local_538;
  u8 **local_530;
  yyjson_val_uni *local_528;
  yyjson_val_uni *local_520;
  yyjson_read_err *local_518;
  char *local_510;
  yyjson_doc *local_508;
  yyjson_read_err *local_500;
  yyjson_val_uni *local_4f8;
  yyjson_val_uni *local_4f0;
  void *local_4e8;
  yyjson_val_uni *local_4e0;
  uint local_4d4;
  _func_void_void_ptr_void_ptr *local_4d0;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *local_4c8;
  yyjson_read_err local_4c0;
  yyjson_val_uni *local_4a8;
  yyjson_val_uni *local_4a0;
  bigint *local_498;
  yyjson_val_uni *local_490;
  yyjson_val_uni *local_488;
  bigint *local_480;
  _func_void_ptr_void_ptr_size_t *local_478;
  usize local_470;
  u8 *local_468;
  bigint local_460;
  bigint local_258;
  _func_void_ptr_void_ptr_size_t *local_50;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Stack_48;
  _func_void_void_ptr_void_ptr *local_40;
  void *pvStack_38;
  
  local_500 = err;
  if (err == (yyjson_read_err *)0x0) {
    local_500 = &local_4c0;
  }
  if (alc_ptr == (yyjson_alc *)0x0) {
    pcVar111 = default_malloc;
    local_4c8 = default_realloc;
    local_4d0 = default_free;
    pvVar108 = (void *)0x0;
  }
  else {
    pcVar111 = alc_ptr->malloc;
    local_4c8 = alc_ptr->realloc;
    local_4d0 = alc_ptr->free;
    pvVar108 = alc_ptr->ctx;
  }
  pyVar87 = &local_4c0;
  if (dat == (char *)0x0) {
    if (err != (yyjson_read_err *)0x0) {
      pyVar87 = err;
    }
    pyVar87->pos = 0;
    pcVar100 = "input data is NULL";
LAB_0124fd95:
    pyVar87->msg = pcVar100;
    local_500->code = 1;
    return (yyjson_doc *)0x0;
  }
  if (len == 0) {
    if (err != (yyjson_read_err *)0x0) {
      pyVar87 = err;
    }
    pyVar87->pos = 0;
    pcVar100 = "input length is 0";
    goto LAB_0124fd95;
  }
  local_470 = len;
  if ((flg & 1) == 0) {
    if (0xfffffffffffffffa < len) {
      if (err != (yyjson_read_err *)0x0) {
        pyVar87 = err;
      }
      pyVar87->pos = 0;
      pyVar87->msg = "memory allocation failed";
      local_500->code = 2;
      return (yyjson_doc *)0x0;
    }
    pyVar79 = (yyjson_val_uni *)(*pcVar111)(pvVar108,len + 4);
    if (pyVar79 == (yyjson_val_uni *)0x0) {
      if (err != (yyjson_read_err *)0x0) {
        pyVar87 = err;
      }
      pyVar87->pos = 0;
      pyVar87->msg = "memory allocation failed";
      local_500->code = 2;
      return (yyjson_doc *)0x0;
    }
    pyVar102 = (yyjson_val_uni *)((long)pyVar79 + len);
    local_490 = pyVar79;
    switchD_00b1522a::default(pyVar79,dat,len);
    *(undefined4 *)((long)pyVar79 + len) = 0;
    local_4f8 = pyVar79;
    local_488 = pyVar79;
  }
  else {
    pyVar102 = (yyjson_val_uni *)(dat + len);
    local_488 = (yyjson_val_uni *)0x0;
    local_4f8 = (yyjson_val_uni *)dat;
    local_490 = (yyjson_val_uni *)dat;
  }
  pyVar87 = local_500;
  if ((char_table[*(byte *)local_490] & 0x21) != 0) {
    if ((flg & 8) == 0) {
      yyjson_read_opts();
    }
    else {
      bVar76 = skip_spaces_and_comments((u8 **)&local_490);
      if (!bVar76) {
        pyVar85 = &local_4c0;
        if (err != (yyjson_read_err *)0x0) {
          pyVar85 = err;
        }
        pyVar85->pos = (long)local_490 - (long)local_4f8;
        pyVar85->msg = "unclosed multiline comment";
        pyVar87->code = 8;
        goto joined_r0x01250ee2;
      }
    }
    if (pyVar102 <= local_490) {
      pyVar85 = &local_4c0;
      if (err != (yyjson_read_err *)0x0) {
        pyVar85 = err;
      }
      pyVar85->pos = 0;
      pyVar85->msg = "input data is empty";
      pyVar87->code = 3;
joined_r0x01250ee2:
      if ((flg & 1) != 0) {
        return (yyjson_doc *)0x0;
      }
      (*local_4d0)(pvVar108,local_4f8);
      return (yyjson_doc *)0x0;
    }
  }
  pyVar79 = local_4f8;
  local_518 = err;
  local_4e8 = pvVar108;
  if (((ulong)*local_490 & 0xdf) == 0x5b) {
    cVar88 = (char)flg;
    local_4e0 = pyVar102;
    local_478 = pcVar111;
    if (((char_table[*(byte *)((long)local_490 + 1)] & 1) == 0) ||
       ((char_table[*(byte *)((long)local_490 + 2)] & 1) == 0)) {
      uVar95 = (ulong)((long)pyVar102 - (long)local_490) / 6;
      if (0xffffffffffffff6 < uVar95) {
        uVar95 = 0xffffffffffffff7;
      }
      local_560 = local_490;
      pyVar79 = (yyjson_val_uni *)&DAT_00000032;
      if ((flg & 2) == 0) {
        pyVar79 = (yyjson_val_uni *)(uVar95 + 8);
      }
      pyVar80 = (yyjson_doc *)(*pcVar111)(pvVar108,(long)pyVar79 * 0x10);
      if (pyVar80 != (yyjson_doc *)0x0) {
        pyVar112 = (yyjson_val_uni *)((long)pyVar80 + ((long)pyVar79 * 0x10 - 0x20U));
        pyVar102 = (yyjson_val_uni *)(pyVar80 + 1);
        local_468 = (u8 *)0x0;
        ppuVar113 = (u8 **)0x0;
        if ((flg & 0xa0) != 0) {
          ppuVar113 = &local_468;
        }
        pyVar110 = pyVar102;
        if (*(char *)local_560 != '{') {
          pyVar80[1].root = (yyjson_val *)0x6;
          pyVar80[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
          pyVar103 = (yyjson_val_uni *)0x0;
          local_560 = (yyjson_val_uni *)((long)local_560 + 1);
          goto LAB_0124ecb4;
        }
        pyVar80[1].root = (yyjson_val *)0x7;
        pyVar80[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        pyVar103 = (yyjson_val_uni *)0x0;
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
LAB_0125205c:
LAB_01252061:
        while( true ) {
          bVar91 = *(byte *)local_560;
          if (bVar91 == 0x22) break;
          if (bVar91 == 0x7d) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            if (pyVar103 == (yyjson_val_uni *)0x0) {
              pyVar103 = (yyjson_val_uni *)0x0;
            }
            else if ((flg & 4) == 0) {
              cVar88 = *(char *)local_560;
              while (cVar88 != ',') {
                local_560 = (yyjson_val_uni *)((long)local_560 + -1);
                cVar88 = *(char *)local_560;
              }
              goto LAB_0125a82a;
            }
            do {
              uVar84 = pyVar110[1].u64;
              pyVar110[1].str = (char *)((long)pyVar102 + (0x10 - (long)pyVar110));
              pyVar110->u64 = (long)pyVar103 << 7 | 7;
LAB_0125c5ef:
              if (uVar84 == 0) {
                if ((local_4e0 <= local_560) || ((flg & 2) != 0)) goto LAB_0125c6ee;
                if ((flg & 8) == 0) {
                  bVar91 = char_table[*(byte *)local_560];
                  while ((bVar91 & 1) != 0) {
                    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                    bVar91 = char_table[*(byte *)local_560];
                  }
                }
                else {
                  skip_spaces_and_comments((u8 **)&local_560);
                  if (*(short *)local_560 == 0x2a2f) goto LAB_01255626;
                }
                pyVar110 = local_4e0;
                pyVar112 = local_4f8;
                pyVar79 = local_560;
                if (local_560 < local_4e0) {
                  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,
                                            (u8 *)&local_4e0->u64,4,flg);
                  if (bVar76) {
                    pyVar79 = pyVar110;
                  }
                  pcVar100 = "unexpected content after document";
                  if (bVar76) {
                    pcVar100 = "unexpected end of data";
                  }
                  pyVar87 = local_518;
                  if (local_518 == (yyjson_read_err *)0x0) {
                    pyVar87 = &local_4c0;
                  }
                  pyVar87->pos = (long)pyVar79 - (long)pyVar112;
                  goto LAB_0125ca58;
                }
LAB_0125c6ee:
                if (((flg & 0xa0) != 0) && (*ppuVar113 != (u8 *)0x0)) {
                  **ppuVar113 = '\0';
                }
                pyVar80->root = (yyjson_val *)(pyVar80 + 1);
                (pyVar80->alc).malloc = local_478;
                (pyVar80->alc).realloc = local_4c8;
                (pyVar80->alc).free = local_4d0;
                (pyVar80->alc).ctx = local_4e8;
                pyVar80->dat_read = (long)local_560 - (long)local_4f8;
                pyVar80->val_read = ((long)pyVar102 - (long)(pyVar80 + 1) >> 4) + 1;
                goto LAB_0125c759;
              }
              pyVar110 = (yyjson_val_uni *)((long)pyVar110 - uVar84);
              pyVar103 = (yyjson_val_uni *)(pyVar110->u64 >> 8);
              if ((~(uint)pyVar110->u64 & 7) != 0) goto LAB_0125c529;
LAB_0125c612:
              while( true ) {
                bVar91 = *(byte *)local_560;
                if (bVar91 == 0x2c) {
                  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                  goto LAB_0125205c;
                }
                if (bVar91 == 0x7d) break;
                local_538 = pyVar79;
                local_550 = pyVar102;
                local_520 = pyVar103;
                if ((char_table[bVar91] & 1) == 0) {
                  if ((flg & 8) == 0) goto LAB_0125c7ae;
                  bVar76 = skip_spaces_and_comments((u8 **)&local_560);
                  pyVar102 = local_550;
                  pyVar79 = local_538;
                  pyVar103 = local_520;
                  if (!bVar76) goto LAB_01255616;
                }
                else {
                  do {
                    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                  } while ((char_table[*(byte *)local_560] & 1) != 0);
                }
              }
              local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            } while( true );
          }
          local_550 = pyVar102;
          if ((char_table[bVar91] & 1) != 0) goto LAB_012520ef;
          local_558 = pyVar112;
          local_520 = pyVar103;
          if ((flg & 8) == 0) goto LAB_0125c7ae;
          bVar76 = skip_spaces_and_comments((u8 **)&local_560);
          pyVar102 = local_550;
          pyVar112 = local_558;
          pyVar103 = local_520;
          if (!bVar76) goto LAB_01255616;
        }
        pyVar102 = pyVar102 + 2;
        local_538 = pyVar79;
        if (pyVar112 <= pyVar102) {
          local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
          sVar104 = (long)local_538 * 0x10;
          local_558 = pyVar112;
          local_530 = ppuVar113;
          local_520 = pyVar103;
          pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
          if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
          pyVar102 = (yyjson_val_uni *)(((long)pyVar102 - (long)pyVar80) + (long)pyVar83);
          pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
          pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
          ppuVar113 = local_530;
          pyVar103 = local_520;
          pyVar80 = pyVar83;
        }
        local_540 = (yyjson_val_uni *)((long)pyVar103 + 1);
        pyVar79 = (yyjson_val_uni *)((long)local_560 + 1);
        local_560 = pyVar79;
LAB_01252136:
        pyVar109 = local_560;
        if ((char_table[*(byte *)pyVar109] & 0xc) == 0) {
          pyVar81 = pyVar109 + 1;
          do {
            pyVar109 = pyVar81;
            if ((char_table[*(byte *)((long)pyVar109 + -7)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -7);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -6)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -6);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -5)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -5);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -4)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -4);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -3)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -3);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -2)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -2);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + -1)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -1);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)pyVar109] & 0xc) != 0) goto LAB_0125227c;
            if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
              goto LAB_0125227c;
            }
            if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
              pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
              goto LAB_0125227c;
            }
            pyVar81 = pyVar109 + 2;
          } while ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) == 0);
          pyVar109 = pyVar109 + 1;
        }
LAB_0125227c:
        uVar95 = 0xd;
        pyVar81 = pyVar109;
        local_528 = pyVar102;
        local_558 = pyVar112;
        if (*(char *)pyVar109 == '\"') goto LAB_012523d9;
        if (*(char *)pyVar109 < '\0') {
          uVar105 = *(uint *)pyVar109;
          local_560 = pyVar109;
          while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
                 ((uVar105 & 0x200f) != 0x200d))) {
            puVar1 = (uint *)((long)local_560 + 3);
            local_560 = (yyjson_val_uni *)((long)local_560 + 3);
            uVar105 = *puVar1;
          }
          if ((char)uVar105 < '\0') {
            if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
              do {
                uVar105 = *(uint *)((long)local_560 + 2);
                local_560 = (yyjson_val_uni *)((long)local_560 + 2);
                if ((uVar105 & 0xc0e0) != 0x80c0) break;
              } while ((uVar105 & 0x1e) != 0);
            }
            if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
              while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
                uVar105 = *(uint *)((long)local_560 + 4);
                local_560 = (yyjson_val_uni *)((long)local_560 + 4);
                if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
              }
            }
            local_508 = pyVar80;
            if (pyVar109 == local_560) {
              if ((flg & 0x40) == 0) goto LAB_0125bac0;
              local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            }
          }
          goto LAB_01252136;
        }
LAB_01253402:
        cVar4 = *(char *)pyVar109;
        local_548 = pyVar110;
        if (cVar4 == '\\') {
          bVar91 = *(byte *)((long)pyVar109 + 1);
          if (bVar91 < 0x62) {
            if (bVar91 == 0x22) {
              *(char *)pyVar81 = '\"';
            }
            else if (bVar91 == 0x2f) {
              *(char *)pyVar81 = '/';
            }
            else {
              local_508 = pyVar80;
              if (bVar91 != 0x5c) goto switchD_01250f58_caseD_6f;
              *(char *)pyVar81 = '\\';
            }
          }
          else {
            local_508 = pyVar80;
            switch(bVar91) {
            case 0x6e:
              *(char *)pyVar81 = '\n';
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              goto switchD_01250f58_caseD_6f;
            case 0x72:
              *(char *)pyVar81 = '\r';
              break;
            case 0x74:
              *(char *)pyVar81 = '\t';
              break;
            case 0x75:
              uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 3)],
                                hex_conv_table[*(byte *)((long)pyVar109 + 5)]);
              if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                      hex_conv_table[*(byte *)((long)pyVar109 + 4)])) & 0xf0f0) != 0
                 ) goto LAB_0125b745;
              uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                       hex_conv_table[*(byte *)((long)pyVar109 + 4)]) << 4;
              uVar77 = uVar75 | uVar105;
              local_560 = (yyjson_val_uni *)((long)pyVar109 + 6);
              if ((uVar77 & 0xf800) == 0xd800) {
                if ((uVar77 & 0xdc00) == 0xd800) {
                  if (*(short *)local_560 == 0x755c) {
                    if (((CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                                   hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]) |
                         CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                                  hex_conv_table[*(byte *)((long)pyVar109 + 10)])) & 0xf0f0) == 0) {
                      uVar105 = (CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                                          hex_conv_table[*(byte *)((long)pyVar109 + 10)]) & 0xfff)
                                << 4 | (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                                                      hex_conv_table
                                                      [*(byte *)((long)pyVar109 + 0xb)]);
                      if ((uVar105 & 0xfc00) == 0xdc00) {
                        iVar115 = (uVar77 & 0xdbff) * 0x400;
                        uVar77 = iVar115 + uVar105 + 0xfca02400;
                        *(byte *)pyVar81 = (byte)(uVar77 >> 0x12) | 0xf0;
                        *(byte *)((long)pyVar81 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
                        *(byte *)((long)pyVar81 + 2) =
                             (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
                        *(byte *)((long)pyVar81 + 3) = (byte)uVar105 & 0x3f | 0x80;
                        pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
                        local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
                        goto LAB_0125353c;
                      }
                      goto LAB_0125bfb1;
                    }
                    goto LAB_0125bfa5;
                  }
                  goto LAB_0125bf99;
                }
                goto LAB_0125bf8d;
              }
              uVar105 = (uint)uVar75 | uVar105 & 0xffff;
              bVar91 = (byte)uVar77;
              if (uVar105 < 0x800) {
                if (uVar105 < 0x80) {
                  *(byte *)pyVar81 = bVar91;
                  pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
                }
                else {
                  *(byte *)pyVar81 = (byte)(uVar77 >> 6) | 0xc0;
                  *(byte *)((long)pyVar81 + 1) = bVar91 & 0x3f | 0x80;
                  pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
                }
              }
              else {
                *(byte *)pyVar81 = (byte)(uVar105 >> 0xc) | 0xe0;
                *(byte *)((long)pyVar81 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
                *(byte *)((long)pyVar81 + 2) = bVar91 & 0x3f | 0x80;
                pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
              }
              goto LAB_0125353c;
            default:
              if (bVar91 == 0x62) {
                *(char *)pyVar81 = '\b';
              }
              else {
                if (bVar91 != 0x66) goto switchD_01250f58_caseD_6f;
                *(char *)pyVar81 = '\f';
              }
            }
          }
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
          local_560 = (yyjson_val_uni *)((long)pyVar109 + 2);
        }
        else {
          if (cVar4 == '\"') goto LAB_0125464a;
          local_508 = pyVar80;
          if ((flg & 0x40) == 0) goto LAB_0125bf81;
          if (local_4e0 <= pyVar109) goto LAB_0125bf75;
          *(char *)pyVar81 = cVar4;
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
          local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
        }
LAB_0125353c:
        do {
          pyVar109 = local_560;
          if ((char_table[*(byte *)pyVar109] & 0xc) != 0) {
LAB_0125379f:
            while( true ) {
              if (-1 < *(char *)pyVar109) goto LAB_01253402;
              uVar105 = *(uint *)pyVar109;
              local_560 = pyVar109;
              while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
                     ((uVar105 & 0x200f) != 0x200d))) {
                *(uint *)pyVar81 = uVar105;
                pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
                puVar1 = (uint *)((long)local_560 + 3);
                local_560 = (yyjson_val_uni *)((long)local_560 + 3);
                uVar105 = *puVar1;
              }
              if (-1 < (char)uVar105) break;
              if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
                do {
                  *(short *)pyVar81 = (short)uVar105;
                  pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
                  uVar105 = *(uint *)((long)local_560 + 2);
                  local_560 = (yyjson_val_uni *)((long)local_560 + 2);
                  if ((uVar105 & 0xc0e0) != 0x80c0) break;
                } while ((uVar105 & 0x1e) != 0);
              }
              if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
                while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
                  *(uint *)pyVar81 = uVar105;
                  pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
                  uVar105 = *(uint *)((long)local_560 + 4);
                  local_560 = (yyjson_val_uni *)((long)local_560 + 4);
                  if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
                }
              }
              if (pyVar109 != local_560) break;
              local_508 = pyVar80;
              if ((flg & 0x40) == 0) goto LAB_0125b72f;
LAB_0125388d:
              *(undefined2 *)pyVar81 = *(undefined2 *)local_560;
              pyVar109 = (yyjson_val_uni *)((long)local_560 + 1);
              pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
            }
            goto LAB_0125353c;
          }
          local_560 = pyVar109;
          if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) goto LAB_0125388d;
          if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
            uVar6 = *(undefined2 *)pyVar109;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
            *(undefined2 *)pyVar81 = uVar6;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
            uVar7 = *(undefined4 *)pyVar109;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
            *(undefined4 *)pyVar81 = uVar7;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
            uVar7 = *(undefined4 *)pyVar109;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
            *(undefined4 *)pyVar81 = uVar7;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
            *(undefined4 *)pyVar81 = *(undefined4 *)pyVar109;
            *(undefined2 *)((long)pyVar81 + 4) = *(undefined2 *)((long)pyVar109 + 4);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 5);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
            *(undefined4 *)pyVar81 = *(undefined4 *)pyVar109;
            *(undefined2 *)((long)pyVar81 + 4) = *(undefined2 *)((long)pyVar109 + 4);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 6);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
            yVar8 = *pyVar109;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
            *pyVar81 = yVar8;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 7);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) != 0) {
            yVar8 = *pyVar109;
            pyVar109 = pyVar109 + 1;
            *pyVar81 = yVar8;
            pyVar81 = pyVar81 + 1;
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 9)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined2 *)(pyVar81 + 1) = *(undefined2 *)(pyVar109 + 1);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 9);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 9);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 10)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined2 *)(pyVar81 + 1) = *(undefined2 *)(pyVar109 + 1);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 10);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 10);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 0xb)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 0xc)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 0xd)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
            *(undefined2 *)((long)pyVar81 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
            goto LAB_0125379f;
          }
          if ((char_table[*(byte *)((long)pyVar109 + 0xe)] & 0xc) != 0) {
            *pyVar81 = *pyVar109;
            *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
            *(undefined2 *)((long)pyVar81 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
            goto LAB_0125379f;
          }
          bVar91 = char_table[*(byte *)((long)pyVar109 + 0xf)];
          yVar8 = pyVar109[1];
          *pyVar81 = *pyVar109;
          pyVar81[1] = yVar8;
          if ((bVar91 & 0xc) != 0) {
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
            goto LAB_0125379f;
          }
          pyVar81 = pyVar81 + 2;
          local_560 = pyVar109 + 2;
        } while( true );
      }
LAB_0124ff0a:
      pyVar112 = local_4e0;
      pyVar79 = local_4f8;
      pyVar102 = local_560;
      bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,2,
                                flg);
      if (bVar76) {
        pyVar102 = pyVar112;
      }
      pcVar100 = "memory allocation failed";
      if (bVar76) {
        pcVar100 = "unexpected end of data";
      }
      sVar104 = (long)pyVar102 - (long)pyVar79;
      err = local_518;
    }
    else {
      uVar95 = (ulong)((long)pyVar102 - (long)local_490) >> 4;
      if (0xffffffffffffff6 < uVar95) {
        uVar95 = 0xffffffffffffff7;
      }
      local_560 = local_490;
      pyVar79 = (yyjson_val_uni *)0x18;
      if ((flg & 2) == 0) {
        pyVar79 = (yyjson_val_uni *)(uVar95 + 8);
      }
      pyVar80 = (yyjson_doc *)(*pcVar111)(pvVar108,(long)pyVar79 * 0x10);
      if (pyVar80 != (yyjson_doc *)0x0) {
        pyVar102 = (yyjson_val_uni *)((long)pyVar80 + ((long)pyVar79 * 0x10 - 0x20U));
        pyVar112 = (yyjson_val_uni *)(pyVar80 + 1);
        local_468 = (u8 *)0x0;
        ppuVar113 = (u8 **)0x0;
        if ((flg & 0xa0) != 0) {
          ppuVar113 = &local_468;
        }
        pyVar110 = (yyjson_val_uni *)((long)local_560 + 1);
        if (*(char *)local_560 != '{') {
          pyVar80[1].root = (yyjson_val *)0x6;
          pyVar80[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
          if (*(char *)pyVar110 != '\n') goto LAB_0124ef49;
          pyVar110 = (yyjson_val_uni *)((long)local_560 + 2);
          goto LAB_0124ef49;
        }
        pyVar80[1].root = (yyjson_val *)0x7;
        pyVar80[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        if (*(char *)pyVar110 == '\n') {
          pyVar110 = (yyjson_val_uni *)((long)local_560 + 2);
        }
LAB_0124ef20:
        local_560 = pyVar110;
        pyVar103 = (yyjson_val_uni *)0x0;
        pyVar110 = pyVar112;
LAB_012556a6:
LAB_012556ab:
        pyVar109 = local_560;
        if (*(short *)local_560 == 0x2020) {
          while (((((((local_560 = (yyjson_val_uni *)((long)pyVar109 + 2),
                      *(short *)((long)pyVar109 + 2) == 0x2020 &&
                      (local_560 = (yyjson_val_uni *)((long)pyVar109 + 4),
                      *(short *)((long)pyVar109 + 4) == 0x2020)) &&
                     (local_560 = (yyjson_val_uni *)((long)pyVar109 + 6),
                     *(short *)((long)pyVar109 + 6) == 0x2020)) &&
                    ((local_560 = pyVar109 + 1, *(short *)(pyVar109 + 1) == 0x2020 &&
                     (local_560 = (yyjson_val_uni *)((long)pyVar109 + 10),
                     *(short *)((long)pyVar109 + 10) == 0x2020)))) &&
                   (local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xc),
                   *(short *)((long)pyVar109 + 0xc) == 0x2020)) &&
                  ((local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xe),
                   *(short *)((long)pyVar109 + 0xe) == 0x2020 &&
                   (local_560 = pyVar109 + 2, *(short *)(pyVar109 + 2) == 0x2020)))) &&
                 ((local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x12),
                  *(short *)((long)pyVar109 + 0x12) == 0x2020 &&
                  (((local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x14),
                    *(short *)((long)pyVar109 + 0x14) == 0x2020 &&
                    (local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x16),
                    *(short *)((long)pyVar109 + 0x16) == 0x2020)) &&
                   (local_560 = pyVar109 + 3, *(short *)(pyVar109 + 3) == 0x2020))))))) {
            local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x1a);
            if ((((*(short *)((long)pyVar109 + 0x1a) != 0x2020) ||
                 (local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x1c),
                 *(short *)((long)pyVar109 + 0x1c) != 0x2020)) ||
                (local_560 = (yyjson_val_uni *)((long)pyVar109 + 0x1e),
                *(short *)((long)pyVar109 + 0x1e) != 0x2020)) ||
               (local_560 = pyVar109 + 4, pyVar81 = pyVar109 + 4, pyVar109 = local_560,
               *(short *)pyVar81 != 0x2020)) break;
          }
        }
        bVar91 = *(byte *)local_560;
        if (bVar91 == 0x22) {
          pyVar112 = pyVar112 + 2;
          local_528 = pyVar79;
          if (pyVar102 <= pyVar112) {
            local_528 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
            sVar104 = (long)local_528 * 0x10;
            local_550 = pyVar102;
            local_548 = pyVar112;
            local_540 = pyVar103;
            local_538 = pyVar110;
            local_530 = ppuVar113;
            pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
            if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
            pyVar112 = (yyjson_val_uni *)(((long)local_548 - (long)pyVar80) + (long)pyVar83);
            pyVar110 = (yyjson_val_uni *)(((long)local_538 - (long)pyVar80) + (long)pyVar83);
            pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
            ppuVar113 = local_530;
            pyVar103 = local_540;
            pyVar80 = pyVar83;
            local_550 = pyVar102;
            local_548 = pyVar112;
            local_538 = pyVar110;
          }
          local_540 = (yyjson_val_uni *)((long)pyVar103 + 1);
          pyVar79 = (yyjson_val_uni *)((long)local_560 + 1);
          local_560 = pyVar79;
          goto LAB_012558ad;
        }
        local_548 = pyVar112;
        if (bVar91 != 0x7d) {
          if ((char_table[bVar91] & 1) == 0) {
            err = local_518;
            local_540 = pyVar103;
            local_530 = ppuVar113;
            if ((flg & 8) == 0) goto LAB_012561f3;
            bVar76 = skip_spaces_and_comments((u8 **)&local_560);
            pyVar112 = local_548;
            ppuVar113 = local_530;
            pyVar103 = local_540;
            if (!bVar76) {
              bVar76 = *(short *)local_560 == 0x2a2f;
              err = local_518;
              goto LAB_0125ca9b;
            }
          }
          else {
            local_540 = pyVar103;
            local_530 = ppuVar113;
            yyjson_read_opts((duckdb_yyjson *)&local_560);
            pyVar112 = local_548;
            ppuVar113 = local_530;
            pyVar103 = local_540;
          }
          goto LAB_012556ab;
        }
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        if (pyVar103 == (yyjson_val_uni *)0x0) {
          pyVar103 = (yyjson_val_uni *)0x0;
          local_530 = ppuVar113;
LAB_01256ce9:
          local_528 = pyVar79;
          uVar84 = pyVar110[1].u64;
          pyVar110[1].str = (char *)((long)local_548 + (0x10 - (long)pyVar110));
          pyVar110->u64 = (long)pyVar103 << 7 | 7;
          pyVar112 = local_548;
          ppuVar113 = local_530;
          if (uVar84 != 0) {
            pyVar110 = (yyjson_val_uni *)((long)pyVar110 - uVar84);
            uVar95 = pyVar110->u64;
            if (*(char *)local_560 == '\n') {
              local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            }
            uVar105 = (uint)uVar95;
            pyVar79 = local_528;
            err = local_518;
            while (pyVar103 = (yyjson_val_uni *)(uVar95 >> 8), pyVar99 = pyVar103,
                  (~uVar105 & 7) != 0) {
LAB_0125cb2f:
              if (*(short *)local_560 != 0xa2c) {
                do {
                  bVar91 = *(byte *)local_560;
                  if (bVar91 == 0x5d) {
                    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                    goto LAB_0125cc0d;
                  }
                  if (bVar91 == 0x2c) {
                    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                    goto LAB_01258f68;
                  }
                  if ((char_table[bVar91] & 1) == 0) {
                    if ((flg & 8) == 0) goto LAB_012561f3;
                    local_540 = pyVar99;
                    local_528 = pyVar79;
                    local_508 = pyVar80;
                    bVar76 = skip_spaces_and_comments((u8 **)&local_560);
                    pyVar79 = local_528;
                    pyVar99 = local_540;
                    err = local_518;
                    pyVar80 = local_508;
                    if (!bVar76) goto LAB_0125ca91;
                  }
                  else {
                    do {
                      local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                    } while ((char_table[*(byte *)local_560] & 1) != 0);
                  }
                } while (*(short *)local_560 != 0xa2c);
              }
              local_560 = (yyjson_val_uni *)((long)local_560 + 2);
LAB_01258f68:
              err = local_518;
              pyVar103 = local_560;
              if (*(short *)local_560 == 0x2020) {
                while (((((local_560 = (yyjson_val_uni *)((long)pyVar103 + 2),
                          *(short *)((long)pyVar103 + 2) == 0x2020 &&
                          (local_560 = (yyjson_val_uni *)((long)pyVar103 + 4),
                          *(short *)((long)pyVar103 + 4) == 0x2020)) &&
                         ((local_560 = (yyjson_val_uni *)((long)pyVar103 + 6),
                          *(short *)((long)pyVar103 + 6) == 0x2020 &&
                          ((((local_560 = pyVar103 + 1, *(short *)(pyVar103 + 1) == 0x2020 &&
                             (local_560 = (yyjson_val_uni *)((long)pyVar103 + 10),
                             *(short *)((long)pyVar103 + 10) == 0x2020)) &&
                            (local_560 = (yyjson_val_uni *)((long)pyVar103 + 0xc),
                            *(short *)((long)pyVar103 + 0xc) == 0x2020)) &&
                           ((local_560 = (yyjson_val_uni *)((long)pyVar103 + 0xe),
                            *(short *)((long)pyVar103 + 0xe) == 0x2020 &&
                            (local_560 = pyVar103 + 2, *(short *)(pyVar103 + 2) == 0x2020)))))))) &&
                        (local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x12),
                        *(short *)((long)pyVar103 + 0x12) == 0x2020)) &&
                       ((local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x14),
                        *(short *)((long)pyVar103 + 0x14) == 0x2020 &&
                        (local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x16),
                        *(short *)((long)pyVar103 + 0x16) == 0x2020))))) {
                  local_560 = pyVar103 + 3;
                  if (((*(short *)(pyVar103 + 3) != 0x2020) ||
                      (((local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x1a),
                        *(short *)((long)pyVar103 + 0x1a) != 0x2020 ||
                        (local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x1c),
                        *(short *)((long)pyVar103 + 0x1c) != 0x2020)) ||
                       (local_560 = (yyjson_val_uni *)((long)pyVar103 + 0x1e),
                       *(short *)((long)pyVar103 + 0x1e) != 0x2020)))) ||
                     (local_560 = pyVar103 + 4, pyVar109 = pyVar103 + 4, pyVar103 = local_560,
                     *(short *)pyVar109 != 0x2020)) break;
                }
              }
              bVar91 = *(byte *)local_560;
              if (bVar91 == 0x5b) {
LAB_012592d4:
                local_560 = (yyjson_val_uni *)((long)local_560 + 1);
                pyVar110->str = (char *)((ulong)*(byte *)pyVar110 + (long)pyVar99 * 0x100 + 0x100);
                pyVar112 = pyVar112 + 2;
                if (pyVar112 < pyVar102) goto LAB_01259306;
                pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                sVar104 = (long)pyVar103 * 0x10;
                local_558 = pyVar112;
                local_550 = pyVar102;
                local_530 = ppuVar113;
                pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
                if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                pyVar112 = (yyjson_val_uni *)(((long)local_558 - (long)pyVar80) + (long)pyVar83);
                pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
                pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                ppuVar113 = local_530;
                pyVar79 = pyVar103;
                pyVar80 = pyVar83;
                local_558 = pyVar112;
                local_550 = pyVar102;
LAB_01259306:
                pyVar112->u64 = 6;
                pyVar112[1].str = (char *)((long)pyVar112 - (long)pyVar110);
                pyVar110 = local_560;
                if (*(char *)local_560 == '\n') {
                  pyVar110 = (yyjson_val_uni *)((long)local_560 + 1);
                }
LAB_0124ef49:
                local_560 = pyVar110;
                pyVar99 = (yyjson_val_uni *)0x0;
                pyVar110 = pyVar112;
                goto LAB_01258f68;
              }
              if (bVar91 == 0x7b) goto LAB_01259333;
              if ((char_table[bVar91] & 2) != 0) goto LAB_0125938f;
              uVar105 = (uint)bVar91;
              if (0x65 < bVar91) {
                if (uVar105 == 0x66) {
                  pyVar112 = pyVar112 + 2;
                  if (pyVar102 <= pyVar112) {
                    pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                    sVar104 = (long)pyVar103 * 0x10;
                    local_550 = pyVar102;
                    local_548 = pyVar112;
                    local_540 = pyVar99;
                    local_538 = pyVar110;
                    local_530 = ppuVar113;
                    local_508 = pyVar80;
                    pyVar83 = (yyjson_doc *)
                              (*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
                    pyVar80 = local_508;
                    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                    pyVar112 = (yyjson_val_uni *)
                               (((long)local_548 - (long)local_508) + (long)pyVar83);
                    pyVar110 = (yyjson_val_uni *)
                               (((long)local_538 - (long)local_508) + (long)pyVar83);
                    pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                    pyVar79 = pyVar103;
                    ppuVar113 = local_530;
                    pyVar99 = local_540;
                    pyVar80 = pyVar83;
                    local_550 = pyVar102;
                    local_548 = pyVar112;
                    local_538 = pyVar110;
                    local_508 = pyVar83;
                  }
                  if (*(int *)((long)local_560 + 1) != 0x65736c61) goto LAB_0125aacd;
                  pyVar112->u64 = 3;
                  pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
                  err = local_518;
                  local_560 = (yyjson_val_uni *)((long)local_560 + 5);
                  goto LAB_0125cb2f;
                }
                if (bVar91 == 0x6e) {
                  pyVar112 = pyVar112 + 2;
                  if (pyVar102 <= pyVar112) {
                    pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                    sVar104 = (long)pyVar103 * 0x10;
                    local_550 = pyVar102;
                    local_548 = pyVar112;
                    local_540 = pyVar99;
                    local_538 = pyVar110;
                    local_530 = ppuVar113;
                    local_508 = pyVar80;
                    pyVar83 = (yyjson_doc *)
                              (*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
                    pyVar80 = local_508;
                    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                    pyVar112 = (yyjson_val_uni *)
                               (((long)local_548 - (long)local_508) + (long)pyVar83);
                    pyVar110 = (yyjson_val_uni *)
                               (((long)local_538 - (long)local_508) + (long)pyVar83);
                    pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                    pyVar79 = pyVar103;
                    ppuVar113 = local_530;
                    pyVar99 = local_540;
                    pyVar80 = pyVar83;
                    local_550 = pyVar102;
                    local_548 = pyVar112;
                    local_538 = pyVar110;
                    local_508 = pyVar83;
                  }
                  pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
                  if (*(int *)local_560 == 0x6c6c756e) {
                    pyVar112->u64 = 2;
                    goto LAB_012599f6;
                  }
                  if (((((flg & 0x10) == 0) || ((*(byte *)local_560 | 0x20) != 0x6e)) ||
                      ((*(byte *)((long)local_560 + 1) | 0x20) != 0x61)) ||
                     ((*(byte *)((long)local_560 + 2) | 0x20) != 0x6e)) goto LAB_0125aacd;
                  pyVar103 = (yyjson_val_uni *)((long)local_560 + 3);
                  if ((flg & 0xa0) == 0) {
                    pyVar112->u64 = 0x14;
                    local_560 = (yyjson_val_uni *)0x7ff8000000000000;
                  }
                  else {
                    if (*ppuVar113 != (u8 *)0x0) {
                      **ppuVar113 = '\0';
                    }
                    *ppuVar113 = (u8 *)pyVar103;
                    pyVar112->u64 = 0x301;
                  }
                  pyVar112[1].str = (char *)local_560;
                  err = local_518;
                  local_560 = pyVar103;
                  goto LAB_0125cb2f;
                }
                if (bVar91 != 0x74) {
LAB_01259110:
                  if ((char_table[bVar91] & 1) == 0) {
                    if ((((flg & 0x10) != 0) && (uVar105 - 0x49 < 0x21)) &&
                       ((0x100000021U >> ((ulong)(uVar105 - 0x49) & 0x3f) & 1) != 0)) {
                      local_548 = pyVar112 + 2;
                      local_540 = pyVar99;
                      local_530 = ppuVar113;
                      local_528 = pyVar79;
                      if (pyVar102 <= local_548) {
                        local_528 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                        sVar104 = (long)local_528 * 0x10;
                        pyVar83 = (yyjson_doc *)
                                  (*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
                        if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                        local_548 = (yyjson_val_uni *)
                                    (((long)local_548 - (long)pyVar80) + (long)pyVar83);
                        pyVar110 = (yyjson_val_uni *)
                                   (((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
                        pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                        pyVar80 = pyVar83;
                      }
                      pyVar103 = local_560;
                      err = local_518;
                      pyVar79 = local_528;
                      pyVar112 = local_548;
                      ppuVar113 = local_530;
                      pyVar99 = (yyjson_val_uni *)((long)local_540 + 1);
                      if ((((*(byte *)local_560 | 0x20) == 0x69) &&
                          ((*(byte *)((long)local_560 + 1) | 0x20) == 0x6e)) &&
                         ((*(byte *)((long)local_560 + 2) | 0x20) == 0x66)) {
                        pyVar109 = (yyjson_val_uni *)((long)local_560 + 3);
                        if ((((*(byte *)((long)local_560 + 3) | 0x20) == 0x69) &&
                            ((*(byte *)((long)local_560 + 4) | 0x20) == 0x6e)) &&
                           (((*(byte *)((long)local_560 + 5) | 0x20) == 0x69 &&
                            (((*(byte *)((long)local_560 + 6) | 0x20) == 0x74 &&
                             ((*(byte *)((long)local_560 + 7) | 0x20) == 0x79)))))) {
                          pyVar109 = local_560 + 1;
                        }
                        if ((flg & 0xa0) != 0) {
                          if (*local_530 != (u8 *)0x0) {
                            **local_530 = '\0';
                          }
                          *local_530 = (u8 *)pyVar109;
                          local_548->str = (char *)(((long)pyVar109 - (long)local_560) * 0x100 + 1);
                          local_560 = pyVar109;
LAB_0125a166:
                          local_548[1].str = (char *)pyVar103;
                          goto LAB_0125cb2f;
                        }
                        local_548->u64 = 0x14;
                        uVar84 = 0x7ff0000000000000;
                        local_560 = pyVar109;
                      }
                      else {
                        if ((((*(byte *)local_560 | 0x20) != 0x6e) ||
                            ((*(byte *)((long)local_560 + 1) | 0x20) != 0x61)) ||
                           ((*(byte *)((long)local_560 + 2) | 0x20) != 0x6e)) goto LAB_012561f3;
                        local_560 = (yyjson_val_uni *)((long)local_560 + 3);
                        if ((flg & 0xa0) != 0) {
                          if (*local_530 != (u8 *)0x0) {
                            **local_530 = '\0';
                          }
                          *local_530 = (u8 *)local_560;
                          local_548->u64 = 0x301;
                          goto LAB_0125a166;
                        }
                        local_548->u64 = 0x14;
                        uVar84 = 0x7ff8000000000000;
                      }
                      local_548[1].u64 = uVar84;
                      goto LAB_0125cb2f;
                    }
                    if ((flg & 8) == 0) goto LAB_012561f3;
                    local_548 = pyVar112;
                    local_540 = pyVar99;
                    local_538 = pyVar110;
                    local_508 = pyVar80;
                    bVar76 = skip_spaces_and_comments((u8 **)&local_560);
                    pyVar112 = local_548;
                    pyVar110 = local_538;
                    pyVar99 = local_540;
                    pyVar80 = local_508;
                    if (!bVar76) goto LAB_0125ca91;
                  }
                  else {
                    local_540 = pyVar99;
                    local_538 = pyVar110;
                    local_508 = pyVar80;
                    yyjson_read_opts((duckdb_yyjson *)&local_560);
                    pyVar110 = local_538;
                    pyVar99 = local_540;
                    pyVar80 = local_508;
                  }
                  goto LAB_01258f68;
                }
                pyVar112 = pyVar112 + 2;
                if (pyVar102 <= pyVar112) {
                  pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                  sVar104 = (long)pyVar103 * 0x10;
                  local_550 = pyVar102;
                  local_548 = pyVar112;
                  local_540 = pyVar99;
                  local_538 = pyVar110;
                  local_530 = ppuVar113;
                  local_508 = pyVar80;
                  pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104)
                  ;
                  pyVar80 = local_508;
                  if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                  pyVar112 = (yyjson_val_uni *)(((long)local_548 - (long)local_508) + (long)pyVar83)
                  ;
                  pyVar110 = (yyjson_val_uni *)(((long)local_538 - (long)local_508) + (long)pyVar83)
                  ;
                  pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                  pyVar79 = pyVar103;
                  ppuVar113 = local_530;
                  pyVar99 = local_540;
                  pyVar80 = pyVar83;
                  local_550 = pyVar102;
                  local_548 = pyVar112;
                  local_538 = pyVar110;
                  local_508 = pyVar83;
                }
                if (*(int *)local_560 != 0x65757274) goto LAB_0125aacd;
                pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
                pyVar112->u64 = 0xb;
LAB_012599f6:
                err = local_518;
                local_560 = (yyjson_val_uni *)((long)local_560 + 4);
                goto LAB_0125cb2f;
              }
              if (bVar91 == 0x22) {
                pyVar112 = pyVar112 + 2;
                local_528 = pyVar79;
                if (pyVar102 <= pyVar112) {
                  local_528 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
                  sVar104 = (long)local_528 * 0x10;
                  local_550 = pyVar102;
                  local_548 = pyVar112;
                  local_540 = pyVar99;
                  local_538 = pyVar110;
                  local_530 = ppuVar113;
                  pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104)
                  ;
                  if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
                  pyVar112 = (yyjson_val_uni *)(((long)local_548 - (long)pyVar80) + (long)pyVar83);
                  pyVar110 = (yyjson_val_uni *)(((long)local_538 - (long)pyVar80) + (long)pyVar83);
                  pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
                  ppuVar113 = local_530;
                  pyVar99 = local_540;
                  pyVar80 = pyVar83;
                  local_550 = pyVar102;
                  local_548 = pyVar112;
                  local_538 = pyVar110;
                }
                local_540 = (yyjson_val_uni *)((long)pyVar99 + 1);
                pyVar79 = (yyjson_val_uni *)((long)local_560 + 1);
                local_560 = pyVar79;
                goto LAB_012596ca;
              }
              if (uVar105 != 0x5d) goto LAB_01259110;
              local_560 = (yyjson_val_uni *)((long)local_560 + 1);
              if (pyVar99 == (yyjson_val_uni *)0x0) {
                pyVar99 = (yyjson_val_uni *)0x0;
              }
              else if ((flg & 4) == 0) {
                cVar88 = *(char *)local_560;
                while (cVar88 != ',') {
                  local_560 = (yyjson_val_uni *)((long)local_560 + -1);
                  cVar88 = *(char *)local_560;
                }
                goto LAB_0125a82a;
              }
LAB_0125cc0d:
              uVar84 = pyVar110[1].u64;
              pyVar110[1].str = (char *)((long)pyVar112 + (0x10 - (long)pyVar110));
              pyVar110->u64 = (long)pyVar99 << 8 | 6;
              if (uVar84 == 0) goto LAB_0125cc67;
              pyVar110 = (yyjson_val_uni *)((long)pyVar110 - uVar84);
              uVar95 = pyVar110->u64;
              if (*(char *)local_560 == '\n') {
                local_560 = (yyjson_val_uni *)((long)local_560 + 1);
              }
              uVar105 = (uint)uVar95;
            }
LAB_01255f81:
            if (*(short *)local_560 != 0xa2c) goto LAB_01255f96;
LAB_01255f8d:
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            goto LAB_012556a6;
          }
LAB_0125cc67:
          local_530 = ppuVar113;
          local_548 = pyVar112;
          if ((local_4e0 <= local_560) || ((flg & 2) != 0)) goto LAB_0125cc76;
          if ((flg & 8) == 0) {
            bVar91 = char_table[*(byte *)local_560];
            while ((bVar91 & 1) != 0) {
              local_560 = (yyjson_val_uni *)((long)local_560 + 1);
              bVar91 = char_table[*(byte *)local_560];
            }
          }
          else {
            skip_spaces_and_comments((u8 **)&local_560);
            err = local_518;
            if (*(short *)local_560 == 0x2a2f) goto LAB_0125caa6;
          }
          pyVar112 = local_4e0;
          pyVar102 = local_4f8;
          pyVar79 = local_560;
          if (local_560 < local_4e0) {
            bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,
                                      (u8 *)&local_4e0->u64,4,flg);
            if (bVar76) {
              pyVar79 = pyVar112;
            }
            pcVar100 = "unexpected content after document";
            if (bVar76) {
              pcVar100 = "unexpected end of data";
            }
            pyVar87 = local_518;
            if (local_518 == (yyjson_read_err *)0x0) {
              pyVar87 = &local_4c0;
            }
            pyVar87->pos = (long)pyVar79 - (long)pyVar102;
LAB_0125ca58:
            local_500->code = bVar76 + 4;
            pyVar87->msg = pcVar100;
            goto joined_r0x0125cb19;
          }
LAB_0125cc76:
          if (((flg & 0xa0) != 0) && (*local_530 != (u8 *)0x0)) {
            **local_530 = '\0';
          }
          pyVar80->root = (yyjson_val *)(pyVar80 + 1);
          (pyVar80->alc).malloc = local_478;
          (pyVar80->alc).realloc = local_4c8;
          (pyVar80->alc).free = local_4d0;
          (pyVar80->alc).ctx = local_4e8;
          pyVar80->dat_read = (long)local_560 - (long)local_4f8;
          pyVar80->val_read = ((long)local_548 - (long)pyVar80 >> 4) - 3;
LAB_0125c759:
          pyVar80->str_pool = (char *)local_488;
          pyVar87 = local_500;
          pyVar79 = local_4f8;
          err = local_518;
          goto LAB_0125c844;
        }
        local_530 = ppuVar113;
        if ((flg & 4) != 0) goto LAB_01256ce9;
        cVar88 = *(char *)local_560;
        while (cVar88 != ',') {
          local_560 = (yyjson_val_uni *)((long)local_560 + -1);
          cVar88 = *(char *)local_560;
        }
LAB_0125a82a:
        pyVar112 = local_4e0;
        pyVar102 = local_4f8;
        pyVar79 = local_560;
        bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,
                                  7,flg);
        if (bVar76) {
          pyVar79 = pyVar112;
        }
        pcVar100 = "trailing comma is not allowed";
        if (bVar76) {
          pcVar100 = "unexpected end of data";
        }
        sVar104 = (long)pyVar79 - (long)pyVar102;
        yVar78 = !bVar76 + 5 + (uint)!bVar76;
        goto LAB_0125ab2a;
      }
LAB_0124ff5c:
      pyVar112 = local_4e0;
      pyVar79 = local_4f8;
      err = local_518;
      pyVar102 = local_560;
      bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,2,
                                flg);
      if (bVar76) {
        pyVar102 = pyVar112;
      }
      pcVar100 = "memory allocation failed";
      if (bVar76) {
        pcVar100 = "unexpected end of data";
      }
      sVar104 = (long)pyVar102 - (long)pyVar79;
    }
    pyVar87 = err;
    if (err == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = sVar104;
    local_500->code = (uint)bVar76 * 3 + 2;
    pyVar87->msg = pcVar100;
    pyVar87 = local_500;
    goto LAB_0125c82a;
  }
  p_Stack_48 = local_4c8;
  local_40 = local_4d0;
  alc.realloc = local_4c8;
  alc.malloc = pcVar111;
  alc.free = local_4d0;
  alc.ctx = pvVar108;
  local_50 = pcVar111;
  pvStack_38 = pvVar108;
  pyVar80 = read_root_single((u8 *)&local_4f8->u64,(u8 *)&local_490->u64,(u8 *)&pyVar102->u64,alc,
                             flg,pyVar87);
  goto LAB_0125c844;
LAB_0125464a:
  uVar95 = 5;
  local_508 = pyVar80;
LAB_012523d9:
  pyVar102->u64 = ((long)pyVar81 - (long)pyVar79) * 0x100 | uVar95;
  pyVar102[1].str = (char *)pyVar79;
  *(char *)pyVar81 = '\0';
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  bVar91 = *(byte *)((long)pyVar109 + 1);
  if (bVar91 != 0x3a) {
    do {
      if ((char_table[bVar91] & 1) == 0) {
        if ((flg & 8) == 0) goto LAB_0125c7ae;
        bVar76 = skip_spaces_and_comments((u8 **)&local_560);
        pyVar102 = local_528;
        pyVar112 = local_558;
        if (!bVar76) goto LAB_01255616;
      }
      else {
        do {
          local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        } while ((char_table[*(byte *)local_560] & 1) != 0);
      }
      bVar91 = *(byte *)local_560;
    } while (bVar91 != 0x3a);
  }
  pyVar79 = (yyjson_val_uni *)((long)local_560 + 1);
  bVar91 = *(byte *)((long)local_560 + 1);
  local_560 = pyVar79;
  pyVar79 = local_538;
  if (bVar91 == 0x22) {
LAB_01252429:
    pyVar81 = (yyjson_val_uni *)((long)local_560 + 1);
    pyVar109 = pyVar81;
    goto LAB_0125243a;
  }
LAB_012527ce:
  pyVar109 = local_560;
  if ((char_table[bVar91] & 2) == 0) {
    if (0x6d < bVar91) {
      if (bVar91 == 0x6e) {
        if (*(int *)local_560 != 0x6c6c756e) {
          if ((((flg & 0x10) != 0) && ((*(byte *)local_560 | 0x20) == 0x6e)) &&
             (((*(byte *)((long)local_560 + 1) | 0x20) == 0x61 &&
              ((*(byte *)((long)local_560 + 2) | 0x20) == 0x6e)))) {
            pyVar109 = (yyjson_val_uni *)((long)local_560 + 3);
            if ((flg & 0xa0) == 0) {
              local_528[2].u64 = 0x14;
              local_560 = (yyjson_val_uni *)0x7ff8000000000000;
            }
            else {
              if (*ppuVar113 != (u8 *)0x0) {
                **ppuVar113 = '\0';
              }
              *ppuVar113 = (u8 *)pyVar109;
              local_528[2].u64 = 0x301;
            }
            local_528[3].str = (char *)local_560;
            pyVar102 = pyVar102 + 2;
            pyVar79 = local_538;
            pyVar112 = local_558;
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
            local_560 = pyVar109;
            goto LAB_0125c612;
          }
          goto LAB_0125aacd;
        }
        pyVar102[2].u64 = 2;
      }
      else {
        if (bVar91 == 0x7b) goto LAB_0124efa3;
        if (bVar91 != 0x74) goto LAB_01252811;
        if (*(int *)local_560 != 0x65757274) goto LAB_0125aacd;
        pyVar102[2].u64 = 0xb;
      }
      local_560 = (yyjson_val_uni *)((long)local_560 + 4);
LAB_01252c47:
      pyVar102 = pyVar102 + 2;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
      goto LAB_0125c612;
    }
    if (bVar91 == 0x5b) goto LAB_0124ef54;
    if (bVar91 == 0x66) {
      if (*(int *)((long)local_560 + 1) == 0x65736c61) {
        pyVar102[2].u64 = 3;
        local_560 = (yyjson_val_uni *)((long)local_560 + 5);
        goto LAB_01252c47;
      }
      goto LAB_0125aacd;
    }
LAB_01252811:
    if ((char_table[bVar91] & 1) != 0) {
      do {
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      } while ((char_table[*(byte *)local_560] & 1) != 0);
LAB_01252875:
      bVar91 = *(byte *)local_560;
      if (bVar91 == 0x22) goto LAB_01252429;
      goto LAB_012527ce;
    }
    if ((((flg & 0x10) != 0) && (bVar91 - 0x49 < 0x21)) &&
       ((0x100000021U >> ((ulong)(bVar91 - 0x49) & 0x3f) & 1) != 0)) {
      pyVar102 = pyVar102 + 2;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
      if ((((bVar91 | 0x20) == 0x69) && ((*(byte *)((long)local_560 + 1) | 0x20) == 0x6e)) &&
         ((*(byte *)((long)local_560 + 2) | 0x20) == 0x66)) {
        pyVar109 = (yyjson_val_uni *)((long)local_560 + 3);
        if (((((*(byte *)((long)local_560 + 3) | 0x20) == 0x69) &&
             ((*(byte *)((long)local_560 + 4) | 0x20) == 0x6e)) &&
            ((*(byte *)((long)local_560 + 5) | 0x20) == 0x69)) &&
           (((*(byte *)((long)local_560 + 6) | 0x20) == 0x74 &&
            ((*(byte *)((long)local_560 + 7) | 0x20) == 0x79)))) {
          pyVar109 = local_560 + 1;
        }
        if ((flg & 0xa0) != 0) {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          *ppuVar113 = (u8 *)pyVar109;
          local_528[2].str = (char *)(((long)pyVar109 - (long)local_560) * 0x100 + 1);
          local_528[3].str = (char *)local_560;
          pyVar79 = local_538;
          pyVar112 = local_558;
          local_560 = pyVar109;
          goto LAB_0125c612;
        }
        local_528[2].u64 = 0x14;
        pyVar112 = (yyjson_val_uni *)0x7ff0000000000000;
        local_560 = pyVar109;
      }
      else {
        if ((((*(byte *)local_560 | 0x20) != 0x6e) ||
            ((*(byte *)((long)local_560 + 1) | 0x20) != 0x61)) ||
           ((*(byte *)((long)local_560 + 2) | 0x20) != 0x6e)) goto LAB_0125c7ae;
        pyVar79 = (yyjson_val_uni *)((long)local_560 + 3);
        if ((flg & 0xa0) == 0) {
          local_528[2].u64 = 0x14;
          pyVar112 = (yyjson_val_uni *)0x7ff8000000000000;
          local_560 = pyVar79;
        }
        else {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          *ppuVar113 = (u8 *)pyVar79;
          local_528[2].u64 = 0x301;
          pyVar112 = local_560;
          local_560 = pyVar79;
        }
      }
      local_528[3].u64 = (uint64_t)pyVar112;
      pyVar79 = local_538;
      pyVar112 = local_558;
      goto LAB_0125c612;
    }
    if ((flg & 8) == 0) goto LAB_0125c7ae;
    local_548 = pyVar110;
    bVar76 = skip_spaces_and_comments((u8 **)&local_560);
    pyVar102 = local_528;
    pyVar79 = local_538;
    pyVar110 = local_548;
    pyVar112 = local_558;
    if (bVar76) goto LAB_01252875;
LAB_01255616:
    if (*(short *)local_560 != 0x2a2f) goto LAB_0125c7ae;
LAB_01255626:
    pyVar112 = local_4e0;
    pyVar102 = local_4f8;
    pyVar79 = local_560;
    bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,8,
                              flg);
    if (bVar76) {
      pyVar79 = pyVar112;
    }
    pcVar100 = "unclosed multiline comment";
    if (bVar76) {
      pcVar100 = "unexpected end of data";
    }
    pyVar87 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = (long)pyVar79 - (long)pyVar102;
    local_500->code = (uint)!bVar76 * 3 + 5;
    pyVar87->msg = pcVar100;
    goto joined_r0x0125cb19;
  }
  pyVar102 = pyVar102 + 2;
  pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
  local_4d4 = 0;
  local_550 = pyVar102;
  if (-1 < cVar88 && (flg & 0xa0) != 0) {
    bVar76 = read_number_raw((u8 **)&local_560,ppuVar113,flg,(yyjson_val *)pyVar102,&local_510);
    goto LAB_012532af;
  }
  local_540 = (yyjson_val_uni *)CONCAT71(local_540._1_7_,bVar91);
  uVar107 = (ulong)(bVar91 == 0x2d);
  pyVar81 = (yyjson_val_uni *)((long)local_560 + uVar107);
  bVar90 = *(byte *)((long)local_560 + uVar107);
  uVar95 = (ulong)bVar90;
  if ((digi_table[uVar95] & 2) != 0) {
    uVar84 = uVar95 - 0x30;
    bVar90 = *(byte *)((long)pyVar81 + 1);
    uVar107 = (ulong)bVar90 - 0x30;
    pyVar79 = pyVar81;
    if (9 < uVar107) {
      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
      if ((digi_table[bVar90] & 0x30) == 0) {
        local_528[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
        if (bVar91 == 0x2d) {
          uVar84 = 0x30 - uVar95;
        }
        local_528[3].u64 = uVar84;
        pyVar79 = local_538;
        pyVar112 = local_558;
        local_560 = pyVar99;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
        goto LAB_0125c612;
      }
      pcVar100 = (char *)0x0;
      pyVar112 = (yyjson_val_uni *)0x0;
      pyVar118 = pyVar99;
      pyVar93 = pyVar99;
      if (bVar90 != 0x2e) goto LAB_01252ece;
      goto LAB_01254e30;
    }
    uVar84 = uVar107 + uVar84 * 10;
    bVar90 = *(byte *)((long)pyVar81 + 2);
    uVar95 = (ulong)bVar90 - 0x30;
    if (uVar95 < 10) {
      uVar84 = uVar95 + uVar84 * 10;
      bVar90 = *(byte *)((long)pyVar81 + 3);
      uVar95 = (ulong)bVar90 - 0x30;
      if (uVar95 < 10) {
        uVar84 = uVar95 + uVar84 * 10;
        bVar90 = *(byte *)((long)pyVar81 + 4);
        uVar95 = (ulong)bVar90 - 0x30;
        if (uVar95 < 10) {
          uVar84 = uVar95 + uVar84 * 10;
          bVar90 = *(byte *)((long)pyVar81 + 5);
          uVar95 = (ulong)bVar90 - 0x30;
          if (uVar95 < 10) {
            uVar84 = uVar95 + uVar84 * 10;
            bVar90 = *(byte *)((long)pyVar81 + 6);
            uVar95 = (ulong)bVar90 - 0x30;
            if (uVar95 < 10) {
              uVar84 = uVar95 + uVar84 * 10;
              bVar90 = *(byte *)((long)pyVar81 + 7);
              uVar95 = (ulong)bVar90 - 0x30;
              if (uVar95 < 10) {
                uVar84 = uVar95 + uVar84 * 10;
                bVar90 = *(byte *)(pyVar81 + 1);
                uVar95 = (ulong)bVar90 - 0x30;
                if (uVar95 < 10) {
                  uVar84 = uVar95 + uVar84 * 10;
                  bVar90 = *(byte *)((long)pyVar81 + 9);
                  uVar95 = (ulong)bVar90 - 0x30;
                  if (uVar95 < 10) {
                    uVar84 = uVar95 + uVar84 * 10;
                    bVar90 = *(byte *)((long)pyVar81 + 10);
                    uVar95 = (ulong)bVar90 - 0x30;
                    if (uVar95 < 10) {
                      uVar84 = uVar95 + uVar84 * 10;
                      bVar90 = *(byte *)((long)pyVar81 + 0xb);
                      uVar95 = (ulong)bVar90 - 0x30;
                      if (uVar95 < 10) {
                        uVar84 = uVar95 + uVar84 * 10;
                        bVar90 = *(byte *)((long)pyVar81 + 0xc);
                        uVar95 = (ulong)bVar90 - 0x30;
                        if (uVar95 < 10) {
                          uVar84 = uVar95 + uVar84 * 10;
                          bVar90 = *(byte *)((long)pyVar81 + 0xd);
                          uVar95 = (ulong)bVar90 - 0x30;
                          if (uVar95 < 10) {
                            uVar84 = uVar95 + uVar84 * 10;
                            bVar90 = *(byte *)((long)pyVar81 + 0xe);
                            uVar95 = (ulong)bVar90 - 0x30;
                            if (uVar95 < 10) {
                              uVar84 = uVar95 + uVar84 * 10;
                              bVar90 = *(byte *)((long)pyVar81 + 0xf);
                              uVar95 = (ulong)bVar90 - 0x30;
                              if (uVar95 < 10) {
                                uVar84 = uVar95 + uVar84 * 10;
                                bVar90 = *(byte *)(pyVar81 + 2);
                                uVar95 = (ulong)bVar90 - 0x30;
                                if (uVar95 < 10) {
                                  uVar84 = uVar95 + uVar84 * 10;
                                  bVar90 = *(byte *)((long)pyVar81 + 0x11);
                                  uVar95 = (ulong)bVar90 - 0x30;
                                  if (uVar95 < 10) {
                                    uVar84 = uVar95 + uVar84 * 10;
                                    bVar90 = *(byte *)((long)pyVar81 + 0x12);
                                    uVar95 = (ulong)bVar90 - 0x30;
                                    if (uVar95 < 10) {
                                      uVar84 = uVar95 + uVar84 * 10;
                                      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x13);
                                      bVar90 = *(byte *)((long)pyVar81 + 0x13);
                                      bVar5 = digi_table[bVar90];
                                      if ((bVar5 & 0x33) == 0) {
                                        if ((bVar91 != 0x2d) || (uVar84 < 0x8000000000000001)) {
                                          local_528[2].str =
                                               (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
                                          uVar94 = -uVar84;
                                          if (bVar91 != 0x2d) {
                                            uVar94 = uVar84;
                                          }
                                          local_528[3].u64 = uVar94;
                                          pyVar79 = local_538;
                                          pyVar112 = local_558;
                                          local_560 = pyVar99;
                                          local_548 = pyVar110;
                                          local_530 = ppuVar113;
                                          goto LAB_0125c612;
                                        }
                                        if (-1 < cVar88) {
                                          auVar122._8_4_ = (int)(uVar84 >> 0x20);
                                          auVar122._0_8_ = uVar84;
                                          auVar122._12_4_ = 0x45300000;
                                          local_528[2].u64 = 0x14;
                                          local_528[3].f64 =
                                               -((auVar122._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                4503599627370496.0));
                                          pyVar79 = local_538;
                                          pyVar112 = local_558;
                                          local_560 = pyVar99;
                                          local_548 = pyVar110;
                                          local_530 = ppuVar113;
                                          goto LAB_0125c612;
                                        }
                                        if (*ppuVar113 != (u8 *)0x0) {
                                          **ppuVar113 = '\0';
                                        }
                                        local_528[2].str =
                                             (char *)(((long)pyVar99 - (long)local_560) * 0x100 + 1)
                                        ;
                                        local_528[3].str = (char *)local_560;
                                        goto LAB_012549eb;
                                      }
                                      if (((bVar5 & 3) != 0) &&
                                         ((digi_table[*(byte *)((long)pyVar81 + 0x14)] & 0x33) == 0)
                                         ) {
                                        pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0x14);
                                        uVar95 = (ulong)bVar90 - 0x30;
                                        if ((uVar84 < 0x1999999999999999) ||
                                           ((uVar84 == 0x1999999999999999 && (uVar95 < 6)))) {
                                          uVar84 = uVar95 + uVar84 * 10;
                                          if (bVar91 != 0x2d) {
                                            local_528[2].u64 = 4;
                                            local_528[3].u64 = uVar84;
                                            pyVar79 = local_538;
                                            pyVar112 = local_558;
                                            local_560 = pyVar118;
                                            local_548 = pyVar110;
                                            local_530 = ppuVar113;
                                            goto LAB_0125c612;
                                          }
                                          if (cVar88 < '\0') {
                                            if (*ppuVar113 != (u8 *)0x0) {
                                              **ppuVar113 = '\0';
                                            }
                                            local_528[2].str =
                                                 (char *)(((long)pyVar118 - (long)local_560) * 0x100
                                                         + 1);
                                            local_528[3].str = (char *)local_560;
                                            *ppuVar113 = (u8 *)pyVar118;
                                            pyVar79 = local_538;
                                            pyVar112 = local_558;
                                            local_560 = pyVar118;
                                            local_548 = pyVar110;
                                            local_530 = ppuVar113;
                                            goto LAB_0125c612;
                                          }
                                          auVar123._8_4_ = (int)(uVar84 >> 0x20);
                                          auVar123._0_8_ = uVar84;
                                          auVar123._12_4_ = 0x45300000;
                                          local_528[2].u64 = 0x14;
                                          local_528[3].f64 =
                                               -((auVar123._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                4503599627370496.0));
                                          pyVar79 = local_538;
                                          pyVar112 = local_558;
                                          local_560 = pyVar118;
                                          local_548 = pyVar110;
                                          local_530 = ppuVar113;
                                          goto LAB_0125c612;
                                        }
                                      }
                                      pcVar100 = (char *)0x0;
                                      if ((bVar5 & 0x20) != 0) {
                                        pyVar93 = pyVar99;
                                        pyVar79 = (yyjson_val_uni *)0x0;
                                        goto LAB_01252ce1;
                                      }
                                      pyVar112 = pyVar99;
                                      pyVar92 = (yyjson_val_uni *)0x0;
                                      if ((bVar90 != 0x2e) ||
                                         (pyVar112 = (yyjson_val_uni *)((long)pyVar81 + 0x14),
                                         pyVar92 = pyVar99, local_548 = pyVar110,
                                         local_530 = ppuVar113,
                                         (digi_table[*(byte *)((long)pyVar81 + 0x14)] & 3) != 0))
                                      goto LAB_01252dbf;
                                      goto LAB_01255153;
                                    }
                                    pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x12);
                                    if ((digi_table[bVar90] & 0x30) != 0) {
                                      pcVar100 = (char *)0x0;
                                      pyVar112 = (yyjson_val_uni *)0x0;
                                      pyVar118 = pyVar99;
                                      pyVar93 = pyVar99;
                                      if (bVar90 != 0x2e) goto LAB_01252ece;
                                      goto LAB_0125502e;
                                    }
                                  }
                                  else {
                                    pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x11);
                                    if ((digi_table[bVar90] & 0x30) != 0) {
                                      pcVar100 = (char *)0x0;
                                      pyVar112 = (yyjson_val_uni *)0x0;
                                      pyVar118 = pyVar99;
                                      pyVar93 = pyVar99;
                                      if (bVar90 != 0x2e) goto LAB_01252ece;
                                      goto LAB_01255010;
                                    }
                                  }
                                }
                                else {
                                  pyVar99 = pyVar81 + 2;
                                  if ((digi_table[bVar90] & 0x30) != 0) {
                                    pcVar100 = (char *)0x0;
                                    pyVar112 = (yyjson_val_uni *)0x0;
                                    pyVar118 = pyVar99;
                                    pyVar93 = pyVar99;
                                    if (bVar90 != 0x2e) goto LAB_01252ece;
                                    goto LAB_01254ff2;
                                  }
                                }
                              }
                              else {
                                pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
                                if ((digi_table[bVar90] & 0x30) != 0) {
                                  pcVar100 = (char *)0x0;
                                  pyVar112 = (yyjson_val_uni *)0x0;
                                  pyVar118 = pyVar99;
                                  pyVar93 = pyVar99;
                                  if (bVar90 != 0x2e) goto LAB_01252ece;
                                  goto LAB_01254fd4;
                                }
                              }
                            }
                            else {
                              pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
                              if ((digi_table[bVar90] & 0x30) != 0) {
                                pcVar100 = (char *)0x0;
                                pyVar112 = (yyjson_val_uni *)0x0;
                                pyVar118 = pyVar99;
                                pyVar93 = pyVar99;
                                if (bVar90 != 0x2e) goto LAB_01252ece;
                                goto LAB_01254fb6;
                              }
                            }
                          }
                          else {
                            pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
                            if ((digi_table[bVar90] & 0x30) != 0) {
                              pcVar100 = (char *)0x0;
                              pyVar112 = (yyjson_val_uni *)0x0;
                              pyVar118 = pyVar99;
                              pyVar93 = pyVar99;
                              if (bVar90 != 0x2e) goto LAB_01252ece;
                              goto LAB_01254f98;
                            }
                          }
                        }
                        else {
                          pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
                          if ((digi_table[bVar90] & 0x30) != 0) {
                            pcVar100 = (char *)0x0;
                            pyVar112 = (yyjson_val_uni *)0x0;
                            pyVar118 = pyVar99;
                            pyVar93 = pyVar99;
                            if (bVar90 != 0x2e) goto LAB_01252ece;
                            goto LAB_01254f7a;
                          }
                        }
                      }
                      else {
                        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
                        if ((digi_table[bVar90] & 0x30) != 0) {
                          pcVar100 = (char *)0x0;
                          pyVar112 = (yyjson_val_uni *)0x0;
                          pyVar118 = pyVar99;
                          pyVar93 = pyVar99;
                          if (bVar90 != 0x2e) goto LAB_01252ece;
                          goto LAB_01254f5c;
                        }
                      }
                    }
                    else {
                      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 10);
                      if ((digi_table[bVar90] & 0x30) != 0) {
                        pcVar100 = (char *)0x0;
                        pyVar112 = (yyjson_val_uni *)0x0;
                        pyVar118 = pyVar99;
                        pyVar93 = pyVar99;
                        if (bVar90 != 0x2e) goto LAB_01252ece;
                        goto LAB_01254f3e;
                      }
                    }
                  }
                  else {
                    pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 9);
                    if ((digi_table[bVar90] & 0x30) != 0) {
                      pcVar100 = (char *)0x0;
                      pyVar112 = (yyjson_val_uni *)0x0;
                      pyVar118 = pyVar99;
                      pyVar93 = pyVar99;
                      if (bVar90 != 0x2e) goto LAB_01252ece;
                      goto LAB_01254f20;
                    }
                  }
                }
                else {
                  pyVar99 = pyVar81 + 1;
                  if ((digi_table[bVar90] & 0x30) != 0) {
                    pcVar100 = (char *)0x0;
                    pyVar112 = (yyjson_val_uni *)0x0;
                    pyVar118 = pyVar99;
                    pyVar93 = pyVar99;
                    if (bVar90 != 0x2e) goto LAB_01252ece;
                    goto LAB_01254f02;
                  }
                }
              }
              else {
                pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 7);
                if ((digi_table[bVar90] & 0x30) != 0) {
                  pcVar100 = (char *)0x0;
                  pyVar112 = (yyjson_val_uni *)0x0;
                  pyVar118 = pyVar99;
                  pyVar93 = pyVar99;
                  if (bVar90 != 0x2e) goto LAB_01252ece;
                  goto LAB_01254ee4;
                }
              }
            }
            else {
              pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 6);
              if ((digi_table[bVar90] & 0x30) != 0) {
                pcVar100 = (char *)0x0;
                pyVar112 = (yyjson_val_uni *)0x0;
                pyVar118 = pyVar99;
                pyVar93 = pyVar99;
                if (bVar90 != 0x2e) goto LAB_01252ece;
                goto LAB_01254ec6;
              }
            }
          }
          else {
            pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 5);
            if ((digi_table[bVar90] & 0x30) != 0) {
              pcVar100 = (char *)0x0;
              pyVar112 = (yyjson_val_uni *)0x0;
              pyVar118 = pyVar99;
              pyVar93 = pyVar99;
              if (bVar90 != 0x2e) goto LAB_01252ece;
              goto LAB_01254ea8;
            }
          }
        }
        else {
          pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 4);
          if ((digi_table[bVar90] & 0x30) != 0) {
            pcVar100 = (char *)0x0;
            pyVar112 = (yyjson_val_uni *)0x0;
            pyVar118 = pyVar99;
            pyVar93 = pyVar99;
            if (bVar90 != 0x2e) goto LAB_01252ece;
            goto LAB_01254e8a;
          }
        }
      }
      else {
        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 3);
        if ((digi_table[bVar90] & 0x30) != 0) {
          pcVar100 = (char *)0x0;
          pyVar112 = (yyjson_val_uni *)0x0;
          pyVar118 = pyVar99;
          pyVar93 = pyVar99;
          if (bVar90 != 0x2e) goto LAB_01252ece;
          goto LAB_01254e6c;
        }
      }
    }
    else {
      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 2);
      if ((digi_table[bVar90] & 0x30) != 0) {
        pcVar100 = (char *)0x0;
        pyVar112 = (yyjson_val_uni *)0x0;
        pyVar118 = pyVar99;
        pyVar93 = pyVar99;
        if (bVar90 != 0x2e) goto LAB_01252ece;
        goto LAB_01254e4e;
      }
    }
    local_528[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
    uVar94 = -uVar84;
    if (bVar91 != 0x2d) {
      uVar94 = uVar84;
    }
    local_528[3].u64 = uVar94;
    pyVar79 = local_538;
    pyVar112 = local_558;
    local_560 = pyVar99;
    local_548 = pyVar110;
    local_530 = ppuVar113;
    local_520 = pyVar103;
    goto LAB_0125c612;
  }
  if (bVar90 != 0x30) {
    local_548 = pyVar110;
    local_530 = ppuVar113;
    local_520 = pyVar103;
    if ((flg & 0x10) != 0) {
      if ((((bVar90 | 0x20) == 0x69) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x6e)) &&
         ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x66)) {
        uVar84 = (long)pyVar81 - (ulong)(bVar91 == 0x2d);
        pyVar79 = (yyjson_val_uni *)((long)pyVar81 + 3);
        if ((((*(byte *)((long)pyVar81 + 3) | 0x20) == 0x69) &&
            ((*(byte *)((long)pyVar81 + 4) | 0x20) == 0x6e)) &&
           (((*(byte *)((long)pyVar81 + 5) | 0x20) == 0x69 &&
            (((*(byte *)((long)pyVar81 + 6) | 0x20) == 0x74 &&
             ((*(byte *)((long)pyVar81 + 7) | 0x20) == 0x79)))))) {
          pyVar79 = pyVar81 + 1;
        }
        if ((flg & 0xa0) == 0) {
          local_528[2].u64 = 0x14;
          uVar84 = ((ulong)(bVar91 != 0x2d) << 0x3f) + 0xfff0000000000000;
        }
        else {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          *ppuVar113 = (u8 *)pyVar79;
          local_528[2].str = (char *)(((long)pyVar79 - uVar84) * 0x100 + 1);
        }
        local_528[3].u64 = uVar84;
        bVar76 = true;
        pyVar81 = pyVar79;
      }
      else {
        bVar76 = false;
      }
      bVar58 = true;
      if (!bVar76) {
        if ((((*(byte *)pyVar81 | 0x20) == 0x6e) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x61))
           && ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x6e)) {
          if ((flg & 0xa0) == 0) {
            local_528[2].u64 = 0x14;
            pcVar100 = (char *)(((ulong)(bVar91 != 0x2d) << 0x3f) + -0x8000000000000);
          }
          else {
            pcVar100 = (char *)((long)pyVar81 - (ulong)(bVar91 == 0x2d));
            if (*ppuVar113 != (u8 *)0x0) {
              **ppuVar113 = '\0';
            }
            *ppuVar113 = (u8 *)((long)pyVar81 + 3);
            local_528[2].str = (char *)((ulong)(bVar91 == 0x2d) * 0x100 + 0x301);
          }
          local_528[3].str = pcVar100;
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
        }
        else {
          bVar58 = false;
        }
      }
      pyVar79 = local_538;
      pyVar112 = local_558;
      local_560 = pyVar81;
      if (bVar58) goto LAB_0125c612;
    }
LAB_01254dc7:
    local_510 = "no digit after minus sign";
    goto LAB_0125515a;
  }
  pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
  if ((digi_table[*(byte *)((long)pyVar81 + 1)] & 0x33) == 0) {
    local_528[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
    local_528[3].u64 = 0;
    pyVar79 = local_538;
    pyVar112 = local_558;
    local_560 = pyVar99;
    local_548 = pyVar110;
    local_530 = ppuVar113;
    local_520 = pyVar103;
    goto LAB_0125c612;
  }
  if (*(byte *)((long)pyVar81 + 1) != 0x2e) goto LAB_01255449;
  local_548 = pyVar110;
  local_530 = ppuVar113;
  local_520 = pyVar103;
  if ((digi_table[*(byte *)((long)pyVar81 + 2)] & 3) == 0) goto LAB_0125514f;
  pyVar99 = (yyjson_val_uni *)((long)local_560 + uVar107 + 1);
  do {
    pyVar79 = pyVar99;
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 1);
    pyVar99 = (yyjson_val_uni *)((long)pyVar79 + 1);
  } while (uVar95 == 0x30);
  if ((digi_table[uVar95] & 3) == 0) goto LAB_01255449;
  uVar84 = uVar95 - 0x30;
LAB_01254e30:
  pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
  pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 2);
  uVar95 = (ulong)*(byte *)((long)pyVar79 + 2) - 0x30;
  if (uVar95 < 10) {
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254e4e:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 3);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 3) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254e6c:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 4);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 4) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254e8a:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 5);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 5) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254ea8:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 6);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 6) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254ec6:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 7);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 7) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254ee4:
    pyVar93 = pyVar79 + 1;
    if (9 < (ulong)*(byte *)(pyVar79 + 1) - 0x30) goto LAB_01255069;
    uVar84 = ((ulong)*(byte *)(pyVar79 + 1) - 0x30) + uVar84 * 10;
LAB_01254f02:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 9);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 9) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254f20:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 10);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 10) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254f3e:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0xb);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0xb) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254f5c:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0xc);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0xc) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254f7a:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0xd);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0xd) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254f98:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0xe);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0xe) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254fb6:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0xf);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0xf) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01254fd4:
    pyVar93 = pyVar79 + 2;
    if (9 < (ulong)*(byte *)(pyVar79 + 2) - 0x30) goto LAB_01255069;
    uVar84 = ((ulong)*(byte *)(pyVar79 + 2) - 0x30) + uVar84 * 10;
LAB_01254ff2:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0x11);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0x11) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_01255010:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0x12);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0x12) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
LAB_0125502e:
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0x13);
    uVar95 = (ulong)*(byte *)((long)pyVar79 + 0x13) - 0x30;
    if (9 < uVar95) goto LAB_01255069;
    uVar84 = uVar95 + uVar84 * 10;
    pyVar93 = (yyjson_val_uni *)((long)pyVar79 + 0x14);
    pyVar112 = pyVar93;
    pyVar92 = pyVar99;
    if ((digi_table[*(byte *)((long)pyVar79 + 0x14)] & 3) == 0) goto LAB_01255069;
LAB_01252dbf:
    pcVar100 = (char *)((long)pyVar112 * 0x100 + (long)local_560 * -0x100 + 1);
    pyVar81 = (yyjson_val_uni *)((long)pyVar112 + 1);
    do {
      pyVar99 = pyVar81;
      pyVar81 = (yyjson_val_uni *)((long)pyVar99 + 1);
      pcVar100 = pcVar100 + 0x100;
    } while ((digi_table[*(byte *)pyVar99] & 3) != 0);
    uVar84 = uVar84 + (0x34 < *(byte *)pyVar112);
    pyVar118 = pyVar99;
    if (pyVar92 == (yyjson_val_uni *)0x0) {
      if ((cVar88 < '\0') && ((digi_table[*(byte *)pyVar99] & 0x30) == 0)) {
        if (*ppuVar113 != (u8 *)0x0) {
          **ppuVar113 = '\0';
        }
        local_528[2].str = pcVar100;
        local_528[3].str = (char *)local_560;
        local_520 = pyVar103;
LAB_012549eb:
        *ppuVar113 = (u8 *)pyVar99;
        pyVar79 = local_538;
        pyVar112 = local_558;
        local_560 = pyVar99;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        goto LAB_0125c612;
      }
      pyVar92 = pyVar99;
      if (*(byte *)pyVar99 == 0x2e) {
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
        if ((digi_table[*(byte *)pyVar81] & 3) == 0) {
LAB_012533c8:
          local_4d4 = 0;
          local_510 = "no digit after decimal point";
          local_560 = pyVar81;
          goto LAB_01255171;
        }
        do {
          pbVar2 = (byte *)((long)pyVar118 + 1);
          pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
        } while ((digi_table[*pbVar2] & 3) != 0);
      }
    }
    pyVar99 = pyVar92;
    pyVar79 = pyVar118;
    do {
      do {
        pyVar79 = (yyjson_val_uni *)((long)pyVar79 + -1);
      } while (*(char *)pyVar79 == '0');
    } while (*(char *)pyVar79 == '.');
    pcVar100 = (char *)((long)pyVar99 + ((ulong)(pyVar99 < pyVar112) - (long)pyVar112));
    pyVar93 = pyVar118;
    if (pyVar79 < pyVar112) {
      pyVar112 = (yyjson_val_uni *)0x0;
      pyVar93 = (yyjson_val_uni *)0x0;
    }
    if ((digi_table[*(byte *)pyVar118] & 0x20) != 0) goto LAB_01252ece;
LAB_01252f4a:
    if ((long)pcVar100 < -0x157) {
      local_528[2].u64 = 0x14;
      local_528[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
      pyVar79 = local_538;
      pyVar112 = local_558;
      local_560 = pyVar118;
      local_548 = pyVar110;
      local_530 = ppuVar113;
      local_520 = pyVar103;
      goto LAB_0125c612;
    }
    if ((long)pcVar100 < 0x135) {
LAB_01252f6d:
      local_4d4 = (uint)pcVar100;
      if ((uVar84 >> 0x35 == 0) && (local_4d4 + 0x16 < 0x2d)) {
        if ((int)local_4d4 < 0) {
          dVar119 = (double)(long)uVar84 / *(double *)(f64_pow10_table + (ulong)-local_4d4 * 8);
        }
        else {
          dVar119 = (double)(long)uVar84 *
                    *(double *)(f64_pow10_table + (ulong)(local_4d4 & 0x7fffffff) * 8);
        }
        local_528[2].u64 = 0x14;
        dVar128 = -dVar119;
        if (bVar91 != 0x2d) {
          dVar128 = dVar119;
        }
        local_528[3].u64 = (uint64_t)dVar128;
        pyVar79 = local_538;
        pyVar112 = local_558;
        local_560 = pyVar118;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
        goto LAB_0125c612;
      }
      local_4f0 = pyVar93;
      if ((local_4d4 + 0x132 < 0x252) && (pyVar112 == (yyjson_val_uni *)0x0)) {
        uVar95 = 0x3f;
        if (uVar84 != 0) {
          for (; uVar84 >> uVar95 == 0; uVar95 = uVar95 - 1) {
          }
        }
        uVar82 = uVar84 << ((byte)(uVar95 ^ 0x3f) & 0x3f);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar82;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8);
        auVar15 = auVar15 * auVar37;
        lVar96 = auVar15._8_8_;
        uVar107 = auVar15._0_8_;
        bVar76 = true;
        if (0x1fd < (ulong)(auVar15._8_4_ & 0x1ff) - 1) {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar82;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8);
          lVar97 = SUB168(auVar16 * auVar38,8);
          bVar76 = false;
          if ((lVar97 + uVar107) - 1 < 0xfffffffffffffffe) {
            lVar96 = lVar96 + (ulong)(lVar97 + uVar107 < uVar107);
            bVar76 = true;
          }
        }
        if (bVar76) {
          uVar107 = lVar96 << (-1 < lVar96);
          uVar107 = (uVar107 & 0x400) + uVar107;
          local_528[2].u64 = 0x14;
          local_528[3].u64 =
               (ulong)(bVar91 == 0x2d) << 0x3f |
               uVar107 >> 0xb & 0xfffffffffffff |
               (ulong)(((((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) - (int)(uVar95 ^ 0x3f)) -
                       (uint)(-1 < lVar96)) + 0x47e + (uint)(uVar107 < 0x400)) << 0x34;
          pyVar79 = local_538;
          pyVar112 = local_558;
          local_560 = pyVar118;
          local_548 = pyVar110;
          local_530 = ppuVar113;
          local_520 = pyVar103;
          goto LAB_0125c612;
        }
      }
      uVar95 = 0x3f;
      if (uVar84 != 0) {
        for (; uVar84 >> uVar95 == 0; uVar95 = uVar95 - 1) {
        }
      }
      bVar90 = (byte)(uVar95 ^ 0x3f);
      lVar96 = ((ulong)(pyVar112 != (yyjson_val_uni *)0x0) << 2) << (bVar90 & 0x3f);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           *(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8) -
           (*(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8) >> 0x3f);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar84 << (bVar90 & 0x3f);
      uVar82 = SUB168(auVar17 * auVar39,8) - (SUB168(auVar17 * auVar39,0) >> 0x3f);
      uVar107 = 0x3f;
      if (uVar82 != 0) {
        for (; uVar82 >> uVar107 == 0; uVar107 = uVar107 - 1) {
        }
      }
      bVar90 = (byte)(uVar107 ^ 0x3f);
      uVar82 = uVar82 << (bVar90 & 0x3f);
      uVar116 = (9 - (ulong)(lVar96 == 0)) + lVar96 << (bVar90 & 0x3f);
      iVar114 = (((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) -
                ((int)(uVar95 ^ 0x3f) + (int)(uVar107 ^ 0x3f))) + 0x40;
      iVar115 = 0xb;
      if (iVar114 < -0x43d) {
        iVar115 = 0x40;
        if (-0x472 < iVar114) {
          iVar115 = -0x432 - iVar114;
        }
      }
      local_4a0 = pyVar99;
      if (0x3c < iVar115) {
        bVar90 = (char)iVar115 - 0x3c;
        uVar82 = uVar82 >> (bVar90 & 0x3f);
        iVar114 = iVar114 + iVar115 + -0x3c;
        uVar116 = (uVar116 >> (bVar90 & 0x3f)) + 9;
        iVar115 = 0x3c;
      }
      bVar90 = (byte)iVar115;
      lVar96 = 8L << (bVar90 - 1 & 0x3f);
      uVar117 = (~(-1L << (bVar90 & 0x3f)) & uVar82) * 8;
      uVar95 = lVar96 + uVar116;
      uVar107 = 0;
      uVar82 = (ulong)(uVar95 <= uVar117) + (uVar82 >> (bVar90 & 0x3f));
      if (uVar82 != 0) {
        uVar9 = 0x3f;
        if (uVar82 != 0) {
          for (; uVar82 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        iVar115 = (iVar114 + iVar115) - (int)(uVar9 ^ 0x3f);
        uVar107 = 0x7ff0000000000000;
        if (iVar115 < 0x3c1) {
          uVar82 = (uVar82 << ((byte)(uVar9 ^ 0x3f) & 0x3f)) >> 0xb;
          if (iVar115 < -0x43d) {
            uVar107 = 0;
            if (-0x472 < iVar115) {
              uVar107 = uVar82 >> (-(char)iVar115 - 0x3dU & 0x3f);
            }
          }
          else {
            uVar107 = uVar82 & 0xfffffffffffff | (ulong)(iVar115 + 0x43e) << 0x34;
          }
        }
      }
      if (uVar107 == 0x7ff0000000000000) {
        if (cVar88 < '\0') {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          local_528[2].str = (char *)(((long)pyVar118 - (long)local_560) * 0x100 + 1);
          local_528[3].str = (char *)local_560;
          *ppuVar113 = (u8 *)pyVar118;
        }
        else {
          if ((flg & 0x10) == 0) {
            local_510 = "number is infinity when parsed as double";
            bVar76 = false;
            local_560 = pyVar109;
            local_548 = pyVar110;
            local_530 = ppuVar113;
            local_520 = pyVar103;
            goto LAB_012532af;
          }
          uVar84 = 0x7ff0000000000000;
          if (bVar91 == 0x2d) {
            uVar84 = 0xfff0000000000000;
          }
          local_528[2].u64 = 0x14;
          local_528[3].u64 = uVar84;
        }
        bVar76 = true;
        local_560 = pyVar118;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
      }
      else if ((lVar96 - uVar116 < uVar117) && (uVar117 < uVar95)) {
        iVar115 = -0x433;
        if (0xfffffffffffff < uVar107) {
          iVar115 = (uint)(uVar107 >> 0x34) - 0x434;
        }
        local_4a8 = (yyjson_val_uni *)CONCAT44(local_4a8._4_4_,iVar115);
        uVar95 = (uVar107 & 0xfffffffffffff) + 0x10000000000000;
        if (0xfffffffffffff >= uVar107) {
          uVar95 = uVar107;
        }
        local_498 = &local_460;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
        local_508 = pyVar80;
        bigint_set_buf(local_498,uVar84,(i32 *)&local_4d4,(u8 *)&pyVar112->u64,(u8 *)&pyVar93->u64,
                       (u8 *)&pyVar99->u64);
        local_4f0 = (yyjson_val_uni *)local_258.bits;
        local_258.used = 1;
        local_258.bits[0] = uVar95 * 2 + 1;
        if ((int)local_4d4 < 0) {
          iVar114 = -local_4d4;
          local_258.used = 1;
          iVar115 = iVar114;
          if ((int)local_4d4 < -0x12) {
            do {
              uVar82 = (ulong)local_258.used;
              uVar95 = 0;
              if (local_258.used != 0) {
                uVar95 = 0;
                do {
                  if (local_258.bits[uVar95] != 0) goto LAB_0125497a;
                  uVar95 = uVar95 + 1;
                } while (local_258.used != (uint)uVar95);
                uVar95 = (ulong)local_258.used;
              }
LAB_0125497a:
              if ((uint)uVar95 < local_258.used) {
                uVar95 = uVar95 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar98;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = local_258.bits[uVar95];
                  auVar64 = ZEXT816(10000000000000000000) * auVar41 + auVar64;
                  uVar98 = auVar64._8_8_;
                  local_258.bits[uVar95] = auVar64._0_8_;
                  uVar95 = uVar95 + 1;
                } while (uVar82 != uVar95);
              }
              else {
                uVar98 = 0;
              }
              if (uVar98 != 0) {
                local_258.used = local_258.used + 1;
                local_258.bits[uVar82] = uVar98;
              }
              iVar115 = iVar114 + -0x13;
              bVar76 = 0x25 < iVar114;
              iVar114 = iVar115;
            } while (bVar76);
          }
          if (iVar115 != 0) {
            uVar95 = *(ulong *)(u64_pow10_table + (long)iVar115 * 8);
            uVar116 = (ulong)local_258.used;
            uVar82 = 0;
            if (uVar116 != 0) {
              uVar82 = 0;
              do {
                if (local_258.bits[uVar82] != 0) goto LAB_01254afd;
                uVar82 = uVar82 + 1;
              } while (local_258.used != (uint)uVar82);
              uVar82 = (ulong)local_258.used;
            }
LAB_01254afd:
            uVar98 = 0;
            if ((uint)uVar82 < local_258.used) {
              uVar82 = uVar82 & 0xffffffff;
              uVar98 = 0;
              do {
                auVar66._8_8_ = 0;
                auVar66._0_8_ = uVar98;
                auVar19._8_8_ = 0;
                auVar19._0_8_ = uVar95;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = local_258.bits[uVar82];
                auVar66 = auVar19 * auVar43 + auVar66;
                uVar98 = auVar66._8_8_;
                local_258.bits[uVar82] = auVar66._0_8_;
                uVar82 = uVar82 + 1;
              } while (uVar116 != uVar82);
            }
            if (uVar98 != 0) {
              local_498 = &local_258;
              local_258.used = local_258.used + 1;
              goto LAB_01254b47;
            }
          }
        }
        else {
          uVar105 = local_4d4;
          uVar77 = local_4d4;
          if (0x12 < (int)local_4d4) {
            do {
              uVar82 = (ulong)local_460.used;
              uVar95 = 0;
              if (local_460.used != 0) {
                uVar95 = 0;
                do {
                  if (local_460.bits[uVar95] != 0) goto LAB_01254868;
                  uVar95 = uVar95 + 1;
                } while (local_460.used != (uint)uVar95);
                uVar95 = (ulong)local_460.used;
              }
LAB_01254868:
              if ((uint)uVar95 < local_460.used) {
                uVar95 = uVar95 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = uVar98;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = local_460.bits[uVar95];
                  auVar63 = ZEXT816(10000000000000000000) * auVar40 + auVar63;
                  uVar98 = auVar63._8_8_;
                  local_460.bits[uVar95] = auVar63._0_8_;
                  uVar95 = uVar95 + 1;
                } while (uVar82 != uVar95);
              }
              else {
                uVar98 = 0;
              }
              if (uVar98 != 0) {
                local_460.used = local_460.used + 1;
                local_460.bits[uVar82] = uVar98;
              }
              uVar105 = uVar77 - 0x13;
              bVar76 = 0x25 < (int)uVar77;
              uVar77 = uVar105;
            } while (bVar76);
          }
          if (uVar105 != 0) {
            uVar95 = *(ulong *)(u64_pow10_table + (long)(int)uVar105 * 8);
            uVar116 = (ulong)local_460.used;
            uVar82 = 0;
            if (uVar116 != 0) {
              uVar82 = 0;
              do {
                if (local_460.bits[uVar82] != 0) goto LAB_01254a44;
                uVar82 = uVar82 + 1;
              } while (local_460.used != (uint)uVar82);
              uVar82 = (ulong)local_460.used;
            }
LAB_01254a44:
            uVar98 = 0;
            if ((uint)uVar82 < local_460.used) {
              uVar82 = uVar82 & 0xffffffff;
              uVar98 = 0;
              do {
                auVar65._8_8_ = 0;
                auVar65._0_8_ = uVar98;
                auVar18._8_8_ = 0;
                auVar18._0_8_ = uVar95;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = local_460.bits[uVar82];
                auVar65 = auVar18 * auVar42 + auVar65;
                uVar98 = auVar65._8_8_;
                local_460.bits[uVar82] = auVar65._0_8_;
                uVar82 = uVar82 + 1;
              } while (uVar116 != uVar82);
            }
            if (uVar98 != 0) {
              local_460.used = local_460.used + 1;
LAB_01254b47:
              local_498->bits[uVar116] = uVar98;
            }
          }
        }
        if ((int)(uint)local_4a8 < 1) {
          uVar105 = -(uint)local_4a8;
          uVar77 = uVar105 >> 6;
          uVar95 = (ulong)local_460.used;
          if ((uVar105 & 0x3f) == 0) {
            if (uVar95 != 0) {
              do {
                local_460.bits[((uVar105 >> 6) - 1) + (int)uVar95] = local_460.bits[uVar95 - 1];
                uVar95 = uVar95 - 1;
              } while (uVar95 != 0);
            }
            local_460.used = local_460.used + uVar77;
            if (0x3f < uVar105) {
              local_4f0 = (yyjson_val_uni *)local_460.bits;
              goto LAB_01254cdf;
            }
          }
          else {
            local_4f0 = (yyjson_val_uni *)local_460.bits;
            local_460.bits[uVar95] = 0;
            sVar89 = (sbyte)(uVar105 & 0x3f);
            if (uVar95 != 0) {
              do {
                local_460.bits[(uVar105 >> 6) + (int)uVar95] =
                     local_460.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                     local_460.bits[uVar95] << sVar89;
                uVar95 = uVar95 - 1;
              } while (uVar95 != 0);
            }
            local_460.bits[uVar77] = local_460.bits[0] << sVar89;
            local_460.used =
                 (local_460.used + uVar77 + 1) -
                 (uint)(local_460.bits[local_460.used + uVar77] == 0);
            if (0x3f < uVar105) goto LAB_01254cdf;
          }
        }
        else {
          uVar77 = (uint)local_4a8 >> 6;
          uVar95 = (ulong)local_258.used;
          bVar91 = (byte)local_4a8 & 0x3f;
          if (((ulong)local_4a8 & 0x3f) == 0) {
            yyjson_read_opts();
          }
          else {
            local_258.bits[uVar95] = 0;
            if (uVar95 != 0) {
              do {
                local_258.bits[((uint)local_4a8 >> 6) + (int)uVar95] =
                     local_258.bits[uVar95 - 1] >> (0x40 - bVar91 & 0x3f) |
                     local_258.bits[uVar95] << bVar91;
                uVar95 = uVar95 - 1;
              } while (uVar95 != 0);
            }
            local_258.bits[uVar77] = local_258.bits[0] << bVar91;
            local_258.used =
                 (local_258.used + uVar77 + 1) -
                 (uint)(local_258.bits[local_258.used + uVar77] == 0);
            if ((uint)local_4a8 < 0x40) goto LAB_01254cf9;
          }
LAB_01254cdf:
          switchD_00570541::default(local_4f0,0,(ulong)(uVar77 - 1) * 8 + 8);
        }
LAB_01254cf9:
        uVar95 = (ulong)local_460.used;
        iVar115 = -1;
        if (local_258.used <= local_460.used) {
          iVar114 = 1;
          iVar115 = 1;
          if (local_460.used <= local_258.used) {
            do {
              if (uVar95 == 0) {
                iVar115 = 0;
                break;
              }
              uVar82 = local_460.bits[uVar95 - 1];
              uVar116 = local_258.bits[uVar95 - 1];
              iVar115 = iVar114;
              if (uVar82 >= uVar116 && uVar82 != uVar116) {
                iVar115 = 1;
              }
              if (uVar82 < uVar116) {
                iVar115 = -1;
              }
              uVar95 = uVar95 - 1;
              iVar114 = iVar115;
            } while (uVar82 == uVar116);
          }
        }
        if (iVar115 == 0) {
          uVar95 = (ulong)((uint)uVar107 & 1);
        }
        else {
          uVar95 = (ulong)(0 < iVar115);
        }
        uVar84 = 0x7ff0000000000000;
        ppuVar113 = local_530;
        pyVar103 = local_520;
        pyVar102 = local_550;
        pyVar110 = local_548;
        pyVar80 = local_508;
        if (uVar95 + uVar107 == 0x7ff0000000000000) {
          if (cVar88 < '\0') {
            if (*local_530 != (u8 *)0x0) {
              **local_530 = '\0';
            }
            local_528[2].str = (char *)(((long)pyVar118 - (long)pyVar109) * 0x100 + 1);
            local_528[3].str = (char *)pyVar109;
            *local_530 = (u8 *)pyVar118;
          }
          else {
            if ((flg & 0x10) == 0) {
              local_510 = "number is infinity when parsed as double";
              bVar76 = false;
              local_560 = pyVar109;
              goto LAB_012532af;
            }
            if ((char)local_540 == '-') {
              uVar84 = 0xfff0000000000000;
            }
            local_528[2].u64 = 0x14;
            local_528[3].u64 = uVar84;
          }
        }
        else {
          local_528[2].u64 = 0x14;
          local_528[3].u64 = uVar95 + uVar107 | (ulong)((char)local_540 == '-') << 0x3f;
        }
        bVar76 = true;
        local_560 = pyVar118;
      }
      else {
        local_528[2].u64 = 0x14;
        local_528[3].u64 = uVar107 | (ulong)(bVar91 == 0x2d) << 0x3f;
        bVar76 = true;
        local_560 = pyVar118;
        local_548 = pyVar110;
        local_530 = ppuVar113;
        local_520 = pyVar103;
      }
LAB_012532af:
      pyVar79 = local_538;
      pyVar112 = local_558;
      if (bVar76 != false) goto LAB_0125c612;
      goto LAB_01255171;
    }
joined_r0x0125466e:
    if (cVar88 < '\0') {
      if (*ppuVar113 != (u8 *)0x0) {
        **ppuVar113 = '\0';
      }
      local_528[2].str = (char *)(((long)pyVar118 - (long)local_560) * 0x100 + 1);
      local_528[3].str = (char *)local_560;
      *ppuVar113 = (u8 *)pyVar118;
      pyVar79 = local_538;
      pyVar112 = local_558;
      local_560 = pyVar118;
      local_548 = pyVar110;
      local_530 = ppuVar113;
      local_520 = pyVar103;
      goto LAB_0125c612;
    }
    local_548 = pyVar110;
    local_530 = ppuVar113;
    local_520 = pyVar103;
    if ((flg & 0x10) != 0) {
      local_528[2].u64 = 0x14;
      local_528[3].str = (char *)(((ulong)(bVar91 != 0x2d) << 0x3f) + -0x10000000000000);
      pyVar79 = local_538;
      pyVar112 = local_558;
      local_560 = pyVar118;
      goto LAB_0125c612;
    }
LAB_01254589:
    local_4d4 = 0;
    local_510 = "number is infinity when parsed as double";
  }
  else {
LAB_01255069:
    if ((yyjson_val_uni *)((long)pyVar99 + 1) == pyVar93) {
      local_510 = "no digit after decimal point";
      local_560 = pyVar93;
      local_548 = pyVar110;
      local_530 = ppuVar113;
      local_520 = pyVar103;
    }
    else {
      pcVar100 = (char *)((long)pyVar99 + (1 - (long)pyVar93));
      pyVar79 = pyVar93;
      if ((digi_table[*(byte *)pyVar93] & 0x20) == 0) {
        if ((long)pcVar100 < -0x157) {
          local_528[2].u64 = 0x14;
          local_528[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
          pyVar79 = local_538;
          pyVar112 = local_558;
          local_560 = pyVar93;
          local_548 = pyVar110;
          local_530 = ppuVar113;
          local_520 = pyVar103;
          goto LAB_0125c612;
        }
        pyVar112 = (yyjson_val_uni *)0x0;
        pyVar118 = pyVar93;
        goto LAB_01252f6d;
      }
LAB_01252ce1:
      pyVar112 = (yyjson_val_uni *)0x0;
      pyVar118 = pyVar93;
      pyVar93 = pyVar79;
LAB_01252ece:
      bVar90 = *(byte *)((long)pyVar118 + 1);
      uVar95 = (ulong)((digi_table[bVar90] & 0xc) != 0);
      if ((digi_table[*(byte *)((long)pyVar118 + uVar95 + 1)] & 3) != 0) {
        pyVar79 = (yyjson_val_uni *)((long)pyVar118 + uVar95);
        pyVar118 = pyVar79;
        do {
          pyVar79 = (yyjson_val_uni *)((long)pyVar79 + 1);
          pcVar3 = (char *)((long)pyVar118 + 1);
          pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
        } while (*pcVar3 == '0');
        uVar95 = (ulong)*(byte *)pyVar118;
        lVar96 = 0;
        if ((digi_table[uVar95] & 3) != 0) {
          lVar96 = 0;
          do {
            lVar96 = (ulong)(byte)((char)uVar95 - 0x30) + lVar96 * 10;
            uVar95 = (ulong)*(byte *)((long)pyVar118 + 1);
            pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
          } while ((digi_table[uVar95] & 3) != 0);
        }
        if ((long)pyVar118 - (long)pyVar79 < 0x13) {
          lVar97 = -lVar96;
          if (bVar90 != 0x2d) {
            lVar97 = lVar96;
          }
          pcVar100 = pcVar100 + lVar97;
          goto LAB_01252f4a;
        }
        if (bVar90 == 0x2d) {
          local_528[2].u64 = 0x14;
          local_528[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
          pyVar79 = local_538;
          pyVar112 = local_558;
          local_560 = pyVar118;
          local_548 = pyVar110;
          local_530 = ppuVar113;
          local_520 = pyVar103;
          goto LAB_0125c612;
        }
        goto joined_r0x0125466e;
      }
      local_510 = "no digit after exponent sign";
      local_560 = (yyjson_val_uni *)((long)pyVar118 + uVar95 + 1);
      local_548 = pyVar110;
      local_530 = ppuVar113;
      local_520 = pyVar103;
    }
  }
LAB_01255171:
  pyVar112 = local_4e0;
  pyVar79 = local_4f8;
  pyVar87 = local_500;
  pyVar102 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,9,flg)
  ;
  if (bVar76) {
    pyVar85 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar85 = &local_4c0;
    }
    pyVar85->pos = (long)pyVar112 - (long)pyVar79;
    pyVar87->code = 5;
    pcVar100 = "unexpected end of data";
  }
  else {
    pyVar85 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar85 = &local_4c0;
    }
    pyVar85->pos = (long)pyVar102 - (long)pyVar79;
    pyVar87->code = 9;
    pcVar100 = local_510;
  }
  pyVar85 = local_518;
  if (local_518 == (yyjson_read_err *)0x0) {
    pyVar85 = &local_4c0;
  }
  pyVar85->msg = pcVar100;
  err = local_518;
LAB_0125c82a:
  if (pyVar80 != (yyjson_doc *)0x0) {
    (*local_4d0)(local_4e8,pyVar80);
  }
  pyVar80 = (yyjson_doc *)0x0;
  goto LAB_0125c844;
LAB_0125243a:
  do {
    do {
      local_560 = pyVar109;
      if ((char_table[*(byte *)local_560] & 0xc) == 0) {
        pyVar109 = local_560 + 1;
        do {
          local_560 = pyVar109;
          if ((char_table[*(byte *)((long)local_560 + -7)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -7);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -6)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -6);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -5)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -5);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -4)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -4);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -3)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -3);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -2)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -2);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + -1)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -1);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)local_560] & 0xc) != 0) goto LAB_01252580;
          if ((char_table[*(byte *)((long)local_560 + 1)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 2)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 3)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 3);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 4)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 4);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 5)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 5);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 6)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 6);
            goto LAB_01252580;
          }
          if ((char_table[*(byte *)((long)local_560 + 7)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 7);
            goto LAB_01252580;
          }
          pyVar109 = local_560 + 2;
        } while ((char_table[*(byte *)(local_560 + 1)] & 0xc) == 0);
        local_560 = local_560 + 1;
      }
LAB_01252580:
      uVar95 = 0xd;
      pyVar109 = local_560;
      if (*(char *)local_560 == '\"') goto LAB_01252792;
      pyVar79 = local_538;
      pyVar112 = local_558;
      local_548 = pyVar110;
      if (-1 < *(char *)local_560) goto LAB_01253f3d;
      uVar105 = *(uint *)local_560;
      while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
             ((uVar105 & 0x200f) != 0x200d))) {
        puVar1 = (uint *)((long)pyVar109 + 3);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        uVar105 = *puVar1;
      }
      local_530 = ppuVar113;
      local_508 = pyVar80;
    } while (-1 < (char)uVar105);
    if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
      do {
        uVar105 = *(uint *)((long)pyVar109 + 2);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
        if ((uVar105 & 0xc0e0) != 0x80c0) break;
      } while ((uVar105 & 0x1e) != 0);
    }
    if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
      while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
        uVar105 = *(uint *)((long)pyVar109 + 4);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
        if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
      }
    }
  } while (local_560 != pyVar109);
  if ((flg & 0x40) != 0) {
    pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
    goto LAB_0125243a;
  }
  goto LAB_012587af;
LAB_01253f3d:
  cVar4 = *(char *)local_560;
  if (cVar4 == '\\') {
    bVar91 = *(byte *)((long)local_560 + 1);
    if (bVar91 < 0x62) {
      if (bVar91 == 0x22) {
        *(char *)pyVar109 = '\"';
      }
      else if (bVar91 == 0x2f) {
        *(char *)pyVar109 = '/';
      }
      else {
        local_530 = ppuVar113;
        local_508 = pyVar80;
        if (bVar91 != 0x5c) goto switchD_01253f7e_caseD_6f;
        *(char *)pyVar109 = '\\';
      }
    }
    else {
      local_530 = ppuVar113;
      local_508 = pyVar80;
      switch(bVar91) {
      case 0x6e:
        *(char *)pyVar109 = '\n';
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_01253f7e_caseD_6f;
      case 0x72:
        *(char *)pyVar109 = '\r';
        break;
      case 0x74:
        *(char *)pyVar109 = '\t';
        break;
      case 0x75:
        uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 3)],
                          hex_conv_table[*(byte *)((long)local_560 + 5)]);
        if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 2)],
                                hex_conv_table[*(byte *)((long)local_560 + 4)])) & 0xf0f0) != 0)
        goto LAB_0125878b;
        uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 2)],
                                 hex_conv_table[*(byte *)((long)local_560 + 4)]) << 4;
        uVar77 = uVar75 | uVar105;
        pyVar99 = (yyjson_val_uni *)((long)local_560 + 6);
        if ((uVar77 & 0xf800) == 0xd800) {
          if ((uVar77 & 0xdc00) == 0xd800) {
            if (*(short *)pyVar99 == 0x755c) {
              if (((CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 9)],
                             hex_conv_table[*(byte *)((long)local_560 + 0xb)]) |
                   CONCAT11(hex_conv_table[*(byte *)(local_560 + 1)],
                            hex_conv_table[*(byte *)((long)local_560 + 10)])) & 0xf0f0) == 0) {
                uVar105 = (CONCAT11(hex_conv_table[*(byte *)(local_560 + 1)],
                                    hex_conv_table[*(byte *)((long)local_560 + 10)]) & 0xfff) << 4 |
                          (uint)CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 9)],
                                         hex_conv_table[*(byte *)((long)local_560 + 0xb)]);
                if ((uVar105 & 0xfc00) == 0xdc00) {
                  iVar115 = (uVar77 & 0xdbff) * 0x400;
                  uVar77 = iVar115 + uVar105 + 0xfca02400;
                  *(byte *)pyVar109 = (byte)(uVar77 >> 0x12) | 0xf0;
                  *(byte *)((long)pyVar109 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)pyVar109 + 2) =
                       (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)pyVar109 + 3) = (byte)uVar105 & 0x3f | 0x80;
                  pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
                  pyVar99 = (yyjson_val_uni *)((long)local_560 + 0xc);
                  goto LAB_01254065;
                }
                goto LAB_012587c7;
              }
              goto LAB_012587df;
            }
            goto LAB_012587bb;
          }
          goto LAB_012587a3;
        }
        uVar105 = (uint)uVar75 | uVar105 & 0xffff;
        bVar91 = (byte)uVar77;
        if (uVar105 < 0x800) {
          if (uVar105 < 0x80) {
            *(byte *)pyVar109 = bVar91;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
          }
          else {
            *(byte *)pyVar109 = (byte)(uVar77 >> 6) | 0xc0;
            *(byte *)((long)pyVar109 + 1) = bVar91 & 0x3f | 0x80;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
          }
        }
        else {
          *(byte *)pyVar109 = (byte)(uVar105 >> 0xc) | 0xe0;
          *(byte *)((long)pyVar109 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
          *(byte *)((long)pyVar109 + 2) = bVar91 & 0x3f | 0x80;
          pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        }
        goto LAB_01254065;
      default:
        if (bVar91 == 0x62) {
          *(char *)pyVar109 = '\b';
        }
        else {
          if (bVar91 != 0x66) goto switchD_01253f7e_caseD_6f;
          *(char *)pyVar109 = '\f';
        }
      }
    }
    pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
    pyVar99 = (yyjson_val_uni *)((long)local_560 + 2);
  }
  else {
    if (cVar4 == '\"') {
      uVar95 = 5;
      local_530 = ppuVar113;
      local_508 = pyVar80;
LAB_01252792:
      local_528[2].u64 = ((long)pyVar109 - (long)pyVar81) * 0x100 | uVar95;
      local_528[3].str = (char *)pyVar81;
      *(char *)pyVar109 = '\0';
      pyVar102 = pyVar102 + 2;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
      local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      goto LAB_0125c612;
    }
    local_530 = ppuVar113;
    local_508 = pyVar80;
    if ((flg & 0x40) == 0) goto LAB_01258797;
    if (local_4e0 <= local_560) goto LAB_012587d3;
    *(char *)pyVar109 = cVar4;
    pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
    pyVar99 = (yyjson_val_uni *)((long)local_560 + 1);
  }
LAB_01254065:
  do {
    local_560 = pyVar99;
    if ((char_table[*(byte *)local_560] & 0xc) != 0) {
LAB_012542a4:
      while( true ) {
        if (-1 < *(char *)local_560) goto LAB_01253f3d;
        uVar105 = *(uint *)local_560;
        pyVar99 = local_560;
        while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
               ((uVar105 & 0x200f) != 0x200d))) {
          *(uint *)pyVar109 = uVar105;
          pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
          puVar1 = (uint *)((long)pyVar99 + 3);
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 3);
          uVar105 = *puVar1;
        }
        if (-1 < (char)uVar105) break;
        if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)pyVar109 = (short)uVar105;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
            uVar105 = *(uint *)((long)pyVar99 + 2);
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 2);
            if ((uVar105 & 0xc0e0) != 0x80c0) break;
          } while ((uVar105 & 0x1e) != 0);
        }
        if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
            *(uint *)pyVar109 = uVar105;
            pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
            uVar105 = *(uint *)((long)pyVar99 + 4);
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 4);
            if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (local_560 != pyVar99) break;
        local_530 = ppuVar113;
        local_508 = pyVar80;
        if ((flg & 0x40) == 0) goto LAB_012582b9;
LAB_01254390:
        *(undefined2 *)pyVar109 = *(undefined2 *)pyVar99;
        local_560 = (yyjson_val_uni *)((long)pyVar99 + 1);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
      }
      goto LAB_01254065;
    }
    pyVar99 = local_560;
    if ((char_table[*(byte *)((long)local_560 + 1)] & 0xc) != 0) goto LAB_01254390;
    if ((char_table[*(byte *)((long)local_560 + 2)] & 0xc) != 0) {
      uVar6 = *(undefined2 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 2);
      *(undefined2 *)pyVar109 = uVar6;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 3)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 3);
      *(undefined4 *)pyVar109 = uVar7;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 4)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 4);
      *(undefined4 *)pyVar109 = uVar7;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 5)] & 0xc) != 0) {
      *(undefined4 *)pyVar109 = *(undefined4 *)local_560;
      *(undefined2 *)((long)pyVar109 + 4) = *(undefined2 *)((long)local_560 + 4);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
      local_560 = (yyjson_val_uni *)((long)local_560 + 5);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 6)] & 0xc) != 0) {
      *(undefined4 *)pyVar109 = *(undefined4 *)local_560;
      *(undefined2 *)((long)pyVar109 + 4) = *(undefined2 *)((long)local_560 + 4);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
      local_560 = (yyjson_val_uni *)((long)local_560 + 6);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 7)] & 0xc) != 0) {
      yVar8 = *local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 7);
      *pyVar109 = yVar8;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)(local_560 + 1)] & 0xc) != 0) {
      yVar8 = *local_560;
      local_560 = local_560 + 1;
      *pyVar109 = yVar8;
      pyVar109 = pyVar109 + 1;
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 9)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined2 *)(pyVar109 + 1) = *(undefined2 *)(local_560 + 1);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 9);
      local_560 = (yyjson_val_uni *)((long)local_560 + 9);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 10)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined2 *)(pyVar109 + 1) = *(undefined2 *)(local_560 + 1);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 10);
      local_560 = (yyjson_val_uni *)((long)local_560 + 10);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xb)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined4 *)(pyVar109 + 1) = *(undefined4 *)(local_560 + 1);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xb);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xc)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined4 *)(pyVar109 + 1) = *(undefined4 *)(local_560 + 1);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xc);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xd)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined4 *)(pyVar109 + 1) = *(undefined4 *)(local_560 + 1);
      *(undefined2 *)((long)pyVar109 + 0xc) = *(undefined2 *)((long)local_560 + 0xc);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xd);
      goto LAB_012542a4;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xe)] & 0xc) != 0) {
      *pyVar109 = *local_560;
      *(undefined4 *)(pyVar109 + 1) = *(undefined4 *)(local_560 + 1);
      *(undefined2 *)((long)pyVar109 + 0xc) = *(undefined2 *)((long)local_560 + 0xc);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xe);
      goto LAB_012542a4;
    }
    bVar91 = char_table[*(byte *)((long)local_560 + 0xf)];
    yVar8 = local_560[1];
    *pyVar109 = *local_560;
    pyVar109[1] = yVar8;
    if ((bVar91 & 0xc) != 0) {
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xf);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
      goto LAB_012542a4;
    }
    pyVar109 = pyVar109 + 2;
    pyVar99 = local_560 + 2;
  } while( true );
LAB_01255449:
  local_548 = pyVar110;
  local_530 = ppuVar113;
  local_520 = pyVar103;
  if ((digi_table[*(byte *)pyVar99] & 3) == 0) {
    if ((digi_table[*(byte *)pyVar99] & 0x20) == 0) {
LAB_0125545b:
      local_528[2].u64 = 0x14;
      local_528[3].u64 = (ulong)((char)local_540 == '-') << 0x3f;
      pyVar102 = local_550;
      pyVar79 = local_538;
      pyVar110 = local_548;
      pyVar112 = local_558;
      ppuVar113 = local_530;
      pyVar103 = local_520;
      local_560 = pyVar99;
      goto LAB_0125c612;
    }
    yyjson_read_opts();
    pyVar99 = (yyjson_val_uni *)CONCAT44(local_460._4_4_,local_460.used);
    if ((extraout_RAX_00 & 1) == 0) goto LAB_0125545b;
  }
  else {
LAB_0125547f:
    local_4d4 = 0;
    local_510 = "number with leading zero is not allowed";
    local_560 = (yyjson_val_uni *)((long)pyVar99 + -1);
  }
  goto LAB_01255171;
LAB_0125c529:
LAB_0125c52e:
  bVar91 = *(byte *)local_560;
  if (bVar91 != 0x5d) {
    if (bVar91 != 0x2c) {
      if ((char_table[bVar91] & 1) == 0) {
        if ((flg & 8) == 0) goto LAB_0125c7ae;
        local_550 = pyVar102;
        local_540 = pyVar103;
        local_538 = pyVar79;
        bVar76 = skip_spaces_and_comments((u8 **)&local_560);
        pyVar103 = local_540;
        pyVar102 = local_550;
        pyVar79 = local_538;
        if (!bVar76) goto LAB_01255616;
      }
      else {
        do {
          local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        } while ((char_table[*(byte *)local_560] & 1) != 0);
      }
      goto LAB_0125c52e;
    }
    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
LAB_0124ecb4:
    local_540 = pyVar103;
LAB_0124ecc8:
    bVar91 = *(byte *)local_560;
    if (bVar91 == 0x5b) goto LAB_0124ef54;
    if (bVar91 == 0x7b) goto LAB_0124efa3;
    if ((char_table[bVar91] & 2) == 0) {
      uVar105 = (uint)bVar91;
      if (0x65 < bVar91) {
        if (uVar105 == 0x66) {
          pyVar102 = pyVar102 + 2;
          if (pyVar112 <= pyVar102) {
            local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
            sVar104 = (long)local_538 * 0x10;
            local_558 = pyVar112;
            local_550 = pyVar102;
            local_530 = ppuVar113;
            pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
            if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
            pyVar102 = (yyjson_val_uni *)(((long)local_550 - (long)pyVar80) + (long)pyVar83);
            pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
            pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
            pyVar79 = local_538;
            ppuVar113 = local_530;
            pyVar80 = pyVar83;
            local_558 = pyVar112;
            local_550 = pyVar102;
          }
          if (*(int *)((long)local_560 + 1) != 0x65736c61) goto LAB_0125aacd;
          pyVar102->u64 = 3;
          pyVar103 = (yyjson_val_uni *)((long)local_540 + 1);
          local_560 = (yyjson_val_uni *)((long)local_560 + 5);
          goto LAB_0125c529;
        }
        if (bVar91 == 0x6e) {
          pyVar102 = pyVar102 + 2;
          if (pyVar112 <= pyVar102) {
            local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
            sVar104 = (long)local_538 * 0x10;
            local_558 = pyVar112;
            local_550 = pyVar102;
            local_530 = ppuVar113;
            pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
            if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
            pyVar102 = (yyjson_val_uni *)(((long)local_550 - (long)pyVar80) + (long)pyVar83);
            pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
            pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
            pyVar79 = local_538;
            ppuVar113 = local_530;
            pyVar80 = pyVar83;
            local_558 = pyVar112;
            local_550 = pyVar102;
          }
          pyVar103 = (yyjson_val_uni *)((long)local_540 + 1);
          if (*(int *)local_560 != 0x6c6c756e) {
            if (((((flg & 0x10) == 0) || ((*(byte *)local_560 | 0x20) != 0x6e)) ||
                ((*(byte *)((long)local_560 + 1) | 0x20) != 0x61)) ||
               ((*(byte *)((long)local_560 + 2) | 0x20) != 0x6e)) goto LAB_0125aacd;
            pyVar109 = (yyjson_val_uni *)((long)local_560 + 3);
            if ((flg & 0xa0) == 0) {
              pyVar102->u64 = 0x14;
              local_560 = (yyjson_val_uni *)0x7ff8000000000000;
            }
            else {
              if (*ppuVar113 != (u8 *)0x0) {
                **ppuVar113 = '\0';
              }
              *ppuVar113 = (u8 *)pyVar109;
              pyVar102->u64 = 0x301;
            }
            pyVar102[1].str = (char *)local_560;
            local_560 = pyVar109;
            goto LAB_0125c529;
          }
          pyVar102->u64 = 2;
        }
        else {
          if (bVar91 != 0x74) goto LAB_0124ed22;
          pyVar102 = pyVar102 + 2;
          if (pyVar112 <= pyVar102) {
            local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
            sVar104 = (long)local_538 * 0x10;
            local_558 = pyVar112;
            local_550 = pyVar102;
            local_530 = ppuVar113;
            pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
            if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
            pyVar102 = (yyjson_val_uni *)(((long)local_550 - (long)pyVar80) + (long)pyVar83);
            pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
            pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
            pyVar79 = local_538;
            ppuVar113 = local_530;
            pyVar80 = pyVar83;
            local_558 = pyVar112;
            local_550 = pyVar102;
          }
          if (*(int *)local_560 != 0x65757274) goto LAB_0125aacd;
          pyVar103 = (yyjson_val_uni *)((long)local_540 + 1);
          pyVar102->u64 = 0xb;
        }
        local_560 = (yyjson_val_uni *)((long)local_560 + 4);
        goto LAB_0125c529;
      }
      if (bVar91 == 0x22) {
        pyVar102 = pyVar102 + 2;
        if (pyVar112 <= pyVar102) {
          local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
          sVar104 = (long)local_538 * 0x10;
          local_558 = pyVar112;
          local_550 = pyVar102;
          local_530 = ppuVar113;
          pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
          if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
          pyVar102 = (yyjson_val_uni *)(((long)local_550 - (long)pyVar80) + (long)pyVar83);
          pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
          pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
          pyVar79 = local_538;
          ppuVar113 = local_530;
          pyVar80 = pyVar83;
          local_558 = pyVar112;
          local_550 = pyVar102;
        }
        pyVar103 = (yyjson_val_uni *)((long)local_540 + 1);
        pyVar81 = (yyjson_val_uni *)((long)local_560 + 1);
        local_560 = pyVar81;
        goto LAB_0124f352;
      }
      if (uVar105 == 0x5d) {
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        if (local_540 == (yyjson_val_uni *)0x0) {
          pyVar103 = (yyjson_val_uni *)0x0;
        }
        else {
          pyVar103 = local_540;
          if ((flg & 4) == 0) {
            cVar88 = *(char *)local_560;
            while (cVar88 != ',') {
              local_560 = (yyjson_val_uni *)((long)local_560 + -1);
              cVar88 = *(char *)local_560;
            }
            goto LAB_0125a82a;
          }
        }
        goto LAB_0125c5d2;
      }
LAB_0124ed22:
      if ((char_table[bVar91] & 1) != 0) goto LAB_0124ed7d;
      if ((((flg & 0x10) != 0) && (uVar105 - 0x49 < 0x21)) &&
         ((0x100000021U >> ((ulong)(uVar105 - 0x49) & 0x3f) & 1) != 0)) {
        pyVar102 = pyVar102 + 2;
        local_530 = ppuVar113;
        if (pyVar112 <= pyVar102) {
          local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
          sVar104 = (long)local_538 * 0x10;
          pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
          if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
          pyVar102 = (yyjson_val_uni *)(((long)pyVar102 - (long)pyVar80) + (long)pyVar83);
          pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
          pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
          pyVar79 = local_538;
          pyVar80 = pyVar83;
        }
        pyVar109 = local_560;
        local_540 = (yyjson_val_uni *)((long)local_540 + 1);
        ppuVar113 = local_530;
        pyVar103 = local_540;
        if ((((*(byte *)local_560 | 0x20) == 0x69) &&
            ((*(byte *)((long)local_560 + 1) | 0x20) == 0x6e)) &&
           ((*(byte *)((long)local_560 + 2) | 0x20) == 0x66)) {
          pyVar81 = (yyjson_val_uni *)((long)local_560 + 3);
          if ((((*(byte *)((long)local_560 + 3) | 0x20) == 0x69) &&
              ((*(byte *)((long)local_560 + 4) | 0x20) == 0x6e)) &&
             (((*(byte *)((long)local_560 + 5) | 0x20) == 0x69 &&
              (((*(byte *)((long)local_560 + 6) | 0x20) == 0x74 &&
               ((*(byte *)((long)local_560 + 7) | 0x20) == 0x79)))))) {
            pyVar81 = local_560 + 1;
          }
          if ((flg & 0xa0) != 0) {
            if (*local_530 != (u8 *)0x0) {
              **local_530 = '\0';
            }
            *local_530 = (u8 *)pyVar81;
            pyVar102->str = (char *)(((long)pyVar81 - (long)local_560) * 0x100 + 1);
            local_560 = pyVar81;
LAB_01250986:
            pyVar102[1].str = (char *)pyVar109;
            goto LAB_0125c529;
          }
          pyVar102->u64 = 0x14;
          uVar84 = 0x7ff0000000000000;
          local_560 = pyVar81;
        }
        else {
          if ((((*(byte *)local_560 | 0x20) != 0x6e) ||
              ((*(byte *)((long)local_560 + 1) | 0x20) != 0x61)) ||
             ((*(byte *)((long)local_560 + 2) | 0x20) != 0x6e)) goto LAB_0125c7ae;
          local_560 = (yyjson_val_uni *)((long)local_560 + 3);
          if ((flg & 0xa0) != 0) {
            if (*local_530 != (u8 *)0x0) {
              **local_530 = '\0';
            }
            *local_530 = (u8 *)local_560;
            pyVar102->u64 = 0x301;
            goto LAB_01250986;
          }
          pyVar102->u64 = 0x14;
          uVar84 = 0x7ff8000000000000;
        }
        pyVar102[1].u64 = uVar84;
        goto LAB_0125c529;
      }
      if ((flg & 8) == 0) goto LAB_0125c7ae;
      local_558 = pyVar112;
      local_550 = pyVar102;
      local_548 = pyVar110;
      bVar76 = skip_spaces_and_comments((u8 **)&local_560);
      pyVar102 = local_550;
      pyVar110 = local_548;
      pyVar112 = local_558;
      if (!bVar76) goto LAB_01255616;
      goto LAB_0124ecc8;
    }
    pyVar102 = pyVar102 + 2;
    local_538 = pyVar79;
    local_530 = ppuVar113;
    if (pyVar112 <= pyVar102) {
      local_538 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
      sVar104 = (long)local_538 * 0x10;
      local_558 = pyVar112;
      local_550 = pyVar102;
      pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
      if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
      pyVar102 = (yyjson_val_uni *)(((long)local_550 - (long)pyVar80) + (long)pyVar83);
      pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
      pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
      pyVar80 = pyVar83;
      local_558 = pyVar112;
    }
    ppuVar113 = local_530;
    pyVar103 = (yyjson_val_uni *)((long)local_540 + 1);
    local_4d4 = 0;
    local_550 = pyVar102;
    local_548 = pyVar110;
    if (-1 < cVar88 && (flg & 0xa0) != 0) {
      bVar76 = read_number_raw((u8 **)&local_560,local_530,flg,(yyjson_val *)pyVar102,&local_510);
      goto LAB_0124fcf3;
    }
    cVar4 = *(char *)local_560;
    uVar107 = (ulong)(cVar4 == '-');
    pyVar81 = (yyjson_val_uni *)(uVar107 + (long)local_560);
    bVar91 = *(byte *)((long)local_560 + uVar107);
    uVar95 = (ulong)bVar91;
    pyVar79 = local_538;
    local_558 = pyVar112;
    if ((digi_table[uVar95] & 2) != 0) {
      uVar107 = uVar95 - 0x30;
      bVar91 = *(byte *)((long)pyVar81 + 1);
      uVar82 = (ulong)bVar91 - 0x30;
      pyVar109 = pyVar81;
      if (9 < uVar82) {
        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
        if ((digi_table[bVar91] & 0x30) != 0) {
          pcVar100 = (char *)0x0;
          local_528 = (yyjson_val_uni *)0x0;
          pyVar93 = pyVar99;
          pyVar118 = pyVar99;
          if (bVar91 != 0x2e) goto LAB_0124f919;
          goto LAB_012519d3;
        }
        pyVar102->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
        if (cVar4 == '-') {
          uVar107 = 0x30 - uVar95;
        }
        pyVar102[1].u64 = uVar107;
        local_560 = pyVar99;
        local_540 = pyVar103;
        goto LAB_0125c529;
      }
      uVar107 = uVar82 + uVar107 * 10;
      bVar91 = *(byte *)((long)pyVar81 + 2);
      uVar95 = (ulong)bVar91 - 0x30;
      if (uVar95 < 10) {
        uVar107 = uVar95 + uVar107 * 10;
        bVar91 = *(byte *)((long)pyVar81 + 3);
        uVar95 = (ulong)bVar91 - 0x30;
        if (uVar95 < 10) {
          uVar107 = uVar95 + uVar107 * 10;
          bVar91 = *(byte *)((long)pyVar81 + 4);
          uVar95 = (ulong)bVar91 - 0x30;
          if (uVar95 < 10) {
            uVar107 = uVar95 + uVar107 * 10;
            bVar91 = *(byte *)((long)pyVar81 + 5);
            uVar95 = (ulong)bVar91 - 0x30;
            if (uVar95 < 10) {
              uVar107 = uVar95 + uVar107 * 10;
              bVar91 = *(byte *)((long)pyVar81 + 6);
              uVar95 = (ulong)bVar91 - 0x30;
              if (uVar95 < 10) {
                uVar107 = uVar95 + uVar107 * 10;
                bVar91 = *(byte *)((long)pyVar81 + 7);
                uVar95 = (ulong)bVar91 - 0x30;
                if (uVar95 < 10) {
                  uVar107 = uVar95 + uVar107 * 10;
                  bVar91 = *(byte *)(pyVar81 + 1);
                  uVar95 = (ulong)bVar91 - 0x30;
                  if (uVar95 < 10) {
                    uVar107 = uVar95 + uVar107 * 10;
                    bVar91 = *(byte *)((long)pyVar81 + 9);
                    uVar95 = (ulong)bVar91 - 0x30;
                    if (uVar95 < 10) {
                      uVar107 = uVar95 + uVar107 * 10;
                      bVar91 = *(byte *)((long)pyVar81 + 10);
                      uVar95 = (ulong)bVar91 - 0x30;
                      if (uVar95 < 10) {
                        uVar107 = uVar95 + uVar107 * 10;
                        bVar91 = *(byte *)((long)pyVar81 + 0xb);
                        uVar95 = (ulong)bVar91 - 0x30;
                        if (uVar95 < 10) {
                          uVar107 = uVar95 + uVar107 * 10;
                          bVar91 = *(byte *)((long)pyVar81 + 0xc);
                          uVar95 = (ulong)bVar91 - 0x30;
                          if (uVar95 < 10) {
                            uVar107 = uVar95 + uVar107 * 10;
                            bVar91 = *(byte *)((long)pyVar81 + 0xd);
                            uVar95 = (ulong)bVar91 - 0x30;
                            if (uVar95 < 10) {
                              uVar107 = uVar95 + uVar107 * 10;
                              bVar91 = *(byte *)((long)pyVar81 + 0xe);
                              uVar95 = (ulong)bVar91 - 0x30;
                              if (uVar95 < 10) {
                                uVar107 = uVar95 + uVar107 * 10;
                                bVar91 = *(byte *)((long)pyVar81 + 0xf);
                                uVar95 = (ulong)bVar91 - 0x30;
                                if (uVar95 < 10) {
                                  uVar107 = uVar95 + uVar107 * 10;
                                  bVar91 = *(byte *)(pyVar81 + 2);
                                  uVar95 = (ulong)bVar91 - 0x30;
                                  if (uVar95 < 10) {
                                    uVar107 = uVar95 + uVar107 * 10;
                                    bVar91 = *(byte *)((long)pyVar81 + 0x11);
                                    uVar95 = (ulong)bVar91 - 0x30;
                                    if (uVar95 < 10) {
                                      uVar107 = uVar95 + uVar107 * 10;
                                      bVar91 = *(byte *)((long)pyVar81 + 0x12);
                                      uVar95 = (ulong)bVar91 - 0x30;
                                      if (uVar95 < 10) {
                                        uVar107 = uVar95 + uVar107 * 10;
                                        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x13);
                                        bVar91 = *(byte *)((long)pyVar81 + 0x13);
                                        bVar90 = digi_table[bVar91];
                                        if ((bVar90 & 0x33) == 0) {
                                          if ((cVar4 != '-') || (uVar107 < 0x8000000000000001)) {
                                            pyVar102->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
                                            uVar95 = -uVar107;
                                            if (cVar4 != '-') {
                                              uVar95 = uVar107;
                                            }
                                            pyVar102[1].u64 = uVar95;
                                            local_560 = pyVar99;
                                            goto LAB_0125c529;
                                          }
                                          if (-1 < cVar88) {
                                            auVar120._8_4_ = (int)(uVar107 >> 0x20);
                                            auVar120._0_8_ = uVar107;
                                            auVar120._12_4_ = 0x45300000;
                                            pyVar102->u64 = 0x14;
                                            pyVar102[1].f64 =
                                                 -((auVar120._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,(int)uVar107) -
                                                  4503599627370496.0));
                                            local_560 = pyVar99;
                                            goto LAB_0125c529;
                                          }
                                          if (*local_530 != (u8 *)0x0) {
                                            **local_530 = '\0';
                                          }
                                          pyVar102->str =
                                               (char *)(((long)pyVar99 - (long)local_560) * 0x100 +
                                                       1);
                                          goto LAB_01250dee;
                                        }
                                        if (((bVar90 & 3) != 0) &&
                                           ((digi_table[*(byte *)((long)pyVar81 + 0x14)] & 0x33) ==
                                            0)) {
                                          pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0x14);
                                          uVar95 = (ulong)bVar91 - 0x30;
                                          if ((uVar107 < 0x1999999999999999) ||
                                             ((uVar107 == 0x1999999999999999 && (uVar95 < 6)))) {
                                            uVar84 = uVar95 + uVar107 * 10;
                                            if (cVar4 == '-') {
                                              if (cVar88 < '\0') {
                                                if (*local_530 != (u8 *)0x0) {
                                                  **local_530 = '\0';
                                                }
                                                pyVar102->str =
                                                     (char *)(((long)pyVar109 - (long)local_560) *
                                                              0x100 + 1);
                                                pyVar102[1].str = (char *)local_560;
                                                *local_530 = (u8 *)pyVar109;
                                                local_560 = pyVar109;
                                              }
                                              else {
                                                auVar121._8_4_ = (int)(uVar84 >> 0x20);
                                                auVar121._0_8_ = uVar84;
                                                auVar121._12_4_ = 0x45300000;
                                                pyVar102->u64 = 0x14;
                                                pyVar102[1].f64 =
                                                     -((auVar121._8_8_ - 1.9342813113834067e+25) +
                                                      ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                      4503599627370496.0));
                                                local_560 = pyVar109;
                                              }
                                            }
                                            else {
                                              pyVar102->u64 = 4;
                                              pyVar102[1].u64 = uVar84;
                                              local_560 = pyVar109;
                                            }
                                            goto LAB_0125c529;
                                          }
                                        }
                                        pcVar100 = (char *)0x0;
                                        if ((bVar90 & 0x20) != 0) {
                                          local_528 = (yyjson_val_uni *)0x0;
                                          pyVar93 = pyVar99;
                                          pyVar118 = (yyjson_val_uni *)0x0;
                                          goto LAB_0124f919;
                                        }
                                        pyVar92 = pyVar99;
                                        pyVar93 = (yyjson_val_uni *)0x0;
                                        if ((bVar91 != 0x2e) ||
                                           (pyVar92 = (yyjson_val_uni *)((long)pyVar81 + 0x14),
                                           pyVar93 = pyVar99,
                                           (digi_table[*(byte *)((long)pyVar81 + 0x14)] & 3) != 0))
                                        goto LAB_0124f80d;
                                        local_510 = "no digit after decimal point";
                                        local_560 = pyVar92;
                                        goto LAB_01255171;
                                      }
                                      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x12);
                                      if ((digi_table[bVar91] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        local_528 = (yyjson_val_uni *)0x0;
                                        pyVar93 = pyVar99;
                                        pyVar118 = pyVar99;
                                        if (bVar91 != 0x2e) goto LAB_0124f919;
                                        goto LAB_01251bd1;
                                      }
                                    }
                                    else {
                                      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x11);
                                      if ((digi_table[bVar91] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        local_528 = (yyjson_val_uni *)0x0;
                                        pyVar93 = pyVar99;
                                        pyVar118 = pyVar99;
                                        if (bVar91 != 0x2e) goto LAB_0124f919;
                                        goto LAB_01251bb3;
                                      }
                                    }
                                  }
                                  else {
                                    pyVar99 = pyVar81 + 2;
                                    if ((digi_table[bVar91] & 0x30) != 0) {
                                      pcVar100 = (char *)0x0;
                                      local_528 = (yyjson_val_uni *)0x0;
                                      pyVar93 = pyVar99;
                                      pyVar118 = pyVar99;
                                      if (bVar91 != 0x2e) goto LAB_0124f919;
                                      goto LAB_01251b95;
                                    }
                                  }
                                }
                                else {
                                  pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
                                  if ((digi_table[bVar91] & 0x30) != 0) {
                                    pcVar100 = (char *)0x0;
                                    local_528 = (yyjson_val_uni *)0x0;
                                    pyVar93 = pyVar99;
                                    pyVar118 = pyVar99;
                                    if (bVar91 != 0x2e) goto LAB_0124f919;
                                    goto LAB_01251b77;
                                  }
                                }
                              }
                              else {
                                pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
                                if ((digi_table[bVar91] & 0x30) != 0) {
                                  pcVar100 = (char *)0x0;
                                  local_528 = (yyjson_val_uni *)0x0;
                                  pyVar93 = pyVar99;
                                  pyVar118 = pyVar99;
                                  if (bVar91 != 0x2e) goto LAB_0124f919;
                                  goto LAB_01251b59;
                                }
                              }
                            }
                            else {
                              pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
                              if ((digi_table[bVar91] & 0x30) != 0) {
                                pcVar100 = (char *)0x0;
                                local_528 = (yyjson_val_uni *)0x0;
                                pyVar93 = pyVar99;
                                pyVar118 = pyVar99;
                                if (bVar91 != 0x2e) goto LAB_0124f919;
                                goto LAB_01251b3b;
                              }
                            }
                          }
                          else {
                            pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
                            if ((digi_table[bVar91] & 0x30) != 0) {
                              pcVar100 = (char *)0x0;
                              local_528 = (yyjson_val_uni *)0x0;
                              pyVar93 = pyVar99;
                              pyVar118 = pyVar99;
                              if (bVar91 != 0x2e) goto LAB_0124f919;
                              goto LAB_01251b1d;
                            }
                          }
                        }
                        else {
                          pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
                          if ((digi_table[bVar91] & 0x30) != 0) {
                            pcVar100 = (char *)0x0;
                            local_528 = (yyjson_val_uni *)0x0;
                            pyVar93 = pyVar99;
                            pyVar118 = pyVar99;
                            if (bVar91 != 0x2e) goto LAB_0124f919;
                            goto LAB_01251aff;
                          }
                        }
                      }
                      else {
                        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 10);
                        if ((digi_table[bVar91] & 0x30) != 0) {
                          pcVar100 = (char *)0x0;
                          local_528 = (yyjson_val_uni *)0x0;
                          pyVar93 = pyVar99;
                          pyVar118 = pyVar99;
                          if (bVar91 != 0x2e) goto LAB_0124f919;
                          goto LAB_01251ae1;
                        }
                      }
                    }
                    else {
                      pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 9);
                      if ((digi_table[bVar91] & 0x30) != 0) {
                        pcVar100 = (char *)0x0;
                        local_528 = (yyjson_val_uni *)0x0;
                        pyVar93 = pyVar99;
                        pyVar118 = pyVar99;
                        if (bVar91 != 0x2e) goto LAB_0124f919;
                        goto LAB_01251ac3;
                      }
                    }
                  }
                  else {
                    pyVar99 = pyVar81 + 1;
                    if ((digi_table[bVar91] & 0x30) != 0) {
                      pcVar100 = (char *)0x0;
                      local_528 = (yyjson_val_uni *)0x0;
                      pyVar93 = pyVar99;
                      pyVar118 = pyVar99;
                      if (bVar91 != 0x2e) goto LAB_0124f919;
                      goto LAB_01251aa5;
                    }
                  }
                }
                else {
                  pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 7);
                  if ((digi_table[bVar91] & 0x30) != 0) {
                    pcVar100 = (char *)0x0;
                    local_528 = (yyjson_val_uni *)0x0;
                    pyVar93 = pyVar99;
                    pyVar118 = pyVar99;
                    if (bVar91 != 0x2e) goto LAB_0124f919;
                    goto LAB_01251a87;
                  }
                }
              }
              else {
                pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 6);
                if ((digi_table[bVar91] & 0x30) != 0) {
                  pcVar100 = (char *)0x0;
                  local_528 = (yyjson_val_uni *)0x0;
                  pyVar93 = pyVar99;
                  pyVar118 = pyVar99;
                  if (bVar91 != 0x2e) goto LAB_0124f919;
                  goto LAB_01251a69;
                }
              }
            }
            else {
              pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 5);
              if ((digi_table[bVar91] & 0x30) != 0) {
                pcVar100 = (char *)0x0;
                local_528 = (yyjson_val_uni *)0x0;
                pyVar93 = pyVar99;
                pyVar118 = pyVar99;
                if (bVar91 != 0x2e) goto LAB_0124f919;
                goto LAB_01251a4b;
              }
            }
          }
          else {
            pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 4);
            if ((digi_table[bVar91] & 0x30) != 0) {
              pcVar100 = (char *)0x0;
              local_528 = (yyjson_val_uni *)0x0;
              pyVar93 = pyVar99;
              pyVar118 = pyVar99;
              if (bVar91 != 0x2e) goto LAB_0124f919;
              goto LAB_01251a2d;
            }
          }
        }
        else {
          pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 3);
          if ((digi_table[bVar91] & 0x30) != 0) {
            pcVar100 = (char *)0x0;
            local_528 = (yyjson_val_uni *)0x0;
            pyVar93 = pyVar99;
            pyVar118 = pyVar99;
            if (bVar91 != 0x2e) goto LAB_0124f919;
            goto LAB_01251a0f;
          }
        }
      }
      else {
        pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 2);
        if ((digi_table[bVar91] & 0x30) != 0) {
          pcVar100 = (char *)0x0;
          local_528 = (yyjson_val_uni *)0x0;
          pyVar93 = pyVar99;
          pyVar118 = pyVar99;
          if (bVar91 != 0x2e) goto LAB_0124f919;
          goto LAB_012519f1;
        }
      }
      pyVar102->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
      uVar95 = -uVar107;
      if (cVar4 != '-') {
        uVar95 = uVar107;
      }
      pyVar102[1].u64 = uVar95;
      local_560 = pyVar99;
      local_540 = pyVar103;
      goto LAB_0125c529;
    }
    if (bVar91 != 0x30) {
      local_540 = pyVar103;
      if ((flg & 0x10) == 0) goto LAB_01254dc7;
      if ((((bVar91 | 0x20) == 0x69) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x6e)) &&
         ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x66)) {
        uVar84 = (long)pyVar81 - (ulong)(cVar4 == '-');
        pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 3);
        if ((((*(byte *)((long)pyVar81 + 3) | 0x20) == 0x69) &&
            ((*(byte *)((long)pyVar81 + 4) | 0x20) == 0x6e)) &&
           (((*(byte *)((long)pyVar81 + 5) | 0x20) == 0x69 &&
            (((*(byte *)((long)pyVar81 + 6) | 0x20) == 0x74 &&
             ((*(byte *)((long)pyVar81 + 7) | 0x20) == 0x79)))))) {
          pyVar109 = pyVar81 + 1;
        }
        if ((flg & 0xa0) == 0) {
          pyVar102->u64 = 0x14;
          uVar84 = ((ulong)(cVar4 != '-') << 0x3f) + 0xfff0000000000000;
        }
        else {
          if (*local_530 != (u8 *)0x0) {
            **local_530 = '\0';
          }
          *local_530 = (u8 *)pyVar109;
          pyVar102->str = (char *)(((long)pyVar109 - uVar84) * 0x100 + 1);
        }
        pyVar102[1].u64 = uVar84;
        bVar76 = true;
        pyVar81 = pyVar109;
      }
      else {
        bVar76 = false;
      }
      bVar58 = true;
      if (!bVar76) {
        if ((((*(byte *)pyVar81 | 0x20) == 0x6e) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x61))
           && ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x6e)) {
          if ((flg & 0xa0) == 0) {
            pyVar102->u64 = 0x14;
            pcVar100 = (char *)(((ulong)(cVar4 != '-') << 0x3f) + -0x8000000000000);
          }
          else {
            pcVar100 = (char *)((long)pyVar81 - (ulong)(cVar4 == '-'));
            if (*local_530 != (u8 *)0x0) {
              **local_530 = '\0';
            }
            *local_530 = (u8 *)((long)pyVar81 + 3);
            pyVar102->str = (char *)((ulong)(cVar4 == '-') * 0x100 + 0x301);
          }
          pyVar102[1].str = pcVar100;
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
        }
        else {
          bVar58 = false;
        }
      }
      local_560 = pyVar81;
      if (bVar58) goto LAB_0125c529;
      goto LAB_01254dc7;
    }
    pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
    if ((digi_table[*(byte *)((long)pyVar81 + 1)] & 0x33) == 0) {
      pyVar102->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
      pyVar102[1].u64 = 0;
      local_560 = pyVar99;
      local_540 = pyVar103;
      goto LAB_0125c529;
    }
    if (*(byte *)((long)pyVar81 + 1) != 0x2e) goto LAB_01251e5a;
    local_540 = pyVar103;
    if ((digi_table[*(byte *)((long)pyVar81 + 2)] & 3) == 0) goto LAB_0125514f;
    pyVar99 = (yyjson_val_uni *)((long)local_560 + uVar107 + 1);
    do {
      pyVar109 = pyVar99;
      uVar107 = (ulong)*(byte *)((long)pyVar109 + 1);
      pyVar99 = (yyjson_val_uni *)((long)pyVar109 + 1);
    } while (uVar107 == 0x30);
    if ((digi_table[uVar107] & 3) == 0) goto LAB_01251e5a;
    uVar107 = uVar107 - 0x30;
LAB_012519d3:
    pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 1);
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 2) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 2);
    pyVar93 = pyVar99;
    if (9 < uVar95) {
LAB_01251c0c:
      pyVar99 = pyVar81;
      if ((yyjson_val_uni *)((long)pyVar93 + 1) == pyVar99) {
        local_510 = "no digit after decimal point";
        local_560 = pyVar99;
        local_540 = pyVar103;
        goto LAB_01255171;
      }
      pcVar100 = (char *)((long)pyVar93 + (1 - (long)pyVar99));
      local_528 = (yyjson_val_uni *)0x0;
      pyVar118 = pyVar99;
      if ((digi_table[*(byte *)pyVar99] & 0x20) == 0) {
        local_528 = (yyjson_val_uni *)0x0;
        if ((long)pcVar100 < -0x157) {
          pyVar102->u64 = 0x14;
          pyVar102[1].u64 = (ulong)(cVar4 == '-') << 0x3f;
          local_560 = pyVar99;
          local_540 = pyVar103;
          goto LAB_0125c529;
        }
LAB_0124f9b7:
        local_4d4 = (uint)pcVar100;
        if ((uVar107 >> 0x35 != 0) || (0x2c < local_4d4 + 0x16)) {
          local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,cVar4);
          local_4f0 = pyVar118;
          if ((local_4d4 + 0x132 < 0x252) && (local_528 == (yyjson_val_uni *)0x0)) {
            uVar95 = 0x3f;
            if (uVar107 != 0) {
              for (; uVar107 >> uVar95 == 0; uVar95 = uVar95 - 1) {
              }
            }
            uVar116 = uVar107 << ((byte)(uVar95 ^ 0x3f) & 0x3f);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar116;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8);
            auVar10 = auVar10 * auVar30;
            lVar96 = auVar10._8_8_;
            uVar82 = auVar10._0_8_;
            bVar76 = true;
            if (0x1fd < (ulong)(auVar10._8_4_ & 0x1ff) - 1) {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar116;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8);
              lVar97 = SUB168(auVar11 * auVar31,8);
              bVar76 = false;
              if ((lVar97 + uVar82) - 1 < 0xfffffffffffffffe) {
                lVar96 = lVar96 + (ulong)(lVar97 + uVar82 < uVar82);
                bVar76 = true;
              }
            }
            if (bVar76) {
              uVar107 = lVar96 << (-1 < lVar96);
              uVar107 = (uVar107 & 0x400) + uVar107;
              pyVar102->u64 = 0x14;
              uVar95 = (ulong)(cVar4 == '-') << 0x3f |
                       uVar107 >> 0xb & 0xfffffffffffff |
                       (ulong)(((((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) -
                                (int)(uVar95 ^ 0x3f)) - (uint)(-1 < lVar96)) + 0x47e +
                              (uint)(uVar107 < 0x400)) << 0x34;
LAB_0124fb19:
              pyVar102[1].u64 = uVar95;
              local_560 = pyVar99;
              local_540 = pyVar103;
              goto LAB_0125c529;
            }
          }
          local_4a0 = local_560;
          uVar95 = 0x3f;
          if (uVar107 != 0) {
            for (; uVar107 >> uVar95 == 0; uVar95 = uVar95 - 1) {
            }
          }
          bVar91 = (byte)(uVar95 ^ 0x3f);
          lVar96 = ((ulong)(local_528 != (yyjson_val_uni *)0x0) << 2) << (bVar91 & 0x3f);
          auVar12._8_8_ = 0;
          auVar12._0_8_ =
               *(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8) -
               (*(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8) >> 0x3f);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar107 << (bVar91 & 0x3f);
          uVar116 = SUB168(auVar12 * auVar32,8) - (SUB168(auVar12 * auVar32,0) >> 0x3f);
          uVar82 = 0x3f;
          if (uVar116 != 0) {
            for (; uVar116 >> uVar82 == 0; uVar82 = uVar82 - 1) {
            }
          }
          bVar91 = (byte)(uVar82 ^ 0x3f);
          uVar116 = uVar116 << (bVar91 & 0x3f);
          uVar117 = (9 - (ulong)(lVar96 == 0)) + lVar96 << (bVar91 & 0x3f);
          iVar114 = (((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) -
                    ((int)(uVar95 ^ 0x3f) + (int)(uVar82 ^ 0x3f))) + 0x40;
          iVar115 = 0xb;
          if (iVar114 < -0x43d) {
            iVar115 = 0x40;
            if (-0x472 < iVar114) {
              iVar115 = -0x432 - iVar114;
            }
          }
          if (0x3c < iVar115) {
            bVar91 = (char)iVar115 - 0x3c;
            uVar116 = uVar116 >> (bVar91 & 0x3f);
            iVar114 = iVar114 + iVar115 + -0x3c;
            uVar117 = (uVar117 >> (bVar91 & 0x3f)) + 9;
            iVar115 = 0x3c;
          }
          bVar91 = (byte)iVar115;
          lVar96 = 8L << (bVar91 - 1 & 0x3f);
          uVar82 = (~(-1L << (bVar91 & 0x3f)) & uVar116) * 8;
          uVar95 = lVar96 + uVar117;
          pyVar79 = (yyjson_val_uni *)0x0;
          uVar116 = (ulong)(uVar95 <= uVar82) + (uVar116 >> (bVar91 & 0x3f));
          if (uVar116 != 0) {
            uVar9 = 0x3f;
            if (uVar116 != 0) {
              for (; uVar116 >> uVar9 == 0; uVar9 = uVar9 - 1) {
              }
            }
            iVar115 = (iVar114 + iVar115) - (int)(uVar9 ^ 0x3f);
            pyVar79 = (yyjson_val_uni *)0x7ff0000000000000;
            if (iVar115 < 0x3c1) {
              uVar116 = (uVar116 << ((byte)(uVar9 ^ 0x3f) & 0x3f)) >> 0xb;
              if (iVar115 < -0x43d) {
                pyVar79 = (yyjson_val_uni *)0x0;
                if (-0x472 < iVar115) {
                  pyVar79 = (yyjson_val_uni *)(uVar116 >> (-(char)iVar115 - 0x3dU & 0x3f));
                }
              }
              else {
                pyVar79 = (yyjson_val_uni *)
                          (uVar116 & 0xfffffffffffff | (ulong)(iVar115 + 0x43e) << 0x34);
              }
            }
          }
          uVar84 = 0x7ff0000000000000;
          if (pyVar79 == (yyjson_val_uni *)0x7ff0000000000000) {
            if (cVar88 < '\0') {
              if (*local_530 != (u8 *)0x0) {
                **local_530 = '\0';
              }
              pyVar102->str = (char *)(((long)pyVar99 - (long)local_560) * 0x100 + 1);
              pyVar102[1].str = (char *)local_560;
              *local_530 = (u8 *)pyVar99;
              local_540 = pyVar103;
            }
            else {
              local_540 = pyVar103;
              if ((flg & 0x10) == 0) {
LAB_01250bb4:
                local_510 = "number is infinity when parsed as double";
                bVar76 = false;
                pyVar103 = local_540;
                pyVar102 = local_550;
                pyVar112 = local_558;
                ppuVar113 = local_530;
                local_560 = local_4a0;
                goto LAB_0124fcf3;
              }
              if (cVar4 == '-') {
                uVar84 = 0xfff0000000000000;
              }
              pyVar102->u64 = 0x14;
              pyVar102[1].u64 = uVar84;
            }
LAB_012517fe:
            bVar76 = true;
            pyVar103 = local_540;
            pyVar102 = local_550;
            pyVar112 = local_558;
            ppuVar113 = local_530;
            local_560 = pyVar99;
          }
          else {
            if ((lVar96 - uVar117 < uVar82) && (uVar82 < uVar95)) {
              uVar105 = 0xfffffbcd;
              if ((yyjson_val_uni *)0xfffffffffffff < pyVar79) {
                uVar105 = (uint)((ulong)pyVar79 >> 0x34) - 0x434;
              }
              pyVar102 = (yyjson_val_uni *)(((ulong)pyVar79 & 0xfffffffffffff) + 0x10000000000000);
              if ((yyjson_val_uni *)0xfffffffffffff >= pyVar79) {
                pyVar102 = pyVar79;
              }
              pbVar101 = &local_460;
              local_540 = pyVar103;
              local_508 = pyVar80;
              local_4a8 = pyVar79;
              bigint_set_buf(pbVar101,uVar107,(i32 *)&local_4d4,(u8 *)&local_528->u64,
                             (u8 *)&pyVar118->u64,(u8 *)&pyVar93->u64);
              local_528 = (yyjson_val_uni *)local_258.bits;
              local_258.used = 1;
              local_258.bits[0] = (long)pyVar102 * 2 + 1;
              if ((int)local_4d4 < 0) {
                iVar114 = -local_4d4;
                local_258.used = 1;
                iVar115 = iVar114;
                if ((int)local_4d4 < -0x12) {
                  do {
                    uVar107 = (ulong)local_258.used;
                    uVar95 = 0;
                    if (local_258.used != 0) {
                      uVar95 = 0;
                      do {
                        if (local_258.bits[uVar95] != 0) goto LAB_01250d82;
                        uVar95 = uVar95 + 1;
                      } while (local_258.used != (uint)uVar95);
                      uVar95 = (ulong)local_258.used;
                    }
LAB_01250d82:
                    if ((uint)uVar95 < local_258.used) {
                      uVar95 = uVar95 & 0xffffffff;
                      uVar98 = 0;
                      do {
                        auVar60._8_8_ = 0;
                        auVar60._0_8_ = uVar98;
                        auVar34._8_8_ = 0;
                        auVar34._0_8_ = local_258.bits[uVar95];
                        auVar60 = ZEXT816(10000000000000000000) * auVar34 + auVar60;
                        uVar98 = auVar60._8_8_;
                        local_258.bits[uVar95] = auVar60._0_8_;
                        uVar95 = uVar95 + 1;
                      } while (uVar107 != uVar95);
                    }
                    else {
                      uVar98 = 0;
                    }
                    if (uVar98 != 0) {
                      local_258.used = local_258.used + 1;
                      local_258.bits[uVar107] = uVar98;
                    }
                    iVar115 = iVar114 + -0x13;
                    bVar76 = 0x25 < iVar114;
                    iVar114 = iVar115;
                  } while (bVar76);
                }
                if (iVar115 != 0) {
                  uVar95 = *(ulong *)(u64_pow10_table + (long)iVar115 * 8);
                  uVar82 = (ulong)local_258.used;
                  uVar107 = 0;
                  if (uVar82 != 0) {
                    uVar107 = 0;
                    do {
                      if (local_258.bits[uVar107] != 0) goto LAB_01251589;
                      uVar107 = uVar107 + 1;
                    } while (local_258.used != (uint)uVar107);
                    uVar107 = (ulong)local_258.used;
                  }
LAB_01251589:
                  uVar98 = 0;
                  if ((uint)uVar107 < local_258.used) {
                    uVar107 = uVar107 & 0xffffffff;
                    uVar98 = 0;
                    do {
                      auVar62._8_8_ = 0;
                      auVar62._0_8_ = uVar98;
                      auVar14._8_8_ = 0;
                      auVar14._0_8_ = uVar95;
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ = local_258.bits[uVar107];
                      auVar62 = auVar14 * auVar36 + auVar62;
                      uVar98 = auVar62._8_8_;
                      local_258.bits[uVar107] = auVar62._0_8_;
                      uVar107 = uVar107 + 1;
                    } while (uVar82 != uVar107);
                  }
                  if (uVar98 != 0) {
                    pbVar101 = &local_258;
                    local_258.used = local_258.used + 1;
                    goto LAB_012515ce;
                  }
                }
              }
              else {
                uVar77 = local_4d4;
                uVar106 = local_4d4;
                if (0x12 < (int)local_4d4) {
                  do {
                    uVar107 = (ulong)local_460.used;
                    uVar95 = 0;
                    if (local_460.used != 0) {
                      uVar95 = 0;
                      do {
                        if (local_460.bits[uVar95] != 0) goto LAB_01250c9b;
                        uVar95 = uVar95 + 1;
                      } while (local_460.used != (uint)uVar95);
                      uVar95 = (ulong)local_460.used;
                    }
LAB_01250c9b:
                    if ((uint)uVar95 < local_460.used) {
                      uVar95 = uVar95 & 0xffffffff;
                      uVar98 = 0;
                      do {
                        auVar59._8_8_ = 0;
                        auVar59._0_8_ = uVar98;
                        auVar33._8_8_ = 0;
                        auVar33._0_8_ = local_460.bits[uVar95];
                        auVar59 = ZEXT816(10000000000000000000) * auVar33 + auVar59;
                        uVar98 = auVar59._8_8_;
                        local_460.bits[uVar95] = auVar59._0_8_;
                        uVar95 = uVar95 + 1;
                      } while (uVar107 != uVar95);
                    }
                    else {
                      uVar98 = 0;
                    }
                    if (uVar98 != 0) {
                      local_460.used = local_460.used + 1;
                      local_460.bits[uVar107] = uVar98;
                    }
                    uVar77 = uVar106 - 0x13;
                    bVar76 = 0x25 < (int)uVar106;
                    uVar106 = uVar77;
                  } while (bVar76);
                }
                if (uVar77 != 0) {
                  uVar95 = *(ulong *)(u64_pow10_table + (long)(int)uVar77 * 8);
                  uVar82 = (ulong)local_460.used;
                  uVar107 = 0;
                  if (uVar82 != 0) {
                    uVar107 = 0;
                    do {
                      if (local_460.bits[uVar107] != 0) goto LAB_01250e4b;
                      uVar107 = uVar107 + 1;
                    } while (local_460.used != (uint)uVar107);
                    uVar107 = (ulong)local_460.used;
                  }
LAB_01250e4b:
                  uVar98 = 0;
                  if ((uint)uVar107 < local_460.used) {
                    uVar107 = uVar107 & 0xffffffff;
                    uVar98 = 0;
                    do {
                      auVar61._8_8_ = 0;
                      auVar61._0_8_ = uVar98;
                      auVar13._8_8_ = 0;
                      auVar13._0_8_ = uVar95;
                      auVar35._8_8_ = 0;
                      auVar35._0_8_ = local_460.bits[uVar107];
                      auVar61 = auVar13 * auVar35 + auVar61;
                      uVar98 = auVar61._8_8_;
                      local_460.bits[uVar107] = auVar61._0_8_;
                      uVar107 = uVar107 + 1;
                    } while (uVar82 != uVar107);
                  }
                  if (uVar98 != 0) {
                    local_460.used = local_460.used + 1;
LAB_012515ce:
                    pbVar101->bits[uVar82] = uVar98;
                  }
                }
              }
              if ((int)uVar105 < 1) {
                uVar105 = -uVar105;
                uVar77 = uVar105 >> 6;
                uVar95 = (ulong)local_460.used;
                if ((uVar105 & 0x3f) != 0) {
                  local_528 = (yyjson_val_uni *)local_460.bits;
                  local_460.bits[uVar95] = 0;
                  sVar89 = (sbyte)(uVar105 & 0x3f);
                  if (uVar95 != 0) {
                    do {
                      local_460.bits[(uVar105 >> 6) + (int)uVar95] =
                           local_460.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                           local_460.bits[uVar95] << sVar89;
                      uVar95 = uVar95 - 1;
                    } while (uVar95 != 0);
                  }
                  local_460.bits[uVar77] = local_460.bits[0] << sVar89;
                  local_460.used =
                       (local_460.used + uVar77 + 1) -
                       (uint)(local_460.bits[local_460.used + uVar77] == 0);
                  goto LAB_0125172d;
                }
                if (uVar95 != 0) {
                  do {
                    local_460.bits[((uVar105 >> 6) - 1) + (int)uVar95] = local_460.bits[uVar95 - 1];
                    uVar95 = uVar95 - 1;
                  } while (uVar95 != 0);
                }
                local_460.used = local_460.used + uVar77;
                if (0x3f < uVar105) {
                  local_528 = (yyjson_val_uni *)local_460.bits;
                  goto LAB_01251732;
                }
              }
              else {
                uVar77 = uVar105 >> 6;
                uVar95 = (ulong)local_258.used;
                if ((uVar105 & 0x3f) == 0) {
                  yyjson_read_opts();
                }
                else {
                  local_258.bits[uVar95] = 0;
                  sVar89 = (sbyte)(uVar105 & 0x3f);
                  if (uVar95 != 0) {
                    do {
                      local_258.bits[(uVar105 >> 6) + (int)uVar95] =
                           local_258.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                           local_258.bits[uVar95] << sVar89;
                      uVar95 = uVar95 - 1;
                    } while (uVar95 != 0);
                  }
                  local_258.bits[uVar77] = local_258.bits[0] << sVar89;
                  local_258.used =
                       (local_258.used + uVar77 + 1) -
                       (uint)(local_258.bits[local_258.used + uVar77] == 0);
LAB_0125172d:
                  if (uVar105 < 0x40) goto LAB_01251749;
                }
LAB_01251732:
                switchD_00570541::default(local_528,0,(ulong)(uVar77 - 1) * 8 + 8);
              }
LAB_01251749:
              uVar95 = (ulong)local_460.used;
              iVar115 = -1;
              if (local_258.used <= local_460.used) {
                iVar114 = 1;
                iVar115 = 1;
                if (local_460.used <= local_258.used) {
                  do {
                    if (uVar95 == 0) {
                      iVar115 = 0;
                      break;
                    }
                    uVar107 = local_460.bits[uVar95 - 1];
                    uVar82 = local_258.bits[uVar95 - 1];
                    iVar115 = iVar114;
                    if (uVar107 >= uVar82 && uVar107 != uVar82) {
                      iVar115 = 1;
                    }
                    if (uVar107 < uVar82) {
                      iVar115 = -1;
                    }
                    uVar95 = uVar95 - 1;
                    iVar114 = iVar115;
                  } while (uVar107 == uVar82);
                }
              }
              if (iVar115 == 0) {
                uVar95 = (ulong)((uint)local_4a8 & 1);
              }
              else {
                uVar95 = (ulong)(0 < iVar115);
              }
              pyVar80 = local_508;
              if (uVar95 + (long)local_4a8 == 0x7ff0000000000000) {
                if (cVar88 < '\0') {
                  if (*local_530 != (u8 *)0x0) {
                    **local_530 = '\0';
                  }
                  local_550->str = (char *)(((long)pyVar99 - (long)local_4a0) * 0x100 + 1);
                  local_550[1].str = (char *)local_4a0;
                  *local_530 = (u8 *)pyVar99;
                }
                else {
                  if ((flg & 0x10) == 0) goto LAB_01250bb4;
                  uVar84 = 0x7ff0000000000000;
                  if ((char)local_520 == '-') {
                    uVar84 = 0xfff0000000000000;
                  }
                  local_550->u64 = 0x14;
                  local_550[1].u64 = uVar84;
                }
              }
              else {
                local_550->u64 = 0x14;
                local_550[1].u64 =
                     uVar95 + (long)local_4a8 | (ulong)((char)local_520 == '-') << 0x3f;
              }
              goto LAB_012517fe;
            }
            pyVar102->u64 = 0x14;
            pyVar102[1].u64 = (ulong)pyVar79 | (ulong)(cVar4 == '-') << 0x3f;
            bVar76 = true;
            local_560 = pyVar99;
            local_540 = pyVar103;
          }
LAB_0124fcf3:
          pyVar79 = local_538;
          pyVar110 = local_548;
          if (bVar76 == false) goto LAB_01255171;
          goto LAB_0125c529;
        }
        if ((int)local_4d4 < 0) {
          dVar119 = (double)(long)uVar107 / *(double *)(f64_pow10_table + (ulong)-local_4d4 * 8);
        }
        else {
          dVar119 = (double)(long)uVar107 *
                    *(double *)(f64_pow10_table + (ulong)(local_4d4 & 0x7fffffff) * 8);
        }
        pyVar102->u64 = 0x14;
        dVar128 = -dVar119;
        if (cVar4 != '-') {
          dVar128 = dVar119;
        }
        pyVar102[1].u64 = (uint64_t)dVar128;
        local_560 = pyVar99;
        local_540 = pyVar103;
        goto LAB_0125c529;
      }
LAB_0124f919:
      bVar91 = *(byte *)((long)pyVar99 + 1);
      uVar95 = (ulong)((digi_table[bVar91] & 0xc) != 0);
      if ((digi_table[*(byte *)((long)pyVar99 + uVar95 + 1)] & 3) == 0) {
        local_510 = "no digit after exponent sign";
        local_560 = (yyjson_val_uni *)((long)pyVar99 + uVar95 + 1);
        local_540 = pyVar103;
        goto LAB_01255171;
      }
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + uVar95);
      pyVar109 = pyVar99;
      do {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
        pcVar3 = (char *)((long)pyVar99 + 1);
        pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
      } while (*pcVar3 == '0');
      uVar95 = (ulong)*(byte *)pyVar99;
      lVar96 = 0;
      if ((digi_table[uVar95] & 3) != 0) {
        lVar96 = 0;
        do {
          lVar96 = (ulong)(byte)((char)uVar95 - 0x30) + lVar96 * 10;
          uVar95 = (ulong)*(byte *)((long)pyVar99 + 1);
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
        } while ((digi_table[uVar95] & 3) != 0);
      }
      if ((long)pyVar99 - (long)pyVar109 < 0x13) {
        lVar97 = -lVar96;
        if (bVar91 != 0x2d) {
          lVar97 = lVar96;
        }
        pcVar100 = pcVar100 + lVar97;
LAB_0124f998:
        if ((long)pcVar100 < -0x157) {
          pyVar102->u64 = 0x14;
          pyVar102[1].u64 = (ulong)(cVar4 == '-') << 0x3f;
          local_560 = pyVar99;
          local_540 = pyVar103;
          goto LAB_0125c529;
        }
        if ((long)pcVar100 < 0x135) goto LAB_0124f9b7;
      }
      else if (bVar91 == 0x2d) {
        pyVar102->u64 = 0x14;
        uVar95 = (ulong)(cVar4 == '-') << 0x3f;
        goto LAB_0124fb19;
      }
      if (cVar88 < '\0') {
        if (*local_530 != (u8 *)0x0) {
          **local_530 = '\0';
        }
        pyVar102->str = (char *)(((long)pyVar99 - (long)local_560) * 0x100 + 1);
        pyVar102[1].str = (char *)local_560;
        *local_530 = (u8 *)pyVar99;
        local_560 = pyVar99;
        local_540 = pyVar103;
      }
      else {
        local_540 = pyVar103;
        if ((flg & 0x10) == 0) goto LAB_01254589;
        pyVar102->u64 = 0x14;
        pyVar102[1].str = (char *)(((ulong)(cVar4 != '-') << 0x3f) + -0x10000000000000);
        local_560 = pyVar99;
      }
      goto LAB_0125c529;
    }
    uVar107 = uVar95 + uVar107 * 10;
LAB_012519f1:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 3) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 3);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251a0f:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 4) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 4);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251a2d:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 5) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 5);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251a4b:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 6) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 6);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251a69:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 7) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 7);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251a87:
    pyVar81 = pyVar109 + 1;
    pyVar93 = pyVar99;
    if (9 < (ulong)*(byte *)(pyVar109 + 1) - 0x30) goto LAB_01251c0c;
    uVar107 = ((ulong)*(byte *)(pyVar109 + 1) - 0x30) + uVar107 * 10;
LAB_01251aa5:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 9) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 9);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251ac3:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 10) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 10);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251ae1:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0xb) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251aff:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0xc) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251b1d:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0xd) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251b3b:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0xe) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251b59:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0xf) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251b77:
    pyVar81 = pyVar109 + 2;
    pyVar93 = pyVar99;
    if (9 < (ulong)*(byte *)(pyVar109 + 2) - 0x30) goto LAB_01251c0c;
    uVar107 = ((ulong)*(byte *)(pyVar109 + 2) - 0x30) + uVar107 * 10;
LAB_01251b95:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0x11) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0x11);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251bb3:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0x12) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0x12);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
LAB_01251bd1:
    uVar95 = (ulong)*(byte *)((long)pyVar109 + 0x13) - 0x30;
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0x13);
    pyVar93 = pyVar99;
    if (9 < uVar95) goto LAB_01251c0c;
    uVar107 = uVar95 + uVar107 * 10;
    pyVar92 = (yyjson_val_uni *)((long)pyVar109 + 0x14);
    pyVar81 = (yyjson_val_uni *)((long)pyVar109 + 0x14);
    if ((digi_table[*(byte *)((long)pyVar109 + 0x14)] & 3) == 0) goto LAB_01251c0c;
LAB_0124f80d:
    pcVar100 = (char *)((long)pyVar92 * 0x100 + (long)local_560 * -0x100 + 1);
    pyVar81 = (yyjson_val_uni *)((long)pyVar92 + 1);
    do {
      pyVar99 = pyVar81;
      pyVar81 = (yyjson_val_uni *)((long)pyVar99 + 1);
      pcVar100 = pcVar100 + 0x100;
    } while ((digi_table[*(byte *)pyVar99] & 3) != 0);
    uVar107 = uVar107 + (0x34 < *(byte *)pyVar92);
    if (pyVar93 != (yyjson_val_uni *)0x0) {
LAB_0124f8d1:
      pyVar109 = pyVar99;
      do {
        do {
          pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -1);
        } while (*(char *)pyVar109 == '0');
      } while (*(char *)pyVar109 == '.');
      pcVar100 = (char *)((long)pyVar93 + ((ulong)(pyVar93 < pyVar92) - (long)pyVar92));
      local_528 = pyVar92;
      pyVar118 = pyVar99;
      if (pyVar109 < pyVar92) {
        local_528 = (yyjson_val_uni *)0x0;
        pyVar118 = (yyjson_val_uni *)0x0;
      }
      if ((digi_table[*(byte *)pyVar99] & 0x20) != 0) goto LAB_0124f919;
      goto LAB_0124f998;
    }
    if ((-1 < cVar88) || ((digi_table[*(byte *)pyVar99] & 0x30) != 0)) {
      pyVar93 = pyVar99;
      if (*(byte *)pyVar99 != 0x2e) goto LAB_0124f8d1;
      local_540 = pyVar103;
      if ((digi_table[*(byte *)pyVar81] & 3) != 0) {
        do {
          pbVar2 = (byte *)((long)pyVar99 + 1);
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
        } while ((digi_table[*pbVar2] & 3) != 0);
        goto LAB_0124f8d1;
      }
      goto LAB_012533c8;
    }
    if (*local_530 != (u8 *)0x0) {
      **local_530 = '\0';
    }
    pyVar102->str = pcVar100;
    local_540 = pyVar103;
LAB_01250dee:
    pyVar102[1].str = (char *)local_560;
    *local_530 = (u8 *)pyVar99;
    local_560 = pyVar99;
    goto LAB_0125c529;
  }
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
LAB_0125c5d2:
  uVar84 = pyVar110[1].u64;
  pyVar110[1].str = (char *)((long)pyVar102 + (0x10 - (long)pyVar110));
  pyVar110->u64 = (long)pyVar103 << 8 | 6;
  goto LAB_0125c5ef;
LAB_0124ef54:
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  pyVar110->str = (char *)((ulong)*(byte *)pyVar110 + (long)local_540 * 0x100 + 0x100);
  pyVar102 = pyVar102 + 2;
  if (pyVar112 <= pyVar102) {
    pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
    sVar104 = (long)pyVar103 * 0x10;
    local_558 = pyVar112;
    local_548 = pyVar110;
    local_530 = ppuVar113;
    pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
    pyVar102 = (yyjson_val_uni *)(((long)pyVar102 - (long)pyVar80) + (long)pyVar83);
    pyVar110 = (yyjson_val_uni *)(((long)local_548 - (long)pyVar80) + (long)pyVar83);
    pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
    pyVar79 = pyVar103;
    ppuVar113 = local_530;
    pyVar80 = pyVar83;
    local_558 = pyVar112;
    local_548 = pyVar110;
  }
  pyVar102->u64 = 6;
  pyVar102[1].str = (char *)((long)pyVar102 - (long)pyVar110);
  pyVar103 = (yyjson_val_uni *)0x0;
  pyVar110 = pyVar102;
  goto LAB_0124ecb4;
LAB_0124efa3:
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  pyVar110->str = (char *)((ulong)*(byte *)pyVar110 + (long)local_540 * 0x100 + 0x100);
  pyVar102 = pyVar102 + 2;
  if (pyVar112 <= pyVar102) {
    pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
    sVar104 = (long)pyVar103 * 0x10;
    local_558 = pyVar112;
    local_548 = pyVar110;
    local_530 = ppuVar113;
    pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff0a;
    pyVar102 = (yyjson_val_uni *)(((long)pyVar102 - (long)pyVar80) + (long)pyVar83);
    pyVar110 = (yyjson_val_uni *)(((long)local_548 - (long)pyVar80) + (long)pyVar83);
    pyVar112 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
    pyVar79 = pyVar103;
    ppuVar113 = local_530;
    pyVar80 = pyVar83;
    local_558 = pyVar112;
    local_548 = pyVar110;
  }
  pyVar102->u64 = 7;
  pyVar102[1].str = (char *)((long)pyVar102 - (long)pyVar110);
  pyVar103 = (yyjson_val_uni *)0x0;
  pyVar110 = pyVar102;
  goto LAB_0125205c;
LAB_0124f352:
  pyVar109 = local_560;
  if ((char_table[*(byte *)pyVar109] & 0xc) == 0) {
    pyVar99 = pyVar109 + 1;
    do {
      pyVar109 = pyVar99;
      if ((char_table[*(byte *)((long)pyVar109 + -7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -7);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -6);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -5);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -4);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -3);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -2);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -1);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)pyVar109] & 0xc) != 0) goto LAB_0124f498;
      if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
        goto LAB_0124f498;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
        goto LAB_0124f498;
      }
      pyVar99 = pyVar109 + 2;
    } while ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) == 0);
    pyVar109 = pyVar109 + 1;
  }
LAB_0124f498:
  uVar95 = 0xd;
  pyVar99 = pyVar109;
  if (*(char *)pyVar109 == '\"') goto LAB_0124f679;
  local_558 = pyVar112;
  local_548 = pyVar110;
  local_540 = pyVar103;
  local_530 = ppuVar113;
  local_508 = pyVar80;
  if (*(char *)pyVar109 < '\0') {
    uVar105 = *(uint *)pyVar109;
    local_560 = pyVar109;
    while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
           ((uVar105 & 0x200f) != 0x200d))) {
      puVar1 = (uint *)((long)local_560 + 3);
      local_560 = (yyjson_val_uni *)((long)local_560 + 3);
      uVar105 = *puVar1;
    }
    if ((char)uVar105 < '\0') {
      if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
        do {
          uVar105 = *(uint *)((long)local_560 + 2);
          local_560 = (yyjson_val_uni *)((long)local_560 + 2);
          if ((uVar105 & 0xc0e0) != 0x80c0) break;
        } while ((uVar105 & 0x1e) != 0);
      }
      if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
        while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
          uVar105 = *(uint *)((long)local_560 + 4);
          local_560 = (yyjson_val_uni *)((long)local_560 + 4);
          if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
        }
      }
      if (pyVar109 == local_560) {
        if ((flg & 0x40) == 0) goto LAB_0125bac0;
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      }
    }
    goto LAB_0124f352;
  }
LAB_01250f10:
  cVar4 = *(char *)pyVar109;
  if (cVar4 == '\\') {
    bVar91 = *(byte *)((long)pyVar109 + 1);
    if (bVar91 < 0x62) {
      if (bVar91 == 0x22) {
        *(char *)pyVar99 = '\"';
      }
      else if (bVar91 == 0x2f) {
        *(char *)pyVar99 = '/';
      }
      else {
        if (bVar91 != 0x5c) goto switchD_01250f58_caseD_6f;
        *(char *)pyVar99 = '\\';
      }
    }
    else {
      switch(bVar91) {
      case 0x6e:
        *(char *)pyVar99 = '\n';
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_01250f58_caseD_6f;
      case 0x72:
        *(char *)pyVar99 = '\r';
        break;
      case 0x74:
        *(char *)pyVar99 = '\t';
        break;
      case 0x75:
        uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 3)],
                          hex_conv_table[*(byte *)((long)pyVar109 + 5)]);
        if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                hex_conv_table[*(byte *)((long)pyVar109 + 4)])) & 0xf0f0) != 0)
        goto LAB_0125b745;
        uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                 hex_conv_table[*(byte *)((long)pyVar109 + 4)]) << 4;
        uVar77 = uVar75 | uVar105;
        local_560 = (yyjson_val_uni *)((long)pyVar109 + 6);
        if ((uVar77 & 0xf800) == 0xd800) {
          if ((uVar77 & 0xdc00) == 0xd800) {
            if (*(short *)local_560 == 0x755c) {
              if (((CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                             hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]) |
                   CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                            hex_conv_table[*(byte *)((long)pyVar109 + 10)])) & 0xf0f0) == 0) {
                uVar105 = (CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                                    hex_conv_table[*(byte *)((long)pyVar109 + 10)]) & 0xfff) << 4 |
                          (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                                         hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]);
                if ((uVar105 & 0xfc00) == 0xdc00) {
                  iVar115 = (uVar77 & 0xdbff) * 0x400;
                  uVar77 = iVar115 + uVar105 + 0xfca02400;
                  *(byte *)pyVar99 = (byte)(uVar77 >> 0x12) | 0xf0;
                  *(byte *)((long)pyVar99 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)pyVar99 + 2) =
                       (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)pyVar99 + 3) = (byte)uVar105 & 0x3f | 0x80;
                  pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 4);
                  local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
                  goto LAB_0125104d;
                }
                goto LAB_0125bfb1;
              }
              goto LAB_0125bfa5;
            }
            goto LAB_0125bf99;
          }
          goto LAB_0125bf8d;
        }
        uVar105 = (uint)uVar75 | uVar105 & 0xffff;
        bVar91 = (byte)uVar77;
        if (uVar105 < 0x800) {
          if (uVar105 < 0x80) {
            *(byte *)pyVar99 = bVar91;
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
          }
          else {
            *(byte *)pyVar99 = (byte)(uVar77 >> 6) | 0xc0;
            *(byte *)((long)pyVar99 + 1) = bVar91 & 0x3f | 0x80;
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 2);
          }
        }
        else {
          *(byte *)pyVar99 = (byte)(uVar105 >> 0xc) | 0xe0;
          *(byte *)((long)pyVar99 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
          *(byte *)((long)pyVar99 + 2) = bVar91 & 0x3f | 0x80;
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 3);
        }
        goto LAB_0125104d;
      default:
        if (bVar91 == 0x62) {
          *(char *)pyVar99 = '\b';
        }
        else {
          if (bVar91 != 0x66) goto switchD_01250f58_caseD_6f;
          *(char *)pyVar99 = '\f';
        }
      }
    }
    pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
    local_560 = (yyjson_val_uni *)((long)pyVar109 + 2);
  }
  else {
    if (cVar4 == '\"') goto LAB_01251808;
    if ((flg & 0x40) == 0) goto LAB_0125bf81;
    if (local_4e0 <= pyVar109) goto LAB_0125bf75;
    *(char *)pyVar99 = cVar4;
    pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
    local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  }
LAB_0125104d:
  do {
    pyVar109 = local_560;
    if ((char_table[*(byte *)pyVar109] & 0xc) != 0) {
LAB_012512b0:
      while( true ) {
        if (-1 < *(char *)pyVar109) goto LAB_01250f10;
        uVar105 = *(uint *)pyVar109;
        local_560 = pyVar109;
        while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
               ((uVar105 & 0x200f) != 0x200d))) {
          *(uint *)pyVar99 = uVar105;
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 3);
          puVar1 = (uint *)((long)local_560 + 3);
          local_560 = (yyjson_val_uni *)((long)local_560 + 3);
          uVar105 = *puVar1;
        }
        if (-1 < (char)uVar105) break;
        if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)pyVar99 = (short)uVar105;
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 2);
            uVar105 = *(uint *)((long)local_560 + 2);
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            if ((uVar105 & 0xc0e0) != 0x80c0) break;
          } while ((uVar105 & 0x1e) != 0);
        }
        if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
            *(uint *)pyVar99 = uVar105;
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 4);
            uVar105 = *(uint *)((long)local_560 + 4);
            local_560 = (yyjson_val_uni *)((long)local_560 + 4);
            if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (pyVar109 != local_560) break;
        if ((flg & 0x40) == 0) goto LAB_0125b72f;
LAB_0125139e:
        *(undefined2 *)pyVar99 = *(undefined2 *)local_560;
        pyVar109 = (yyjson_val_uni *)((long)local_560 + 1);
        pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
      }
      goto LAB_0125104d;
    }
    local_560 = pyVar109;
    if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) goto LAB_0125139e;
    if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
      uVar6 = *(undefined2 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
      *(undefined2 *)pyVar99 = uVar6;
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 2);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
      *(undefined4 *)pyVar99 = uVar7;
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 3);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
      *(undefined4 *)pyVar99 = uVar7;
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 4);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
      *(undefined4 *)pyVar99 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar99 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 5);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
      *(undefined4 *)pyVar99 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar99 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 6);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
      *pyVar99 = yVar8;
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 7);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = pyVar109 + 1;
      *pyVar99 = yVar8;
      pyVar99 = pyVar99 + 1;
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 9)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined2 *)(pyVar99 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 9);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 9);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 10)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined2 *)(pyVar99 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 10);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 10);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xb)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined4 *)(pyVar99 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 0xb);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xc)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined4 *)(pyVar99 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 0xc);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xd)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined4 *)(pyVar99 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar99 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 0xd);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
      goto LAB_012512b0;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xe)] & 0xc) != 0) {
      *pyVar99 = *pyVar109;
      *(undefined4 *)(pyVar99 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar99 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 0xe);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
      goto LAB_012512b0;
    }
    bVar91 = char_table[*(byte *)((long)pyVar109 + 0xf)];
    yVar8 = pyVar109[1];
    *pyVar99 = *pyVar109;
    pyVar99[1] = yVar8;
    if ((bVar91 & 0xc) != 0) {
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
      pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 0xf);
      goto LAB_012512b0;
    }
    pyVar99 = pyVar99 + 2;
    local_560 = pyVar109 + 2;
  } while( true );
LAB_01251808:
  uVar95 = 5;
LAB_0124f679:
  pyVar102->u64 = ((long)pyVar99 - (long)pyVar81) * 0x100 | uVar95;
  pyVar102[1].str = (char *)pyVar81;
  *(char *)pyVar99 = '\0';
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  goto LAB_0125c529;
LAB_0124ed7d:
  do {
    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  } while ((char_table[*(byte *)local_560] & 1) != 0);
  goto LAB_0124ecc8;
LAB_0125514f:
  pyVar112 = (yyjson_val_uni *)((long)pyVar81 + 2);
LAB_01255153:
  local_510 = "no digit after decimal point";
  pyVar81 = pyVar112;
LAB_0125515a:
  local_4d4 = 0;
  local_560 = pyVar81;
  goto LAB_01255171;
LAB_01251e5a:
  local_540 = pyVar103;
  if ((digi_table[*(byte *)pyVar99] & 3) != 0) goto LAB_0125547f;
  if ((digi_table[*(byte *)pyVar99] & 0x20) != 0) {
    yyjson_read_opts();
    pyVar99 = (yyjson_val_uni *)CONCAT44(local_460._4_4_,local_460.used);
    if ((extraout_RAX & 1) == 0) goto LAB_01251e75;
    goto LAB_01255171;
  }
LAB_01251e75:
  local_550->u64 = 0x14;
  local_550[1].u64 = (ulong)(cVar4 == '-') << 0x3f;
  pyVar103 = local_540;
  pyVar102 = local_550;
  pyVar79 = local_538;
  pyVar110 = local_548;
  pyVar112 = local_558;
  ppuVar113 = local_530;
  local_560 = pyVar99;
  goto LAB_0125c529;
LAB_012520ef:
  do {
    local_560 = (yyjson_val_uni *)((long)local_560 + 1);
    local_558 = pyVar112;
    local_520 = pyVar103;
  } while ((char_table[*(byte *)local_560] & 1) != 0);
  goto LAB_01252061;
LAB_0125c7ae:
  pyVar112 = local_4e0;
  pyVar79 = local_4f8;
  pyVar102 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,6,flg)
  ;
  if (bVar76) {
    pyVar102 = pyVar112;
  }
  pcVar100 = "unexpected character";
  if (bVar76) {
    pcVar100 = "unexpected end of data";
  }
  sVar104 = (long)pyVar102 - (long)pyVar79;
  err = local_518;
  goto LAB_0125c803;
LAB_012558ad:
  pyVar109 = local_560;
  if ((char_table[*(byte *)pyVar109] & 0xc) == 0) {
    pyVar81 = pyVar109 + 1;
    do {
      pyVar109 = pyVar81;
      if ((char_table[*(byte *)((long)pyVar109 + -7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -7);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -6);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -5);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -4);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -3);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -2);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -1);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)pyVar109] & 0xc) != 0) goto LAB_012559f3;
      if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
        goto LAB_012559f3;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
        goto LAB_012559f3;
      }
      pyVar81 = pyVar109 + 2;
    } while ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) == 0);
    pyVar109 = pyVar109 + 1;
  }
LAB_012559f3:
  uVar95 = 0xd;
  pyVar81 = pyVar109;
  if (*(char *)pyVar109 == '\"') goto LAB_01255b8f;
  local_538 = pyVar110;
  local_558 = pyVar112;
  local_550 = pyVar102;
  if (*(char *)pyVar109 < '\0') {
    uVar105 = *(uint *)pyVar109;
    local_560 = pyVar109;
    while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
           ((uVar105 & 0x200f) != 0x200d))) {
      puVar1 = (uint *)((long)local_560 + 3);
      local_560 = (yyjson_val_uni *)((long)local_560 + 3);
      uVar105 = *puVar1;
    }
    local_508 = pyVar80;
    if ((char)uVar105 < '\0') {
      if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
        do {
          uVar105 = *(uint *)((long)local_560 + 2);
          local_560 = (yyjson_val_uni *)((long)local_560 + 2);
          if ((uVar105 & 0xc0e0) != 0x80c0) break;
        } while ((uVar105 & 0x1e) != 0);
      }
      if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
        while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
          uVar105 = *(uint *)((long)local_560 + 4);
          local_560 = (yyjson_val_uni *)((long)local_560 + 4);
          if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
        }
      }
      if (pyVar109 == local_560) {
        if ((flg & 0x40) == 0) goto LAB_0125bac0;
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      }
    }
    goto LAB_012558ad;
  }
LAB_01256d6b:
  cVar4 = *(char *)pyVar109;
  if (cVar4 != '\\') {
    if (cVar4 == '\"') goto LAB_01258077;
    local_508 = pyVar80;
    if ((flg & 0x40) == 0) goto LAB_0125bf81;
    if (local_4e0 <= pyVar109) goto LAB_0125bf75;
    *(char *)pyVar81 = cVar4;
    pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
    local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
    goto LAB_01256ea5;
  }
  bVar91 = *(byte *)((long)pyVar109 + 1);
  if (bVar91 < 0x62) {
    if (bVar91 == 0x22) {
      *(char *)pyVar81 = '\"';
    }
    else if (bVar91 == 0x2f) {
      *(char *)pyVar81 = '/';
    }
    else {
      local_508 = pyVar80;
      if (bVar91 != 0x5c) goto switchD_01250f58_caseD_6f;
      *(char *)pyVar81 = '\\';
    }
  }
  else {
    local_508 = pyVar80;
    switch(bVar91) {
    case 0x6e:
      *(char *)pyVar81 = '\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_01250f58_caseD_6f;
    case 0x72:
      *(char *)pyVar81 = '\r';
      break;
    case 0x74:
      *(char *)pyVar81 = '\t';
      break;
    case 0x75:
      uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 3)],
                        hex_conv_table[*(byte *)((long)pyVar109 + 5)]);
      if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                              hex_conv_table[*(byte *)((long)pyVar109 + 4)])) & 0xf0f0) != 0)
      goto LAB_0125b745;
      uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                               hex_conv_table[*(byte *)((long)pyVar109 + 4)]) << 4;
      uVar77 = uVar75 | uVar105;
      local_560 = (yyjson_val_uni *)((long)pyVar109 + 6);
      if ((uVar77 & 0xf800) != 0xd800) {
        uVar105 = (uint)uVar75 | uVar105 & 0xffff;
        bVar91 = (byte)uVar77;
        if (uVar105 < 0x800) {
          if (uVar105 < 0x80) {
            *(byte *)pyVar81 = bVar91;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
          }
          else {
            *(byte *)pyVar81 = (byte)(uVar77 >> 6) | 0xc0;
            *(byte *)((long)pyVar81 + 1) = bVar91 & 0x3f | 0x80;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
          }
        }
        else {
          *(byte *)pyVar81 = (byte)(uVar105 >> 0xc) | 0xe0;
          *(byte *)((long)pyVar81 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
          *(byte *)((long)pyVar81 + 2) = bVar91 & 0x3f | 0x80;
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
        }
        goto LAB_01256ea5;
      }
      if ((uVar77 & 0xdc00) == 0xd800) {
        if (*(short *)local_560 == 0x755c) {
          if (((CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                         hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]) |
               CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                        hex_conv_table[*(byte *)((long)pyVar109 + 10)])) & 0xf0f0) == 0) {
            uVar105 = (CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                                hex_conv_table[*(byte *)((long)pyVar109 + 10)]) & 0xfff) << 4 |
                      (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                                     hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]);
            if ((uVar105 & 0xfc00) == 0xdc00) {
              iVar115 = (uVar77 & 0xdbff) * 0x400;
              uVar77 = iVar115 + uVar105 + 0xfca02400;
              *(byte *)pyVar81 = (byte)(uVar77 >> 0x12) | 0xf0;
              *(byte *)((long)pyVar81 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
              *(byte *)((long)pyVar81 + 2) = (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
              *(byte *)((long)pyVar81 + 3) = (byte)uVar105 & 0x3f | 0x80;
              pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
              local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
              goto LAB_01256ea5;
            }
LAB_0125bfb1:
            local_510 = "invalid low surrogate in string";
          }
          else {
LAB_0125bfa5:
            local_510 = "invalid escaped sequence in string";
          }
        }
        else {
LAB_0125bf99:
          local_510 = "no low surrogate in string";
        }
      }
      else {
LAB_0125bf8d:
        local_510 = "invalid high surrogate in string";
        local_560 = pyVar109;
      }
      goto LAB_0125b656;
    default:
      if (bVar91 == 0x62) {
        *(char *)pyVar81 = '\b';
      }
      else {
        if (bVar91 != 0x66) goto switchD_01250f58_caseD_6f;
        *(char *)pyVar81 = '\f';
      }
    }
  }
  pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 2);
LAB_01256ea5:
  do {
    pyVar109 = local_560;
    if ((char_table[*(byte *)pyVar109] & 0xc) != 0) {
LAB_01257108:
      while( true ) {
        if (-1 < *(char *)pyVar109) goto LAB_01256d6b;
        uVar105 = *(uint *)pyVar109;
        local_560 = pyVar109;
        while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
               ((uVar105 & 0x200f) != 0x200d))) {
          *(uint *)pyVar81 = uVar105;
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
          puVar1 = (uint *)((long)local_560 + 3);
          local_560 = (yyjson_val_uni *)((long)local_560 + 3);
          uVar105 = *puVar1;
        }
        if (-1 < (char)uVar105) break;
        if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)pyVar81 = (short)uVar105;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
            uVar105 = *(uint *)((long)local_560 + 2);
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            if ((uVar105 & 0xc0e0) != 0x80c0) break;
          } while ((uVar105 & 0x1e) != 0);
        }
        if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
            *(uint *)pyVar81 = uVar105;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
            uVar105 = *(uint *)((long)local_560 + 4);
            local_560 = (yyjson_val_uni *)((long)local_560 + 4);
            if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (pyVar109 != local_560) break;
        local_508 = pyVar80;
        if ((flg & 0x40) == 0) goto LAB_0125b72f;
LAB_012571f6:
        *(undefined2 *)pyVar81 = *(undefined2 *)local_560;
        pyVar109 = (yyjson_val_uni *)((long)local_560 + 1);
        pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
      }
      goto LAB_01256ea5;
    }
    local_560 = pyVar109;
    if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) goto LAB_012571f6;
    if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
      uVar6 = *(undefined2 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
      *(undefined2 *)pyVar81 = uVar6;
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 2);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
      *(undefined4 *)pyVar81 = uVar7;
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
      *(undefined4 *)pyVar81 = uVar7;
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 4);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
      *(undefined4 *)pyVar81 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar81 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 5);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
      *(undefined4 *)pyVar81 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar81 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 6);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
      *pyVar81 = yVar8;
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 7);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = pyVar109 + 1;
      *pyVar81 = yVar8;
      pyVar81 = pyVar81 + 1;
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 9)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined2 *)(pyVar81 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 9);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 9);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 10)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined2 *)(pyVar81 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 10);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 10);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xb)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xc)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xd)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar81 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
      goto LAB_01257108;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xe)] & 0xc) != 0) {
      *pyVar81 = *pyVar109;
      *(undefined4 *)(pyVar81 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar81 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
      goto LAB_01257108;
    }
    bVar91 = char_table[*(byte *)((long)pyVar109 + 0xf)];
    yVar8 = pyVar109[1];
    *pyVar81 = *pyVar109;
    pyVar81[1] = yVar8;
    if ((bVar91 & 0xc) != 0) {
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
      pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
      goto LAB_01257108;
    }
    pyVar81 = pyVar81 + 2;
    local_560 = pyVar109 + 2;
  } while( true );
LAB_01258077:
  uVar95 = 5;
  local_508 = pyVar80;
LAB_01255b8f:
  pyVar112->u64 = ((long)pyVar81 - (long)pyVar79) * 0x100 | uVar95;
  pyVar112[1].str = (char *)pyVar79;
  *(char *)pyVar81 = '\0';
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  if (*(short *)((long)pyVar109 + 1) != 0x203a) {
    do {
      if ((ulong)*(byte *)local_560 == 0x3a) {
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        goto LAB_01255bc2;
      }
      if ((char_table[*(byte *)local_560] & 1) == 0) {
        err = local_518;
        if ((flg & 8) == 0) goto LAB_012561f3;
        local_558 = pyVar112;
        local_538 = pyVar110;
        bVar76 = skip_spaces_and_comments((u8 **)&local_560);
        pyVar112 = local_558;
        pyVar110 = local_538;
        if (!bVar76) goto LAB_012573a2;
      }
      else {
        do {
          local_560 = (yyjson_val_uni *)((long)local_560 + 1);
        } while ((char_table[*(byte *)local_560] & 1) != 0);
      }
    } while (*(short *)local_560 != 0x203a);
  }
  local_560 = (yyjson_val_uni *)((long)local_560 + 2);
LAB_01255bc2:
  bVar91 = *(byte *)local_560;
  local_558 = pyVar112;
  if (bVar91 == 0x22) {
LAB_01255bda:
    pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
    pyVar79 = (yyjson_val_uni *)((long)local_560 + 1);
    pyVar109 = pyVar79;
    goto LAB_01255bf2;
  }
LAB_01256051:
  pyVar109 = local_560;
  pyVar79 = local_528;
  if ((char_table[bVar91] & 2) != 0) {
    pyVar112 = local_558 + 2;
    pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
    local_4d4 = 0;
    local_548 = pyVar112;
    local_540 = pyVar103;
    if (-1 < cVar88 && (flg & 0xa0) != 0) {
      bVar76 = read_number_raw((u8 **)&local_560,ppuVar113,flg,(yyjson_val *)pyVar112,&local_510);
      goto LAB_01256bb1;
    }
    uVar107 = (ulong)(bVar91 == 0x2d);
    pyVar81 = (yyjson_val_uni *)(uVar107 + (long)local_560);
    bVar90 = *(byte *)((long)local_560 + uVar107);
    uVar95 = (ulong)bVar90;
    local_530 = ppuVar113;
    if ((digi_table[uVar95] & 2) != 0) {
      uVar84 = uVar95 - 0x30;
      bVar90 = *(byte *)((long)pyVar81 + 1);
      uVar107 = (ulong)bVar90 - 0x30;
      pyVar99 = pyVar81;
      if (9 < uVar107) {
        local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
        pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 1);
        if ((digi_table[bVar90] & 0x30) == 0) {
          local_558[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
          if (bVar91 == 0x2d) {
            uVar84 = 0x30 - uVar95;
          }
          local_558[3].u64 = uVar84;
          local_560 = pyVar118;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
        pcVar100 = (char *)0x0;
        local_4f0 = (yyjson_val_uni *)0x0;
        pyVar93 = pyVar118;
        pyVar92 = pyVar118;
        if (bVar90 != 0x2e) goto LAB_012567e8;
        goto LAB_01258928;
      }
      uVar84 = uVar107 + uVar84 * 10;
      bVar90 = *(byte *)((long)pyVar81 + 2);
      uVar95 = (ulong)bVar90 - 0x30;
      if (uVar95 < 10) {
        uVar84 = uVar95 + uVar84 * 10;
        bVar90 = *(byte *)((long)pyVar81 + 3);
        uVar95 = (ulong)bVar90 - 0x30;
        if (uVar95 < 10) {
          uVar84 = uVar95 + uVar84 * 10;
          bVar90 = *(byte *)((long)pyVar81 + 4);
          uVar95 = (ulong)bVar90 - 0x30;
          if (uVar95 < 10) {
            uVar84 = uVar95 + uVar84 * 10;
            bVar90 = *(byte *)((long)pyVar81 + 5);
            uVar95 = (ulong)bVar90 - 0x30;
            if (uVar95 < 10) {
              uVar84 = uVar95 + uVar84 * 10;
              bVar90 = *(byte *)((long)pyVar81 + 6);
              uVar95 = (ulong)bVar90 - 0x30;
              if (uVar95 < 10) {
                uVar84 = uVar95 + uVar84 * 10;
                bVar90 = *(byte *)((long)pyVar81 + 7);
                uVar95 = (ulong)bVar90 - 0x30;
                if (uVar95 < 10) {
                  uVar84 = uVar95 + uVar84 * 10;
                  bVar90 = *(byte *)(pyVar81 + 1);
                  uVar95 = (ulong)bVar90 - 0x30;
                  if (uVar95 < 10) {
                    uVar84 = uVar95 + uVar84 * 10;
                    bVar90 = *(byte *)((long)pyVar81 + 9);
                    uVar95 = (ulong)bVar90 - 0x30;
                    if (uVar95 < 10) {
                      uVar84 = uVar95 + uVar84 * 10;
                      bVar90 = *(byte *)((long)pyVar81 + 10);
                      uVar95 = (ulong)bVar90 - 0x30;
                      if (uVar95 < 10) {
                        uVar84 = uVar95 + uVar84 * 10;
                        bVar90 = *(byte *)((long)pyVar81 + 0xb);
                        uVar95 = (ulong)bVar90 - 0x30;
                        if (uVar95 < 10) {
                          uVar84 = uVar95 + uVar84 * 10;
                          bVar90 = *(byte *)((long)pyVar81 + 0xc);
                          uVar95 = (ulong)bVar90 - 0x30;
                          if (uVar95 < 10) {
                            uVar84 = uVar95 + uVar84 * 10;
                            bVar90 = *(byte *)((long)pyVar81 + 0xd);
                            uVar95 = (ulong)bVar90 - 0x30;
                            if (uVar95 < 10) {
                              uVar84 = uVar95 + uVar84 * 10;
                              bVar90 = *(byte *)((long)pyVar81 + 0xe);
                              uVar95 = (ulong)bVar90 - 0x30;
                              if (uVar95 < 10) {
                                uVar84 = uVar95 + uVar84 * 10;
                                bVar90 = *(byte *)((long)pyVar81 + 0xf);
                                uVar95 = (ulong)bVar90 - 0x30;
                                if (uVar95 < 10) {
                                  uVar84 = uVar95 + uVar84 * 10;
                                  bVar90 = *(byte *)(pyVar81 + 2);
                                  uVar95 = (ulong)bVar90 - 0x30;
                                  if (uVar95 < 10) {
                                    uVar84 = uVar95 + uVar84 * 10;
                                    bVar90 = *(byte *)((long)pyVar81 + 0x11);
                                    uVar95 = (ulong)bVar90 - 0x30;
                                    if (uVar95 < 10) {
                                      uVar84 = uVar95 + uVar84 * 10;
                                      bVar90 = *(byte *)((long)pyVar81 + 0x12);
                                      uVar95 = (ulong)bVar90 - 0x30;
                                      if (uVar95 < 10) {
                                        uVar84 = uVar95 + uVar84 * 10;
                                        pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0x13);
                                        bVar90 = *(byte *)((long)pyVar81 + 0x13);
                                        bVar5 = digi_table[bVar90];
                                        if ((bVar5 & 0x33) == 0) {
                                          if ((bVar91 == 0x2d) && (0x8000000000000000 < uVar84)) {
                                            if (cVar88 < '\0') {
                                              if (*ppuVar113 != (u8 *)0x0) {
                                                **ppuVar113 = '\0';
                                              }
                                              local_558[2].str =
                                                   (char *)(((long)pyVar118 - (long)local_560) *
                                                            0x100 + 1);
                                              local_558[3].str = (char *)local_560;
                                              *ppuVar113 = (u8 *)pyVar118;
                                              local_560 = pyVar118;
                                              local_538 = pyVar110;
                                              goto LAB_01255f81;
                                            }
                                            auVar124._8_4_ = (int)(uVar84 >> 0x20);
                                            auVar124._0_8_ = uVar84;
                                            auVar124._12_4_ = 0x45300000;
                                            local_558[2].u64 = 0x14;
                                            local_558[3].f64 =
                                                 -((auVar124._8_8_ - 1.9342813113834067e+25) +
                                                  ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                  4503599627370496.0));
                                            local_560 = pyVar118;
                                            local_538 = pyVar110;
                                            goto LAB_01255f81;
                                          }
                                          local_558[2].str =
                                               (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
                                          uVar94 = -uVar84;
                                          if (bVar91 != 0x2d) {
                                            uVar94 = uVar84;
                                          }
                                          local_558[3].u64 = uVar94;
                                          local_560 = pyVar118;
                                          local_538 = pyVar110;
                                          goto LAB_01255f81;
                                        }
                                        if (((bVar5 & 3) != 0) &&
                                           ((digi_table[*(byte *)((long)pyVar81 + 0x14)] & 0x33) ==
                                            0)) {
                                          pyVar99 = (yyjson_val_uni *)((long)pyVar81 + 0x14);
                                          uVar95 = (ulong)bVar90 - 0x30;
                                          if ((uVar84 < 0x1999999999999999) ||
                                             ((uVar84 == 0x1999999999999999 && (uVar95 < 6)))) {
                                            uVar84 = uVar95 + uVar84 * 10;
                                            if (bVar91 != 0x2d) {
                                              local_558[2].u64 = 4;
                                              local_558[3].u64 = uVar84;
                                              local_560 = pyVar99;
                                              local_550 = pyVar102;
                                              local_538 = pyVar110;
                                              goto LAB_01255f81;
                                            }
                                            if (-1 < cVar88) {
                                              auVar125._8_4_ = (int)(uVar84 >> 0x20);
                                              auVar125._0_8_ = uVar84;
                                              auVar125._12_4_ = 0x45300000;
                                              local_558[2].u64 = 0x14;
                                              local_558[3].f64 =
                                                   -((auVar125._8_8_ - 1.9342813113834067e+25) +
                                                    ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                    4503599627370496.0));
                                              local_560 = pyVar99;
                                              local_550 = pyVar102;
                                              local_538 = pyVar110;
                                              goto LAB_01255f81;
                                            }
                                            if (*ppuVar113 != (u8 *)0x0) {
                                              **ppuVar113 = '\0';
                                            }
                                            local_558[2].str =
                                                 (char *)(((long)pyVar99 - (long)local_560) * 0x100
                                                         + 1);
                                            local_558[3].str = (char *)local_560;
                                            *ppuVar113 = (u8 *)pyVar99;
                                            local_560 = pyVar99;
                                            local_550 = pyVar102;
                                            local_538 = pyVar110;
                                            goto LAB_01255f81;
                                          }
                                        }
                                        local_520 = (yyjson_val_uni *)
                                                    CONCAT71(local_520._1_7_,bVar91);
                                        pcVar100 = (char *)0x0;
                                        if ((bVar5 & 0x20) != 0) {
                                          local_4f0 = (yyjson_val_uni *)0x0;
                                          pyVar93 = (yyjson_val_uni *)0x0;
                                          pyVar92 = pyVar118;
                                          goto LAB_012567e8;
                                        }
                                        sig_cut = pyVar118;
                                        pyVar92 = (yyjson_val_uni *)0x0;
                                        if ((bVar90 != 0x2e) ||
                                           (sig_cut = (yyjson_val_uni *)((long)pyVar81 + 0x14),
                                           pyVar92 = pyVar118, local_550 = pyVar102,
                                           local_538 = pyVar110,
                                           (digi_table[*(byte *)((long)pyVar81 + 0x14)] & 3) != 0))
                                        goto LAB_012566f9;
                                        goto LAB_0125bfdb;
                                      }
                                      pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0x12);
                                      if ((digi_table[bVar90] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        local_4f0 = (yyjson_val_uni *)0x0;
                                        pyVar92 = pyVar118;
                                        pyVar93 = pyVar118;
                                        if (bVar90 != 0x2e) goto LAB_012567e8;
                                        goto LAB_01258b26;
                                      }
                                    }
                                    else {
                                      pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0x11);
                                      if ((digi_table[bVar90] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        local_4f0 = (yyjson_val_uni *)0x0;
                                        pyVar92 = pyVar118;
                                        pyVar93 = pyVar118;
                                        if (bVar90 != 0x2e) goto LAB_012567e8;
                                        goto LAB_01258b08;
                                      }
                                    }
                                  }
                                  else {
                                    pyVar118 = pyVar81 + 2;
                                    if ((digi_table[bVar90] & 0x30) != 0) {
                                      pcVar100 = (char *)0x0;
                                      local_4f0 = (yyjson_val_uni *)0x0;
                                      pyVar92 = pyVar118;
                                      pyVar93 = pyVar118;
                                      if (bVar90 != 0x2e) goto LAB_012567e8;
                                      goto LAB_01258aea;
                                    }
                                  }
                                }
                                else {
                                  pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
                                  if ((digi_table[bVar90] & 0x30) != 0) {
                                    pcVar100 = (char *)0x0;
                                    local_4f0 = (yyjson_val_uni *)0x0;
                                    pyVar92 = pyVar118;
                                    pyVar93 = pyVar118;
                                    if (bVar90 != 0x2e) goto LAB_012567e8;
                                    goto LAB_01258acc;
                                  }
                                }
                              }
                              else {
                                pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
                                if ((digi_table[bVar90] & 0x30) != 0) {
                                  pcVar100 = (char *)0x0;
                                  local_4f0 = (yyjson_val_uni *)0x0;
                                  pyVar92 = pyVar118;
                                  pyVar93 = pyVar118;
                                  if (bVar90 != 0x2e) goto LAB_012567e8;
                                  goto LAB_01258aae;
                                }
                              }
                            }
                            else {
                              pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
                              if ((digi_table[bVar90] & 0x30) != 0) {
                                pcVar100 = (char *)0x0;
                                local_4f0 = (yyjson_val_uni *)0x0;
                                pyVar92 = pyVar118;
                                pyVar93 = pyVar118;
                                if (bVar90 != 0x2e) goto LAB_012567e8;
                                goto LAB_01258a90;
                              }
                            }
                          }
                          else {
                            pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
                            if ((digi_table[bVar90] & 0x30) != 0) {
                              pcVar100 = (char *)0x0;
                              local_4f0 = (yyjson_val_uni *)0x0;
                              pyVar92 = pyVar118;
                              pyVar93 = pyVar118;
                              if (bVar90 != 0x2e) goto LAB_012567e8;
                              goto LAB_01258a72;
                            }
                          }
                        }
                        else {
                          pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
                          if ((digi_table[bVar90] & 0x30) != 0) {
                            pcVar100 = (char *)0x0;
                            local_4f0 = (yyjson_val_uni *)0x0;
                            pyVar92 = pyVar118;
                            pyVar93 = pyVar118;
                            if (bVar90 != 0x2e) goto LAB_012567e8;
                            goto LAB_01258a54;
                          }
                        }
                      }
                      else {
                        pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 10);
                        if ((digi_table[bVar90] & 0x30) != 0) {
                          pcVar100 = (char *)0x0;
                          local_4f0 = (yyjson_val_uni *)0x0;
                          pyVar92 = pyVar118;
                          pyVar93 = pyVar118;
                          if (bVar90 != 0x2e) goto LAB_012567e8;
                          goto LAB_01258a36;
                        }
                      }
                    }
                    else {
                      pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 9);
                      if ((digi_table[bVar90] & 0x30) != 0) {
                        pcVar100 = (char *)0x0;
                        local_4f0 = (yyjson_val_uni *)0x0;
                        pyVar92 = pyVar118;
                        pyVar93 = pyVar118;
                        if (bVar90 != 0x2e) goto LAB_012567e8;
                        goto LAB_01258a18;
                      }
                    }
                  }
                  else {
                    pyVar118 = pyVar81 + 1;
                    if ((digi_table[bVar90] & 0x30) != 0) {
                      pcVar100 = (char *)0x0;
                      local_4f0 = (yyjson_val_uni *)0x0;
                      pyVar92 = pyVar118;
                      pyVar93 = pyVar118;
                      if (bVar90 != 0x2e) goto LAB_012567e8;
                      goto LAB_012589fa;
                    }
                  }
                }
                else {
                  pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 7);
                  if ((digi_table[bVar90] & 0x30) != 0) {
                    pcVar100 = (char *)0x0;
                    local_4f0 = (yyjson_val_uni *)0x0;
                    pyVar92 = pyVar118;
                    pyVar93 = pyVar118;
                    if (bVar90 != 0x2e) goto LAB_012567e8;
                    goto LAB_012589dc;
                  }
                }
              }
              else {
                pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 6);
                if ((digi_table[bVar90] & 0x30) != 0) {
                  pcVar100 = (char *)0x0;
                  local_4f0 = (yyjson_val_uni *)0x0;
                  pyVar92 = pyVar118;
                  pyVar93 = pyVar118;
                  if (bVar90 != 0x2e) goto LAB_012567e8;
                  goto LAB_012589be;
                }
              }
            }
            else {
              pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 5);
              if ((digi_table[bVar90] & 0x30) != 0) {
                pcVar100 = (char *)0x0;
                local_4f0 = (yyjson_val_uni *)0x0;
                pyVar92 = pyVar118;
                pyVar93 = pyVar118;
                if (bVar90 != 0x2e) goto LAB_012567e8;
                goto LAB_012589a0;
              }
            }
          }
          else {
            pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 4);
            if ((digi_table[bVar90] & 0x30) != 0) {
              pcVar100 = (char *)0x0;
              local_4f0 = (yyjson_val_uni *)0x0;
              pyVar92 = pyVar118;
              pyVar93 = pyVar118;
              if (bVar90 != 0x2e) goto LAB_012567e8;
              goto LAB_01258982;
            }
          }
        }
        else {
          pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 3);
          if ((digi_table[bVar90] & 0x30) != 0) {
            pcVar100 = (char *)0x0;
            local_4f0 = (yyjson_val_uni *)0x0;
            pyVar92 = pyVar118;
            pyVar93 = pyVar118;
            if (bVar90 != 0x2e) goto LAB_012567e8;
            goto LAB_01258964;
          }
        }
      }
      else {
        pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 2);
        if ((digi_table[bVar90] & 0x30) != 0) {
          pcVar100 = (char *)0x0;
          local_4f0 = (yyjson_val_uni *)0x0;
          pyVar92 = pyVar118;
          pyVar93 = pyVar118;
          if (bVar90 != 0x2e) goto LAB_012567e8;
          goto LAB_01258946;
        }
      }
      local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
      local_558[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
      uVar94 = -uVar84;
      if (bVar91 != 0x2d) {
        uVar94 = uVar84;
      }
      local_558[3].u64 = uVar94;
      local_560 = pyVar118;
      local_550 = pyVar102;
      local_538 = pyVar110;
      goto LAB_01255f81;
    }
    local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
    if (bVar90 != 0x30) {
      local_550 = pyVar102;
      local_538 = pyVar110;
      if ((flg & 0x10) != 0) {
        if ((((bVar90 | 0x20) == 0x69) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x6e)) &&
           ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x66)) {
          uVar84 = (long)pyVar81 - (ulong)(bVar91 == 0x2d);
          pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 3);
          if ((((*(byte *)((long)pyVar81 + 3) | 0x20) == 0x69) &&
              ((*(byte *)((long)pyVar81 + 4) | 0x20) == 0x6e)) &&
             (((*(byte *)((long)pyVar81 + 5) | 0x20) == 0x69 &&
              (((*(byte *)((long)pyVar81 + 6) | 0x20) == 0x74 &&
               ((*(byte *)((long)pyVar81 + 7) | 0x20) == 0x79)))))) {
            pyVar109 = pyVar81 + 1;
          }
          if ((flg & 0xa0) == 0) {
            local_558[2].u64 = 0x14;
            uVar84 = ((ulong)(bVar91 != 0x2d) << 0x3f) + 0xfff0000000000000;
          }
          else {
            if (*ppuVar113 != (u8 *)0x0) {
              **ppuVar113 = '\0';
            }
            *ppuVar113 = (u8 *)pyVar109;
            local_558[2].str = (char *)(((long)pyVar109 - uVar84) * 0x100 + 1);
          }
          local_558[3].u64 = uVar84;
          bVar76 = true;
          pyVar81 = pyVar109;
        }
        else {
          bVar76 = false;
        }
        bVar58 = true;
        if (!bVar76) {
          if ((((*(byte *)pyVar81 | 0x20) == 0x6e) &&
              ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x61)) &&
             ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x6e)) {
            if ((flg & 0xa0) == 0) {
              local_558[2].u64 = 0x14;
              pcVar100 = (char *)(((ulong)(bVar91 != 0x2d) << 0x3f) + -0x8000000000000);
            }
            else {
              pcVar100 = (char *)((long)pyVar81 - (ulong)(bVar91 == 0x2d));
              if (*ppuVar113 != (u8 *)0x0) {
                **ppuVar113 = '\0';
              }
              *ppuVar113 = (u8 *)((long)pyVar81 + 3);
              local_558[2].str = (char *)((ulong)(bVar91 == 0x2d) * 0x100 + 0x301);
            }
            local_558[3].str = pcVar100;
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
          }
          else {
            bVar58 = false;
          }
        }
        local_560 = pyVar81;
        if (bVar58) goto LAB_01255f81;
      }
LAB_0125bae1:
      local_510 = "no digit after minus sign";
      goto LAB_0125bfe2;
    }
    pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 1);
    if ((digi_table[*(byte *)((long)pyVar81 + 1)] & 0x33) == 0) {
      local_558[2].str = (char *)((ulong)(bVar91 == 0x2d) * 8 + 4);
      local_558[3].u64 = 0;
      local_560 = pyVar118;
      local_550 = pyVar102;
      local_538 = pyVar110;
      goto LAB_01255f81;
    }
    if (*(byte *)((long)pyVar81 + 1) != 0x2e) goto LAB_01258da1;
    local_550 = pyVar102;
    local_538 = pyVar110;
    if ((digi_table[*(byte *)((long)pyVar81 + 2)] & 3) == 0) goto LAB_0125bfd7;
    pyVar118 = (yyjson_val_uni *)((long)local_560 + uVar107 + 1);
    do {
      pyVar99 = pyVar118;
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 1);
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 1);
    } while (uVar95 == 0x30);
    if ((digi_table[uVar95] & 3) == 0) goto LAB_01258da1;
    uVar84 = uVar95 - 0x30;
LAB_01258928:
    pyVar92 = (yyjson_val_uni *)((long)pyVar81 + 1);
    pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 2);
    uVar95 = (ulong)*(byte *)((long)pyVar99 + 2) - 0x30;
    if (uVar95 < 10) {
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258946:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 3);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 3) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258964:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 4);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 4) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258982:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 5);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 5) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_012589a0:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 6);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 6) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_012589be:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 7);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 7) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_012589dc:
      pyVar118 = pyVar99 + 1;
      if (9 < (ulong)*(byte *)(pyVar99 + 1) - 0x30) goto LAB_01258b5c;
      uVar84 = ((ulong)*(byte *)(pyVar99 + 1) - 0x30) + uVar84 * 10;
LAB_012589fa:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 9);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 9) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258a18:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 10);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 10) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258a36:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0xb);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0xb) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258a54:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0xc);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0xc) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258a72:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0xd);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0xd) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258a90:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0xe);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0xe) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258aae:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0xf);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0xf) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258acc:
      pyVar118 = pyVar99 + 2;
      if (9 < (ulong)*(byte *)(pyVar99 + 2) - 0x30) goto LAB_01258b5c;
      uVar84 = ((ulong)*(byte *)(pyVar99 + 2) - 0x30) + uVar84 * 10;
LAB_01258aea:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0x11);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0x11) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258b08:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0x12);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0x12) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
LAB_01258b26:
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0x13);
      uVar95 = (ulong)*(byte *)((long)pyVar99 + 0x13) - 0x30;
      if (9 < uVar95) goto LAB_01258b5c;
      uVar84 = uVar95 + uVar84 * 10;
      pyVar118 = (yyjson_val_uni *)((long)pyVar99 + 0x14);
      sig_cut = pyVar118;
      if ((digi_table[*(byte *)((long)pyVar99 + 0x14)] & 3) == 0) goto LAB_01258b5c;
LAB_012566f9:
      local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
      pcVar100 = (char *)((long)sig_cut * 0x100 + (long)local_560 * -0x100 + 1);
      pyVar81 = (yyjson_val_uni *)((long)sig_cut + 1);
      do {
        pyVar118 = pyVar81;
        pyVar81 = (yyjson_val_uni *)((long)pyVar118 + 1);
        pcVar100 = pcVar100 + 0x100;
      } while ((digi_table[*(byte *)pyVar118] & 3) != 0);
      uVar84 = uVar84 + (0x34 < *(byte *)sig_cut);
      if (pyVar92 == (yyjson_val_uni *)0x0) {
        if ((cVar88 < '\0') && ((digi_table[*(byte *)pyVar118] & 0x30) == 0)) {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          local_558[2].str = pcVar100;
          local_558[3].str = (char *)local_560;
          *ppuVar113 = (u8 *)pyVar118;
          local_560 = pyVar118;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
        pyVar92 = pyVar118;
        if (*(byte *)pyVar118 == 0x2e) {
          local_550 = pyVar102;
          local_538 = pyVar110;
          if ((digi_table[*(byte *)pyVar81] & 3) == 0) {
LAB_0125a0e9:
            local_4d4 = 0;
            local_510 = "no digit after decimal point";
            local_560 = pyVar81;
            goto LAB_0125bfec;
          }
          do {
            pbVar2 = (byte *)((long)pyVar118 + 1);
            pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
          } while ((digi_table[*pbVar2] & 3) != 0);
        }
      }
      pyVar81 = pyVar118;
      do {
        do {
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + -1);
        } while (*(char *)pyVar81 == '0');
      } while (*(char *)pyVar81 == '.');
      pcVar100 = (char *)((long)pyVar92 + ((ulong)(pyVar92 < sig_cut) - (long)sig_cut));
      local_4f0 = sig_cut;
      pyVar93 = pyVar118;
      if (pyVar81 < sig_cut) {
        local_4f0 = (yyjson_val_uni *)0x0;
        pyVar93 = (yyjson_val_uni *)0x0;
      }
      pyVar81 = pyVar118;
      if ((digi_table[*(byte *)pyVar118] & 0x20) != 0) goto LAB_012567e8;
LAB_01256864:
      local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
      if ((long)pcVar100 < -0x157) {
        local_558[2].u64 = 0x14;
        local_558[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
        local_560 = pyVar81;
        local_550 = pyVar102;
        local_538 = pyVar110;
        goto LAB_01255f81;
      }
      pyVar118 = pyVar93;
      if ((long)pcVar100 < 0x135) {
LAB_01256883:
        local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
        local_4d4 = (uint)pcVar100;
        if ((uVar84 >> 0x35 == 0) && (local_4d4 + 0x16 < 0x2d)) {
          if ((int)local_4d4 < 0) {
            dVar119 = (double)(long)uVar84 / *(double *)(f64_pow10_table + (ulong)-local_4d4 * 8);
          }
          else {
            dVar119 = (double)(long)uVar84 *
                      *(double *)(f64_pow10_table + (ulong)(local_4d4 & 0x7fffffff) * 8);
          }
          local_558[2].u64 = 0x14;
          dVar128 = -dVar119;
          if (bVar91 != 0x2d) {
            dVar128 = dVar119;
          }
          local_558[3].u64 = (uint64_t)dVar128;
          local_560 = pyVar81;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
        local_4a0 = pyVar118;
        if ((local_4d4 + 0x132 < 0x252) && (local_4f0 == (yyjson_val_uni *)0x0)) {
          uVar95 = 0x3f;
          if (uVar84 != 0) {
            for (; uVar84 >> uVar95 == 0; uVar95 = uVar95 - 1) {
            }
          }
          uVar82 = uVar84 << ((byte)(uVar95 ^ 0x3f) & 0x3f);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar82;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8);
          auVar20 = auVar20 * auVar44;
          lVar96 = auVar20._8_8_;
          uVar107 = auVar20._0_8_;
          bVar76 = true;
          if (0x1fd < (ulong)(auVar20._8_4_ & 0x1ff) - 1) {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar82;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8);
            lVar97 = SUB168(auVar21 * auVar45,8);
            bVar76 = false;
            if ((lVar97 + uVar107) - 1 < 0xfffffffffffffffe) {
              lVar96 = lVar96 + (ulong)(lVar97 + uVar107 < uVar107);
              bVar76 = true;
            }
          }
          if (bVar76) {
            uVar107 = lVar96 << (-1 < lVar96);
            uVar107 = (uVar107 & 0x400) + uVar107;
            local_558[2].u64 = 0x14;
            local_558[3].u64 =
                 (ulong)(bVar91 == 0x2d) << 0x3f |
                 uVar107 >> 0xb & 0xfffffffffffff |
                 (ulong)(((((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) - (int)(uVar95 ^ 0x3f))
                         - (uint)(-1 < lVar96)) + 0x47e + (uint)(uVar107 < 0x400)) << 0x34;
            local_560 = pyVar81;
            local_550 = pyVar102;
            local_538 = pyVar110;
            goto LAB_01255f81;
          }
        }
        uVar95 = 0x3f;
        if (uVar84 != 0) {
          for (; uVar84 >> uVar95 == 0; uVar95 = uVar95 - 1) {
          }
        }
        bVar90 = (byte)(uVar95 ^ 0x3f);
        lVar96 = ((ulong)(local_4f0 != (yyjson_val_uni *)0x0) << 2) << (bVar90 & 0x3f);
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             *(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8) -
             (*(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8) >> 0x3f);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar84 << (bVar90 & 0x3f);
        uVar82 = SUB168(auVar22 * auVar46,8) - (SUB168(auVar22 * auVar46,0) >> 0x3f);
        uVar107 = 0x3f;
        if (uVar82 != 0) {
          for (; uVar82 >> uVar107 == 0; uVar107 = uVar107 - 1) {
          }
        }
        bVar90 = (byte)(uVar107 ^ 0x3f);
        uVar82 = uVar82 << (bVar90 & 0x3f);
        uVar116 = (9 - (ulong)(lVar96 == 0)) + lVar96 << (bVar90 & 0x3f);
        iVar114 = (((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) -
                  ((int)(uVar95 ^ 0x3f) + (int)(uVar107 ^ 0x3f))) + 0x40;
        iVar115 = 0xb;
        if (iVar114 < -0x43d) {
          iVar115 = 0x40;
          if (-0x472 < iVar114) {
            iVar115 = -0x432 - iVar114;
          }
        }
        if (0x3c < iVar115) {
          bVar90 = (char)iVar115 - 0x3c;
          uVar82 = uVar82 >> (bVar90 & 0x3f);
          iVar114 = iVar114 + iVar115 + -0x3c;
          uVar116 = (uVar116 >> (bVar90 & 0x3f)) + 9;
          iVar115 = 0x3c;
        }
        bVar90 = (byte)iVar115;
        lVar96 = 8L << (bVar90 - 1 & 0x3f);
        pyVar83 = (yyjson_doc *)((~(-1L << (bVar90 & 0x3f)) & uVar82) * 8);
        local_508 = (yyjson_doc *)(lVar96 + uVar116);
        pyVar79 = (yyjson_val_uni *)0x0;
        uVar95 = (ulong)(local_508 <= pyVar83) + (uVar82 >> (bVar90 & 0x3f));
        if (uVar95 != 0) {
          uVar107 = 0x3f;
          if (uVar95 != 0) {
            for (; uVar95 >> uVar107 == 0; uVar107 = uVar107 - 1) {
            }
          }
          iVar115 = (iVar114 + iVar115) - (int)(uVar107 ^ 0x3f);
          pyVar79 = (yyjson_val_uni *)0x7ff0000000000000;
          if (iVar115 < 0x3c1) {
            uVar95 = (uVar95 << ((byte)(uVar107 ^ 0x3f) & 0x3f)) >> 0xb;
            if (iVar115 < -0x43d) {
              pyVar79 = (yyjson_val_uni *)0x0;
              if (-0x472 < iVar115) {
                pyVar79 = (yyjson_val_uni *)(uVar95 >> (-(char)iVar115 - 0x3dU & 0x3f));
              }
            }
            else {
              pyVar79 = (yyjson_val_uni *)
                        (uVar95 & 0xfffffffffffff | (ulong)(iVar115 + 0x43e) << 0x34);
            }
          }
        }
        uVar94 = 0x7ff0000000000000;
        if (pyVar79 == (yyjson_val_uni *)0x7ff0000000000000) {
          if (cVar88 < '\0') {
            if (*ppuVar113 != (u8 *)0x0) {
              **ppuVar113 = '\0';
            }
            local_558[2].str = (char *)(((long)pyVar81 - (long)local_560) * 0x100 + 1);
            local_558[3].str = (char *)local_560;
            *ppuVar113 = (u8 *)pyVar81;
          }
          else {
            if ((flg & 0x10) == 0) {
              local_510 = "number is infinity when parsed as double";
              bVar76 = false;
              local_560 = pyVar109;
              local_550 = pyVar102;
              local_538 = pyVar110;
              goto LAB_01256bb1;
            }
            if (bVar91 == 0x2d) {
              uVar94 = 0xfff0000000000000;
            }
            local_558[2].u64 = 0x14;
            local_558[3].u64 = uVar94;
          }
          bVar76 = true;
          local_560 = pyVar81;
          local_550 = pyVar102;
          local_538 = pyVar110;
        }
        else if (((yyjson_doc *)(lVar96 - uVar116) < pyVar83) && (pyVar83 < local_508)) {
          uVar105 = 0xfffffbcd;
          if ((yyjson_val_uni *)0xfffffffffffff < pyVar79) {
            uVar105 = (uint)((ulong)pyVar79 >> 0x34) - 0x434;
          }
          pyVar112 = (yyjson_val_uni *)(((ulong)pyVar79 & 0xfffffffffffff) + 0x10000000000000);
          if ((yyjson_val_uni *)0xfffffffffffff >= pyVar79) {
            pyVar112 = pyVar79;
          }
          local_498 = &local_460;
          local_550 = pyVar102;
          local_538 = pyVar110;
          local_508 = pyVar80;
          local_4a8 = pyVar79;
          bigint_set_buf(local_498,uVar84,(i32 *)&local_4d4,(u8 *)&local_4f0->u64,
                         (u8 *)&pyVar118->u64,(u8 *)&pyVar92->u64);
          local_4f0 = (yyjson_val_uni *)local_258.bits;
          local_258.used = 1;
          local_258.bits[0] = (long)pyVar112 * 2 + 1;
          if ((int)local_4d4 < 0) {
            iVar114 = -local_4d4;
            local_258.used = 1;
            iVar115 = iVar114;
            if ((int)local_4d4 < -0x12) {
              do {
                uVar107 = (ulong)local_258.used;
                uVar95 = 0;
                if (local_258.used != 0) {
                  uVar95 = 0;
                  do {
                    if (local_258.bits[uVar95] != 0) goto LAB_01258375;
                    uVar95 = uVar95 + 1;
                  } while (local_258.used != (uint)uVar95);
                  uVar95 = (ulong)local_258.used;
                }
LAB_01258375:
                if ((uint)uVar95 < local_258.used) {
                  uVar95 = uVar95 & 0xffffffff;
                  uVar98 = 0;
                  do {
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = uVar98;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = local_258.bits[uVar95];
                    auVar68 = ZEXT816(10000000000000000000) * auVar48 + auVar68;
                    uVar98 = auVar68._8_8_;
                    local_258.bits[uVar95] = auVar68._0_8_;
                    uVar95 = uVar95 + 1;
                  } while (uVar107 != uVar95);
                }
                else {
                  uVar98 = 0;
                }
                if (uVar98 != 0) {
                  local_258.used = local_258.used + 1;
                  local_258.bits[uVar107] = uVar98;
                }
                iVar115 = iVar114 + -0x13;
                bVar76 = 0x25 < iVar114;
                iVar114 = iVar115;
              } while (bVar76);
            }
            if (iVar115 != 0) {
              uVar95 = *(ulong *)(u64_pow10_table + (long)iVar115 * 8);
              uVar82 = (ulong)local_258.used;
              uVar107 = 0;
              if (uVar82 != 0) {
                uVar107 = 0;
                do {
                  if (local_258.bits[uVar107] != 0) goto LAB_012584f4;
                  uVar107 = uVar107 + 1;
                } while (local_258.used != (uint)uVar107);
                uVar107 = (ulong)local_258.used;
              }
LAB_012584f4:
              uVar98 = 0;
              if ((uint)uVar107 < local_258.used) {
                uVar107 = uVar107 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = uVar98;
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = uVar95;
                  auVar50._8_8_ = 0;
                  auVar50._0_8_ = local_258.bits[uVar107];
                  auVar70 = auVar24 * auVar50 + auVar70;
                  uVar98 = auVar70._8_8_;
                  local_258.bits[uVar107] = auVar70._0_8_;
                  uVar107 = uVar107 + 1;
                } while (uVar82 != uVar107);
              }
              if (uVar98 != 0) {
                local_498 = &local_258;
                local_258.used = local_258.used + 1;
                goto LAB_0125853e;
              }
            }
          }
          else {
            uVar77 = local_4d4;
            uVar106 = local_4d4;
            if (0x12 < (int)local_4d4) {
              do {
                uVar107 = (ulong)local_460.used;
                uVar95 = 0;
                if (local_460.used != 0) {
                  uVar95 = 0;
                  do {
                    if (local_460.bits[uVar95] != 0) goto LAB_0125824a;
                    uVar95 = uVar95 + 1;
                  } while (local_460.used != (uint)uVar95);
                  uVar95 = (ulong)local_460.used;
                }
LAB_0125824a:
                if ((uint)uVar95 < local_460.used) {
                  uVar95 = uVar95 & 0xffffffff;
                  uVar98 = 0;
                  do {
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = uVar98;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = local_460.bits[uVar95];
                    auVar67 = ZEXT816(10000000000000000000) * auVar47 + auVar67;
                    uVar98 = auVar67._8_8_;
                    local_460.bits[uVar95] = auVar67._0_8_;
                    uVar95 = uVar95 + 1;
                  } while (uVar107 != uVar95);
                }
                else {
                  uVar98 = 0;
                }
                if (uVar98 != 0) {
                  local_460.used = local_460.used + 1;
                  local_460.bits[uVar107] = uVar98;
                }
                uVar77 = uVar106 - 0x13;
                bVar76 = 0x25 < (int)uVar106;
                uVar106 = uVar77;
              } while (bVar76);
            }
            if (uVar77 != 0) {
              uVar95 = *(ulong *)(u64_pow10_table + (long)(int)uVar77 * 8);
              uVar82 = (ulong)local_460.used;
              uVar107 = 0;
              if (uVar82 != 0) {
                uVar107 = 0;
                do {
                  if (local_460.bits[uVar107] != 0) goto LAB_0125843a;
                  uVar107 = uVar107 + 1;
                } while (local_460.used != (uint)uVar107);
                uVar107 = (ulong)local_460.used;
              }
LAB_0125843a:
              uVar98 = 0;
              if ((uint)uVar107 < local_460.used) {
                uVar107 = uVar107 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ = uVar98;
                  auVar23._8_8_ = 0;
                  auVar23._0_8_ = uVar95;
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = local_460.bits[uVar107];
                  auVar69 = auVar23 * auVar49 + auVar69;
                  uVar98 = auVar69._8_8_;
                  local_460.bits[uVar107] = auVar69._0_8_;
                  uVar107 = uVar107 + 1;
                } while (uVar82 != uVar107);
              }
              if (uVar98 != 0) {
                local_460.used = local_460.used + 1;
LAB_0125853e:
                local_498->bits[uVar82] = uVar98;
              }
            }
          }
          if ((int)uVar105 < 1) {
            uVar105 = -uVar105;
            uVar77 = uVar105 >> 6;
            uVar95 = (ulong)local_460.used;
            if ((uVar105 & 0x3f) == 0) {
              if (uVar95 != 0) {
                do {
                  local_460.bits[((uVar105 >> 6) - 1) + (int)uVar95] = local_460.bits[uVar95 - 1];
                  uVar95 = uVar95 - 1;
                } while (uVar95 != 0);
              }
              local_460.used = local_460.used + uVar77;
              if (0x3f < uVar105) {
                local_4f0 = (yyjson_val_uni *)local_460.bits;
                goto LAB_012586b6;
              }
            }
            else {
              local_4f0 = (yyjson_val_uni *)local_460.bits;
              local_460.bits[uVar95] = 0;
              sVar89 = (sbyte)(uVar105 & 0x3f);
              if (uVar95 != 0) {
                do {
                  local_460.bits[(uVar105 >> 6) + (int)uVar95] =
                       local_460.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                       local_460.bits[uVar95] << sVar89;
                  uVar95 = uVar95 - 1;
                } while (uVar95 != 0);
              }
              local_460.bits[uVar77] = local_460.bits[0] << sVar89;
              local_460.used =
                   (local_460.used + uVar77 + 1) -
                   (uint)(local_460.bits[local_460.used + uVar77] == 0);
              if (0x3f < uVar105) goto LAB_012586b6;
            }
          }
          else {
            uVar77 = uVar105 >> 6;
            uVar95 = (ulong)local_258.used;
            if ((uVar105 & 0x3f) == 0) {
              yyjson_read_opts();
            }
            else {
              local_258.bits[uVar95] = 0;
              sVar89 = (sbyte)(uVar105 & 0x3f);
              if (uVar95 != 0) {
                do {
                  local_258.bits[(uVar105 >> 6) + (int)uVar95] =
                       local_258.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                       local_258.bits[uVar95] << sVar89;
                  uVar95 = uVar95 - 1;
                } while (uVar95 != 0);
              }
              local_258.bits[uVar77] = local_258.bits[0] << sVar89;
              local_258.used =
                   (local_258.used + uVar77 + 1) -
                   (uint)(local_258.bits[local_258.used + uVar77] == 0);
              if (uVar105 < 0x40) goto LAB_012586d0;
            }
LAB_012586b6:
            switchD_00570541::default(local_4f0,0,(ulong)(uVar77 - 1) * 8 + 8);
          }
LAB_012586d0:
          uVar95 = (ulong)local_460.used;
          iVar115 = -1;
          if (local_258.used <= local_460.used) {
            iVar114 = 1;
            iVar115 = 1;
            if (local_460.used <= local_258.used) {
              do {
                if (uVar95 == 0) {
                  iVar115 = 0;
                  break;
                }
                uVar107 = local_460.bits[uVar95 - 1];
                uVar82 = local_258.bits[uVar95 - 1];
                iVar115 = iVar114;
                if (uVar107 >= uVar82 && uVar107 != uVar82) {
                  iVar115 = 1;
                }
                if (uVar107 < uVar82) {
                  iVar115 = -1;
                }
                uVar95 = uVar95 - 1;
                iVar114 = iVar115;
              } while (uVar107 == uVar82);
            }
          }
          if (iVar115 == 0) {
            uVar95 = (ulong)((uint)local_4a8 & 1);
          }
          else {
            uVar95 = (ulong)(0 < iVar115);
          }
          uVar84 = 0x7ff0000000000000;
          pyVar112 = local_548;
          pyVar102 = local_550;
          pyVar110 = local_538;
          ppuVar113 = local_530;
          pyVar80 = local_508;
          if (uVar95 + (long)local_4a8 == 0x7ff0000000000000) {
            if (cVar88 < '\0') {
              if (*local_530 != (u8 *)0x0) {
                **local_530 = '\0';
              }
              local_558[2].str = (char *)(((long)pyVar81 - (long)pyVar109) * 0x100 + 1);
              local_558[3].str = (char *)pyVar109;
              *local_530 = (u8 *)pyVar81;
            }
            else {
              if ((flg & 0x10) == 0) {
                local_510 = "number is infinity when parsed as double";
                bVar76 = false;
                local_560 = pyVar109;
                goto LAB_01256bb1;
              }
              if ((char)local_520 == '-') {
                uVar84 = 0xfff0000000000000;
              }
              local_558[2].u64 = 0x14;
              local_558[3].u64 = uVar84;
            }
          }
          else {
            local_558[2].u64 = 0x14;
            local_558[3].u64 = uVar95 + (long)local_4a8 | (ulong)((char)local_520 == '-') << 0x3f;
          }
          bVar76 = true;
          local_560 = pyVar81;
        }
        else {
          local_558[2].u64 = 0x14;
          local_558[3].u64 = (ulong)pyVar79 | (ulong)(bVar91 == 0x2d) << 0x3f;
          bVar76 = true;
          local_560 = pyVar81;
          local_550 = pyVar102;
          local_538 = pyVar110;
        }
LAB_01256bb1:
        pyVar79 = local_528;
        pyVar103 = local_540;
        if (bVar76 != false) goto LAB_01255f81;
      }
      else {
LAB_0125801a:
        local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
        if (cVar88 < '\0') {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          local_558[2].str = (char *)(((long)pyVar81 - (long)local_560) * 0x100 + 1);
          local_558[3].str = (char *)local_560;
          *ppuVar113 = (u8 *)pyVar81;
          local_560 = pyVar81;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
        local_550 = pyVar102;
        local_538 = pyVar110;
        if ((flg & 0x10) != 0) {
          local_558[2].u64 = 0x14;
          local_558[3].str = (char *)(((ulong)(bVar91 != 0x2d) << 0x3f) + -0x10000000000000);
LAB_01258010:
          local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
          local_560 = pyVar81;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
LAB_0125ac37:
        local_4d4 = 0;
        local_510 = "number is infinity when parsed as double";
      }
    }
    else {
LAB_01258b5c:
      local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
      if ((yyjson_val_uni *)((long)pyVar92 + 1) == pyVar118) {
        local_510 = "no digit after decimal point";
        local_560 = pyVar118;
        local_550 = pyVar102;
        local_538 = pyVar110;
        goto LAB_0125bfec;
      }
      pcVar100 = (char *)((long)pyVar92 + (1 - (long)pyVar118));
      local_4f0 = (yyjson_val_uni *)0x0;
      pyVar93 = pyVar118;
      if ((digi_table[*(byte *)pyVar118] & 0x20) == 0) {
        local_4f0 = (yyjson_val_uni *)0x0;
        pyVar81 = pyVar118;
        if ((long)pcVar100 < -0x157) {
          local_558[2].u64 = 0x14;
          local_558[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
          local_560 = pyVar118;
          local_550 = pyVar102;
          local_538 = pyVar110;
          goto LAB_01255f81;
        }
        goto LAB_01256883;
      }
LAB_012567e8:
      local_520 = (yyjson_val_uni *)CONCAT71(local_520._1_7_,bVar91);
      bVar90 = *(byte *)((long)pyVar118 + 1);
      uVar95 = (ulong)((digi_table[bVar90] & 0xc) != 0);
      local_550 = pyVar102;
      local_538 = pyVar110;
      if ((digi_table[*(byte *)((long)pyVar118 + uVar95 + 1)] & 3) != 0) {
        pyVar118 = (yyjson_val_uni *)((long)pyVar118 + uVar95);
        pyVar81 = pyVar118;
        do {
          pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
          pcVar3 = (char *)((long)pyVar81 + 1);
          pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
        } while (*pcVar3 == '0');
        uVar95 = (ulong)*(byte *)pyVar81;
        lVar96 = 0;
        if ((digi_table[uVar95] & 3) != 0) {
          lVar96 = 0;
          do {
            lVar96 = (ulong)(byte)((char)uVar95 - 0x30) + lVar96 * 10;
            uVar95 = (ulong)*(byte *)((long)pyVar81 + 1);
            pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 1);
          } while ((digi_table[uVar95] & 3) != 0);
        }
        if ((long)pyVar81 - (long)pyVar118 < 0x13) {
          lVar97 = -lVar96;
          if (bVar90 != 0x2d) {
            lVar97 = lVar96;
          }
          pcVar100 = pcVar100 + lVar97;
          goto LAB_01256864;
        }
        if (bVar90 == 0x2d) {
          local_558[2].u64 = 0x14;
          local_558[3].u64 = (ulong)(bVar91 == 0x2d) << 0x3f;
          goto LAB_01258010;
        }
        goto LAB_0125801a;
      }
LAB_0125ab63:
      local_510 = "no digit after exponent sign";
      local_560 = (yyjson_val_uni *)((long)pyVar118 + uVar95 + 1);
LAB_0125ab76:
      local_4d4 = 0;
    }
    goto LAB_0125bfec;
  }
  uVar105 = (uint)bVar91;
  pyVar112 = local_558;
  pyVar99 = local_540;
  if (uVar105 < 0x6e) {
    if (uVar105 == 0x5b) goto LAB_012592d4;
    if (uVar105 == 0x66) {
      if (*(int *)((long)local_560 + 1) == 0x65736c61) {
        local_558[2].u64 = 3;
        local_560 = (yyjson_val_uni *)((long)local_560 + 5);
        goto LAB_01256598;
      }
      goto LAB_0125aacd;
    }
LAB_01256095:
    if ((char_table[bVar91] & 1) != 0) {
      do {
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      } while ((char_table[*(byte *)local_560] & 1) != 0);
LAB_01256103:
      bVar91 = *(byte *)local_560;
      if (bVar91 == 0x22) goto LAB_01255bda;
      goto LAB_01256051;
    }
    err = local_518;
    if ((((flg & 0x10) != 0) && (uVar105 - 0x49 < 0x21)) &&
       ((0x100000021U >> ((ulong)(uVar105 - 0x49) & 0x3f) & 1) != 0)) {
      if ((((uVar105 | 0x20) == 0x69) && ((*(byte *)((long)local_560 + 1) | 0x20) == 0x6e)) &&
         ((*(byte *)((long)local_560 + 2) | 0x20) == 0x66)) {
        pyVar112 = (yyjson_val_uni *)((long)local_560 + 3);
        if ((((*(byte *)((long)local_560 + 3) | 0x20) == 0x69) &&
            ((*(byte *)((long)local_560 + 4) | 0x20) == 0x6e)) &&
           (((*(byte *)((long)local_560 + 5) | 0x20) == 0x69 &&
            (((*(byte *)((long)local_560 + 6) | 0x20) == 0x74 &&
             ((*(byte *)((long)local_560 + 7) | 0x20) == 0x79)))))) {
          pyVar112 = local_560 + 1;
        }
        if ((flg & 0xa0) != 0) {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          *ppuVar113 = (u8 *)pyVar112;
          local_558[2].str = (char *)(((long)pyVar112 - (long)local_560) * 0x100 + 1);
          local_558[3].str = (char *)local_560;
          local_560 = pyVar112;
          goto LAB_01256598;
        }
        local_558[2].u64 = 0x14;
        pyVar109 = (yyjson_val_uni *)0x7ff0000000000000;
        local_560 = pyVar112;
        goto LAB_012580f3;
      }
      if ((((*(byte *)local_560 | 0x20) == 0x6e) &&
          ((*(byte *)((long)local_560 + 1) | 0x20) == 0x61)) &&
         ((*(byte *)((long)local_560 + 2) | 0x20) == 0x6e)) goto LAB_0125791b;
      goto LAB_012561f3;
    }
    if ((flg & 8) == 0) goto LAB_012561f3;
    local_550 = pyVar102;
    local_538 = pyVar110;
    bVar76 = skip_spaces_and_comments((u8 **)&local_560);
    pyVar102 = local_550;
    pyVar110 = local_538;
    if (bVar76) goto LAB_01256103;
LAB_012573a2:
    bVar76 = *(short *)local_560 == 0x2a2f;
    err = local_518;
LAB_0125ca9b:
    if (!bVar76) goto LAB_012561f3;
LAB_0125caa6:
    pyVar112 = local_4e0;
    pyVar102 = local_4f8;
    pyVar79 = local_560;
    bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,8,
                              flg);
    if (bVar76) {
      pyVar79 = pyVar112;
    }
    pcVar100 = "unclosed multiline comment";
    if (bVar76) {
      pcVar100 = "unexpected end of data";
    }
    if (err == (yyjson_read_err *)0x0) {
      err = &local_4c0;
    }
    err->pos = (long)pyVar79 - (long)pyVar102;
    local_500->code = (uint)!bVar76 * 3 + 5;
    err->msg = pcVar100;
    goto joined_r0x0125cb19;
  }
  if (uVar105 != 0x6e) {
    if (uVar105 == 0x7b) goto LAB_01259333;
    if (uVar105 != 0x74) goto LAB_01256095;
    if (*(int *)local_560 != 0x65757274) goto LAB_0125aacd;
    local_558[2].u64 = 0xb;
LAB_01256552:
    local_560 = (yyjson_val_uni *)((long)local_560 + 4);
LAB_01256598:
    pyVar112 = local_558 + 2;
    pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
    goto LAB_01255f81;
  }
  if (*(int *)local_560 == 0x6c6c756e) {
    local_558[2].u64 = 2;
    goto LAB_01256552;
  }
  if ((((flg & 0x10) != 0) && ((*(byte *)local_560 | 0x20) == 0x6e)) &&
     (((*(byte *)((long)local_560 + 1) | 0x20) == 0x61 &&
      ((*(byte *)((long)local_560 + 2) | 0x20) == 0x6e)))) {
LAB_0125791b:
    pyVar112 = (yyjson_val_uni *)((long)local_560 + 3);
    if ((flg & 0xa0) == 0) {
      local_558[2].u64 = 0x14;
      pyVar109 = (yyjson_val_uni *)0x7ff8000000000000;
      local_560 = pyVar112;
    }
    else {
      if (*ppuVar113 != (u8 *)0x0) {
        **ppuVar113 = '\0';
      }
      *ppuVar113 = (u8 *)pyVar112;
      local_558[2].u64 = 0x301;
      local_560 = pyVar112;
    }
LAB_012580f3:
    local_558[3].u64 = (uint64_t)pyVar109;
    goto LAB_01256598;
  }
LAB_0125aacd:
  pyVar112 = local_4e0;
  pyVar102 = local_4f8;
  pyVar79 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,0xb,
                            flg);
  if (bVar76) {
    pyVar79 = pyVar112;
  }
  yVar78 = 5;
  if (!bVar76) {
    yVar78 = 0xb;
  }
  pcVar100 = "invalid literal";
  if (bVar76) {
    pcVar100 = "unexpected end of data";
  }
  sVar104 = (long)pyVar79 - (long)pyVar102;
LAB_0125ab2a:
  pyVar87 = local_518;
  if (local_518 == (yyjson_read_err *)0x0) {
    pyVar87 = &local_4c0;
  }
  pyVar87->pos = sVar104;
  local_500->code = yVar78;
  pyVar87->msg = pcVar100;
  goto joined_r0x0125cb19;
LAB_01258da1:
  local_550 = pyVar102;
  local_538 = pyVar110;
  if ((digi_table[*(byte *)pyVar118] & 3) == 0) {
    if ((digi_table[*(byte *)pyVar118] & 0x20) == 0) {
LAB_01258db7:
      local_558[2].u64 = 0x14;
      local_558[3].u64 = (ulong)((char)local_520 == '-') << 0x3f;
      pyVar79 = local_528;
      pyVar112 = local_548;
      pyVar102 = local_550;
      pyVar110 = local_538;
      ppuVar113 = local_530;
      pyVar103 = local_540;
      local_560 = pyVar118;
      goto LAB_01255f81;
    }
    yyjson_read_opts();
    pyVar118 = (yyjson_val_uni *)CONCAT44(local_460._4_4_,local_460.used);
    if ((extraout_RAX_01 & 1) == 0) goto LAB_01258db7;
  }
  else {
LAB_0125c371:
    local_4d4 = 0;
    local_510 = "number with leading zero is not allowed";
    local_560 = (yyjson_val_uni *)((long)pyVar118 + -1);
  }
LAB_0125bfec:
  pyVar79 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,9,flg)
  ;
  if (bVar76) {
    pyVar87 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = (long)local_4e0 - (long)local_4f8;
    local_500->code = 5;
    pcVar100 = "unexpected end of data";
  }
  else {
    pyVar87 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = (long)pyVar79 - (long)local_4f8;
    local_500->code = 9;
    pcVar100 = local_510;
  }
  pyVar87 = local_518;
  if (local_518 == (yyjson_read_err *)0x0) {
    pyVar87 = &local_4c0;
  }
  pyVar87->msg = pcVar100;
  goto joined_r0x0125cb19;
LAB_01257960:
  cVar4 = *(char *)local_560;
  if (cVar4 != '\\') {
    if (cVar4 == '\"') {
      uVar95 = 5;
      local_508 = pyVar80;
LAB_01255f59:
      local_558[2].u64 = ((long)pyVar112 - (long)pyVar79) * 0x100 | uVar95;
      local_558[3].str = (char *)pyVar79;
      *(char *)pyVar112 = '\0';
      pyVar79 = local_528;
      pyVar112 = local_558 + 2;
      local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      goto LAB_01255f81;
    }
    local_508 = pyVar80;
    if ((flg & 0x40) == 0) goto LAB_01258797;
    if (local_4e0 <= local_560) goto LAB_012587d3;
    *(char *)pyVar112 = cVar4;
    pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 1);
    pyVar99 = (yyjson_val_uni *)((long)local_560 + 1);
    goto LAB_01257a88;
  }
  bVar91 = *(byte *)((long)local_560 + 1);
  if (bVar91 < 0x62) {
    if (bVar91 == 0x22) {
      *(char *)pyVar112 = '\"';
    }
    else if (bVar91 == 0x2f) {
      *(char *)pyVar112 = '/';
    }
    else {
      local_508 = pyVar80;
      if (bVar91 != 0x5c) goto switchD_01253f7e_caseD_6f;
      *(char *)pyVar112 = '\\';
    }
  }
  else {
    local_508 = pyVar80;
    switch(bVar91) {
    case 0x6e:
      *(char *)pyVar112 = '\n';
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_01253f7e_caseD_6f;
    case 0x72:
      *(char *)pyVar112 = '\r';
      break;
    case 0x74:
      *(char *)pyVar112 = '\t';
      break;
    case 0x75:
      uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 3)],
                        hex_conv_table[*(byte *)((long)local_560 + 5)]);
      if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 2)],
                              hex_conv_table[*(byte *)((long)local_560 + 4)])) & 0xf0f0) != 0)
      goto LAB_0125878b;
      uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 2)],
                               hex_conv_table[*(byte *)((long)local_560 + 4)]) << 4;
      uVar77 = uVar75 | uVar105;
      pyVar99 = (yyjson_val_uni *)((long)local_560 + 6);
      if ((uVar77 & 0xf800) != 0xd800) {
        uVar105 = (uint)uVar75 | uVar105 & 0xffff;
        bVar91 = (byte)uVar77;
        if (uVar105 < 0x800) {
          if (uVar105 < 0x80) {
            *(byte *)pyVar112 = bVar91;
            pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 1);
          }
          else {
            *(byte *)pyVar112 = (byte)(uVar77 >> 6) | 0xc0;
            *(byte *)((long)pyVar112 + 1) = bVar91 & 0x3f | 0x80;
            pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 2);
          }
        }
        else {
          *(byte *)pyVar112 = (byte)(uVar105 >> 0xc) | 0xe0;
          *(byte *)((long)pyVar112 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
          *(byte *)((long)pyVar112 + 2) = bVar91 & 0x3f | 0x80;
          pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 3);
        }
        goto LAB_01257a88;
      }
      if ((uVar77 & 0xdc00) == 0xd800) {
        if (*(short *)pyVar99 == 0x755c) {
          if (((CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 9)],
                         hex_conv_table[*(byte *)((long)local_560 + 0xb)]) |
               CONCAT11(hex_conv_table[*(byte *)(local_560 + 1)],
                        hex_conv_table[*(byte *)((long)local_560 + 10)])) & 0xf0f0) == 0) {
            uVar105 = (CONCAT11(hex_conv_table[*(byte *)(local_560 + 1)],
                                hex_conv_table[*(byte *)((long)local_560 + 10)]) & 0xfff) << 4 |
                      (uint)CONCAT11(hex_conv_table[*(byte *)((long)local_560 + 9)],
                                     hex_conv_table[*(byte *)((long)local_560 + 0xb)]);
            if ((uVar105 & 0xfc00) == 0xdc00) {
              iVar115 = (uVar77 & 0xdbff) * 0x400;
              uVar77 = iVar115 + uVar105 + 0xfca02400;
              *(byte *)pyVar112 = (byte)(uVar77 >> 0x12) | 0xf0;
              *(byte *)((long)pyVar112 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
              *(byte *)((long)pyVar112 + 2) = (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
              *(byte *)((long)pyVar112 + 3) = (byte)uVar105 & 0x3f | 0x80;
              pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 4);
              pyVar99 = (yyjson_val_uni *)((long)local_560 + 0xc);
              goto LAB_01257a88;
            }
LAB_012587c7:
            local_510 = "invalid low surrogate in string";
            local_560 = pyVar99;
          }
          else {
LAB_012587df:
            local_510 = "invalid escaped sequence in string";
            local_560 = pyVar99;
          }
        }
        else {
LAB_012587bb:
          local_510 = "no low surrogate in string";
          local_560 = pyVar99;
        }
      }
      else {
LAB_012587a3:
        local_510 = "invalid high surrogate in string";
      }
      goto LAB_0125b656;
    default:
      if (bVar91 == 0x62) {
        *(char *)pyVar112 = '\b';
      }
      else {
        if (bVar91 != 0x66) goto switchD_01253f7e_caseD_6f;
        *(char *)pyVar112 = '\f';
      }
    }
  }
  pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 1);
  pyVar99 = (yyjson_val_uni *)((long)local_560 + 2);
LAB_01257a88:
  do {
    local_560 = pyVar99;
    if ((char_table[*(byte *)local_560] & 0xc) != 0) {
LAB_01257cc7:
      while( true ) {
        if (-1 < *(char *)local_560) goto LAB_01257960;
        uVar105 = *(uint *)local_560;
        pyVar99 = local_560;
        while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
               ((uVar105 & 0x200f) != 0x200d))) {
          *(uint *)pyVar112 = uVar105;
          pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 3);
          puVar1 = (uint *)((long)pyVar99 + 3);
          pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 3);
          uVar105 = *puVar1;
        }
        if (-1 < (char)uVar105) break;
        if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)pyVar112 = (short)uVar105;
            pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 2);
            uVar105 = *(uint *)((long)pyVar99 + 2);
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 2);
            if ((uVar105 & 0xc0e0) != 0x80c0) break;
          } while ((uVar105 & 0x1e) != 0);
        }
        if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
            *(uint *)pyVar112 = uVar105;
            pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 4);
            uVar105 = *(uint *)((long)pyVar99 + 4);
            pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 4);
            if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (local_560 != pyVar99) break;
        local_508 = pyVar80;
        if ((flg & 0x40) == 0) goto LAB_012582b9;
LAB_01257db3:
        *(undefined2 *)pyVar112 = *(undefined2 *)pyVar99;
        local_560 = (yyjson_val_uni *)((long)pyVar99 + 1);
        pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 1);
      }
      goto LAB_01257a88;
    }
    pyVar99 = local_560;
    if ((char_table[*(byte *)((long)local_560 + 1)] & 0xc) != 0) goto LAB_01257db3;
    if ((char_table[*(byte *)((long)local_560 + 2)] & 0xc) != 0) {
      uVar6 = *(undefined2 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 2);
      *(undefined2 *)pyVar112 = uVar6;
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 2);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 3)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 3);
      *(undefined4 *)pyVar112 = uVar7;
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 3);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 4)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 4);
      *(undefined4 *)pyVar112 = uVar7;
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 4);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 5)] & 0xc) != 0) {
      *(undefined4 *)pyVar112 = *(undefined4 *)local_560;
      *(undefined2 *)((long)pyVar112 + 4) = *(undefined2 *)((long)local_560 + 4);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 5);
      local_560 = (yyjson_val_uni *)((long)local_560 + 5);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 6)] & 0xc) != 0) {
      *(undefined4 *)pyVar112 = *(undefined4 *)local_560;
      *(undefined2 *)((long)pyVar112 + 4) = *(undefined2 *)((long)local_560 + 4);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 6);
      local_560 = (yyjson_val_uni *)((long)local_560 + 6);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 7)] & 0xc) != 0) {
      yVar8 = *local_560;
      local_560 = (yyjson_val_uni *)((long)local_560 + 7);
      *pyVar112 = yVar8;
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 7);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)(local_560 + 1)] & 0xc) != 0) {
      yVar8 = *local_560;
      local_560 = local_560 + 1;
      *pyVar112 = yVar8;
      pyVar112 = pyVar112 + 1;
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 9)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined2 *)(pyVar112 + 1) = *(undefined2 *)(local_560 + 1);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 9);
      local_560 = (yyjson_val_uni *)((long)local_560 + 9);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 10)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined2 *)(pyVar112 + 1) = *(undefined2 *)(local_560 + 1);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 10);
      local_560 = (yyjson_val_uni *)((long)local_560 + 10);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xb)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined4 *)(pyVar112 + 1) = *(undefined4 *)(local_560 + 1);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 0xb);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xb);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xc)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined4 *)(pyVar112 + 1) = *(undefined4 *)(local_560 + 1);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 0xc);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xc);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xd)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined4 *)(pyVar112 + 1) = *(undefined4 *)(local_560 + 1);
      *(undefined2 *)((long)pyVar112 + 0xc) = *(undefined2 *)((long)local_560 + 0xc);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 0xd);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xd);
      goto LAB_01257cc7;
    }
    if ((char_table[*(byte *)((long)local_560 + 0xe)] & 0xc) != 0) {
      *pyVar112 = *local_560;
      *(undefined4 *)(pyVar112 + 1) = *(undefined4 *)(local_560 + 1);
      *(undefined2 *)((long)pyVar112 + 0xc) = *(undefined2 *)((long)local_560 + 0xc);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 0xe);
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xe);
      goto LAB_01257cc7;
    }
    bVar91 = char_table[*(byte *)((long)local_560 + 0xf)];
    yVar8 = local_560[1];
    *pyVar112 = *local_560;
    pyVar112[1] = yVar8;
    if ((bVar91 & 0xc) != 0) {
      local_560 = (yyjson_val_uni *)((long)local_560 + 0xf);
      pyVar112 = (yyjson_val_uni *)((long)pyVar112 + 0xf);
      goto LAB_01257cc7;
    }
    pyVar112 = pyVar112 + 2;
    pyVar99 = local_560 + 2;
  } while( true );
LAB_01258797:
  local_510 = "unexpected control character in string";
  goto LAB_0125b656;
LAB_012587d3:
  local_510 = "unclosed string";
  goto LAB_0125b656;
LAB_0125878b:
  local_510 = "invalid escaped sequence in string";
  goto LAB_0125b656;
switchD_01253f7e_caseD_6f:
  local_510 = "invalid escaped character in string";
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  goto LAB_0125b656;
LAB_012582b9:
  local_510 = "invalid UTF-8 encoding in string";
  local_560 = pyVar99;
  goto LAB_0125b656;
LAB_01259333:
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  pyVar110->str = (char *)((ulong)*(byte *)pyVar110 + (long)pyVar99 * 0x100 + 0x100);
  pyVar112 = pyVar112 + 2;
  if (pyVar102 <= pyVar112) {
    pyVar103 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
    sVar104 = (long)pyVar103 * 0x10;
    local_558 = pyVar112;
    local_550 = pyVar102;
    local_530 = ppuVar113;
    pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
    pyVar112 = (yyjson_val_uni *)(((long)local_558 - (long)pyVar80) + (long)pyVar83);
    pyVar110 = (yyjson_val_uni *)(((long)pyVar110 - (long)pyVar80) + (long)pyVar83);
    pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
    ppuVar113 = local_530;
    pyVar79 = pyVar103;
    pyVar80 = pyVar83;
    local_558 = pyVar112;
    local_550 = pyVar102;
  }
  pyVar112->u64 = 7;
  pyVar112[1].str = (char *)((long)pyVar112 - (long)pyVar110);
  pyVar110 = local_560;
  if (*(char *)local_560 == '\n') {
    pyVar110 = (yyjson_val_uni *)((long)local_560 + 1);
  }
  goto LAB_0124ef20;
LAB_0125938f:
  pyVar112 = pyVar112 + 2;
  local_528 = pyVar79;
  if (pyVar102 <= pyVar112) {
    local_528 = (yyjson_val_uni *)(((ulong)pyVar79 >> 1) + (long)pyVar79);
    sVar104 = (long)local_528 * 0x10;
    local_550 = pyVar102;
    local_548 = pyVar112;
    local_540 = pyVar99;
    local_538 = pyVar110;
    local_530 = ppuVar113;
    pyVar83 = (yyjson_doc *)(*local_4c8)(local_4e8,pyVar80,(long)pyVar79 << 4,sVar104);
    if (pyVar83 == (yyjson_doc *)0x0) goto LAB_0124ff5c;
    pyVar112 = (yyjson_val_uni *)(((long)local_548 - (long)pyVar80) + (long)pyVar83);
    pyVar110 = (yyjson_val_uni *)(((long)local_538 - (long)pyVar80) + (long)pyVar83);
    pyVar102 = (yyjson_val_uni *)((long)pyVar83 + (sVar104 - 0x20));
    ppuVar113 = local_530;
    pyVar99 = local_540;
    pyVar80 = pyVar83;
    local_538 = pyVar110;
  }
  pyVar99 = (yyjson_val_uni *)((long)pyVar99 + 1);
  local_4d4 = 0;
  local_550 = pyVar102;
  local_548 = pyVar112;
  if (-1 < cVar88 && (flg & 0xa0) != 0) {
    bVar76 = read_number_raw((u8 **)&local_560,ppuVar113,flg,(yyjson_val *)pyVar112,&local_510);
    goto LAB_0125a086;
  }
  cVar4 = *(char *)local_560;
  uVar107 = (ulong)(cVar4 == '-');
  pyVar81 = (yyjson_val_uni *)(uVar107 + (long)local_560);
  bVar91 = *(byte *)((long)local_560 + uVar107);
  uVar95 = (ulong)bVar91;
  err = local_518;
  pyVar79 = local_528;
  local_538 = pyVar110;
  local_540 = pyVar99;
  if ((digi_table[uVar95] & 2) != 0) {
    uVar107 = uVar95 - 0x30;
    bVar91 = *(byte *)((long)pyVar81 + 1);
    uVar82 = (ulong)bVar91 - 0x30;
    pyVar103 = pyVar81;
    if (uVar82 < 10) {
      uVar107 = uVar82 + uVar107 * 10;
      bVar91 = *(byte *)((long)pyVar81 + 2);
      uVar95 = (ulong)bVar91 - 0x30;
      if (uVar95 < 10) {
        uVar107 = uVar95 + uVar107 * 10;
        bVar91 = *(byte *)((long)pyVar81 + 3);
        uVar95 = (ulong)bVar91 - 0x30;
        if (uVar95 < 10) {
          uVar107 = uVar95 + uVar107 * 10;
          bVar91 = *(byte *)((long)pyVar81 + 4);
          uVar95 = (ulong)bVar91 - 0x30;
          if (uVar95 < 10) {
            uVar107 = uVar95 + uVar107 * 10;
            bVar91 = *(byte *)((long)pyVar81 + 5);
            uVar95 = (ulong)bVar91 - 0x30;
            if (uVar95 < 10) {
              uVar107 = uVar95 + uVar107 * 10;
              bVar91 = *(byte *)((long)pyVar81 + 6);
              uVar95 = (ulong)bVar91 - 0x30;
              if (uVar95 < 10) {
                uVar107 = uVar95 + uVar107 * 10;
                bVar91 = *(byte *)((long)pyVar81 + 7);
                uVar95 = (ulong)bVar91 - 0x30;
                if (uVar95 < 10) {
                  uVar107 = uVar95 + uVar107 * 10;
                  bVar91 = *(byte *)(pyVar81 + 1);
                  uVar95 = (ulong)bVar91 - 0x30;
                  if (uVar95 < 10) {
                    uVar107 = uVar95 + uVar107 * 10;
                    bVar91 = *(byte *)((long)pyVar81 + 9);
                    uVar95 = (ulong)bVar91 - 0x30;
                    if (uVar95 < 10) {
                      uVar107 = uVar95 + uVar107 * 10;
                      bVar91 = *(byte *)((long)pyVar81 + 10);
                      uVar95 = (ulong)bVar91 - 0x30;
                      if (uVar95 < 10) {
                        uVar107 = uVar95 + uVar107 * 10;
                        bVar91 = *(byte *)((long)pyVar81 + 0xb);
                        uVar95 = (ulong)bVar91 - 0x30;
                        if (uVar95 < 10) {
                          uVar107 = uVar95 + uVar107 * 10;
                          bVar91 = *(byte *)((long)pyVar81 + 0xc);
                          uVar95 = (ulong)bVar91 - 0x30;
                          if (uVar95 < 10) {
                            uVar107 = uVar95 + uVar107 * 10;
                            bVar91 = *(byte *)((long)pyVar81 + 0xd);
                            uVar95 = (ulong)bVar91 - 0x30;
                            if (uVar95 < 10) {
                              uVar107 = uVar95 + uVar107 * 10;
                              bVar91 = *(byte *)((long)pyVar81 + 0xe);
                              uVar95 = (ulong)bVar91 - 0x30;
                              if (uVar95 < 10) {
                                uVar107 = uVar95 + uVar107 * 10;
                                bVar91 = *(byte *)((long)pyVar81 + 0xf);
                                uVar95 = (ulong)bVar91 - 0x30;
                                if (uVar95 < 10) {
                                  uVar107 = uVar95 + uVar107 * 10;
                                  bVar91 = *(byte *)(pyVar81 + 2);
                                  uVar95 = (ulong)bVar91 - 0x30;
                                  if (uVar95 < 10) {
                                    uVar107 = uVar95 + uVar107 * 10;
                                    bVar91 = *(byte *)((long)pyVar81 + 0x11);
                                    uVar95 = (ulong)bVar91 - 0x30;
                                    if (uVar95 < 10) {
                                      uVar107 = uVar95 + uVar107 * 10;
                                      bVar91 = *(byte *)((long)pyVar81 + 0x12);
                                      uVar95 = (ulong)bVar91 - 0x30;
                                      if (uVar95 < 10) {
                                        uVar107 = uVar95 + uVar107 * 10;
                                        pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0x13);
                                        bVar91 = *(byte *)((long)pyVar81 + 0x13);
                                        bVar90 = digi_table[bVar91];
                                        if ((bVar90 & 0x33) == 0) {
                                          if ((cVar4 == '-') && (0x8000000000000000 < uVar107)) {
                                            if (cVar88 < '\0') {
                                              if (*ppuVar113 != (u8 *)0x0) {
                                                **ppuVar113 = '\0';
                                              }
                                              pyVar112->str =
                                                   (char *)(((long)pyVar109 - (long)local_560) *
                                                            0x100 + 1);
                                              pyVar112[1].str = (char *)local_560;
                                              *ppuVar113 = (u8 *)pyVar109;
                                              local_560 = pyVar109;
                                            }
                                            else {
                                              auVar126._8_4_ = (int)(uVar107 >> 0x20);
                                              auVar126._0_8_ = uVar107;
                                              auVar126._12_4_ = 0x45300000;
                                              pyVar112->u64 = 0x14;
                                              pyVar112[1].f64 =
                                                   -((auVar126._8_8_ - 1.9342813113834067e+25) +
                                                    ((double)CONCAT44(0x43300000,(int)uVar107) -
                                                    4503599627370496.0));
                                              local_560 = pyVar109;
                                            }
                                          }
                                          else {
                                            pyVar112->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
                                            uVar95 = -uVar107;
                                            if (cVar4 != '-') {
                                              uVar95 = uVar107;
                                            }
                                            pyVar112[1].u64 = uVar95;
                                            local_560 = pyVar109;
                                          }
                                          goto LAB_0125cb2f;
                                        }
                                        if (((bVar90 & 3) != 0) &&
                                           ((digi_table[*(byte *)((long)pyVar81 + 0x14)] & 0x33) ==
                                            0)) {
                                          pyVar103 = (yyjson_val_uni *)((long)pyVar81 + 0x14);
                                          uVar95 = (ulong)bVar91 - 0x30;
                                          if ((uVar107 < 0x1999999999999999) ||
                                             ((uVar107 == 0x1999999999999999 && (uVar95 < 6)))) {
                                            uVar84 = uVar95 + uVar107 * 10;
                                            if (cVar4 == '-') {
                                              if (cVar88 < '\0') {
                                                if (*ppuVar113 != (u8 *)0x0) {
                                                  **ppuVar113 = '\0';
                                                }
                                                pyVar112->str =
                                                     (char *)(((long)pyVar103 - (long)local_560) *
                                                              0x100 + 1);
                                                pyVar112[1].str = (char *)local_560;
                                                *ppuVar113 = (u8 *)pyVar103;
                                                local_560 = pyVar103;
                                              }
                                              else {
                                                auVar127._8_4_ = (int)(uVar84 >> 0x20);
                                                auVar127._0_8_ = uVar84;
                                                auVar127._12_4_ = 0x45300000;
                                                pyVar112->u64 = 0x14;
                                                pyVar112[1].f64 =
                                                     -((auVar127._8_8_ - 1.9342813113834067e+25) +
                                                      ((double)CONCAT44(0x43300000,(int)uVar84) -
                                                      4503599627370496.0));
                                                local_560 = pyVar103;
                                              }
                                            }
                                            else {
                                              pyVar112->u64 = 4;
                                              pyVar112[1].u64 = uVar84;
                                              local_560 = pyVar103;
                                            }
                                            goto LAB_0125cb2f;
                                          }
                                        }
                                        pcVar100 = (char *)0x0;
                                        if ((bVar90 & 0x20) != 0) {
                                          local_520 = (yyjson_val_uni *)0x0;
                                          pyVar118 = pyVar109;
                                          goto LAB_01259ac1;
                                        }
                                        sig_cut = pyVar109;
                                        pyVar93 = (yyjson_val_uni *)0x0;
                                        if ((bVar91 != 0x2e) ||
                                           (sig_cut = (yyjson_val_uni *)((long)pyVar81 + 0x14),
                                           pyVar93 = pyVar109,
                                           (digi_table[*(byte *)((long)pyVar81 + 0x14)] & 3) != 0))
                                        goto LAB_01259baa;
                                        goto LAB_0125bfdb;
                                      }
                                      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                                      pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0x12);
                                      if ((digi_table[bVar91] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        sig_cut = (yyjson_val_uni *)0x0;
                                        pyVar118 = pyVar109;
                                        local_520 = pyVar109;
                                        if (bVar91 != 0x2e) goto LAB_01259cab;
                                        goto LAB_0125be02;
                                      }
                                    }
                                    else {
                                      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                                      pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0x11);
                                      if ((digi_table[bVar91] & 0x30) != 0) {
                                        pcVar100 = (char *)0x0;
                                        sig_cut = (yyjson_val_uni *)0x0;
                                        pyVar118 = pyVar109;
                                        local_520 = pyVar109;
                                        if (bVar91 != 0x2e) goto LAB_01259cab;
                                        goto LAB_0125bdd9;
                                      }
                                    }
                                  }
                                  else {
                                    local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                                    pyVar109 = pyVar81 + 2;
                                    if ((digi_table[bVar91] & 0x30) != 0) {
                                      pcVar100 = (char *)0x0;
                                      sig_cut = (yyjson_val_uni *)0x0;
                                      pyVar118 = pyVar109;
                                      local_520 = pyVar109;
                                      if (bVar91 != 0x2e) goto LAB_01259cab;
                                      goto LAB_0125bdb0;
                                    }
                                  }
                                }
                                else {
                                  local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                                  pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0xf);
                                  if ((digi_table[bVar91] & 0x30) != 0) {
                                    pcVar100 = (char *)0x0;
                                    sig_cut = (yyjson_val_uni *)0x0;
                                    pyVar118 = pyVar109;
                                    local_520 = pyVar109;
                                    if (bVar91 != 0x2e) goto LAB_01259cab;
                                    goto LAB_0125bd87;
                                  }
                                }
                              }
                              else {
                                local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                                pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0xe);
                                if ((digi_table[bVar91] & 0x30) != 0) {
                                  pcVar100 = (char *)0x0;
                                  sig_cut = (yyjson_val_uni *)0x0;
                                  pyVar118 = pyVar109;
                                  local_520 = pyVar109;
                                  if (bVar91 != 0x2e) goto LAB_01259cab;
                                  goto LAB_0125bd5e;
                                }
                              }
                            }
                            else {
                              local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                              pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0xd);
                              if ((digi_table[bVar91] & 0x30) != 0) {
                                pcVar100 = (char *)0x0;
                                sig_cut = (yyjson_val_uni *)0x0;
                                pyVar118 = pyVar109;
                                local_520 = pyVar109;
                                if (bVar91 != 0x2e) goto LAB_01259cab;
                                goto LAB_0125bd35;
                              }
                            }
                          }
                          else {
                            local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                            pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0xc);
                            if ((digi_table[bVar91] & 0x30) != 0) {
                              pcVar100 = (char *)0x0;
                              sig_cut = (yyjson_val_uni *)0x0;
                              pyVar118 = pyVar109;
                              local_520 = pyVar109;
                              if (bVar91 != 0x2e) goto LAB_01259cab;
                              goto LAB_0125bd0c;
                            }
                          }
                        }
                        else {
                          local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                          pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 0xb);
                          if ((digi_table[bVar91] & 0x30) != 0) {
                            pcVar100 = (char *)0x0;
                            sig_cut = (yyjson_val_uni *)0x0;
                            pyVar118 = pyVar109;
                            local_520 = pyVar109;
                            if (bVar91 != 0x2e) goto LAB_01259cab;
                            goto LAB_0125bce3;
                          }
                        }
                      }
                      else {
                        local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                        pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 10);
                        if ((digi_table[bVar91] & 0x30) != 0) {
                          pcVar100 = (char *)0x0;
                          sig_cut = (yyjson_val_uni *)0x0;
                          pyVar118 = pyVar109;
                          local_520 = pyVar109;
                          if (bVar91 != 0x2e) goto LAB_01259cab;
                          goto LAB_0125bcba;
                        }
                      }
                    }
                    else {
                      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                      pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 9);
                      if ((digi_table[bVar91] & 0x30) != 0) {
                        pcVar100 = (char *)0x0;
                        sig_cut = (yyjson_val_uni *)0x0;
                        pyVar118 = pyVar109;
                        local_520 = pyVar109;
                        if (bVar91 != 0x2e) goto LAB_01259cab;
                        goto LAB_0125bc91;
                      }
                    }
                  }
                  else {
                    local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                    pyVar109 = pyVar81 + 1;
                    if ((digi_table[bVar91] & 0x30) != 0) {
                      pcVar100 = (char *)0x0;
                      sig_cut = (yyjson_val_uni *)0x0;
                      pyVar118 = pyVar109;
                      local_520 = pyVar109;
                      if (bVar91 != 0x2e) goto LAB_01259cab;
                      goto LAB_0125bc68;
                    }
                  }
                }
                else {
                  local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                  pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 7);
                  if ((digi_table[bVar91] & 0x30) != 0) {
                    pcVar100 = (char *)0x0;
                    sig_cut = (yyjson_val_uni *)0x0;
                    pyVar118 = pyVar109;
                    local_520 = pyVar109;
                    if (bVar91 != 0x2e) goto LAB_01259cab;
                    goto LAB_0125bc3f;
                  }
                }
              }
              else {
                local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
                pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 6);
                if ((digi_table[bVar91] & 0x30) != 0) {
                  pcVar100 = (char *)0x0;
                  sig_cut = (yyjson_val_uni *)0x0;
                  pyVar118 = pyVar109;
                  local_520 = pyVar109;
                  if (bVar91 != 0x2e) goto LAB_01259cab;
                  goto LAB_0125bc16;
                }
              }
            }
            else {
              local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
              pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 5);
              if ((digi_table[bVar91] & 0x30) != 0) {
                pcVar100 = (char *)0x0;
                sig_cut = (yyjson_val_uni *)0x0;
                pyVar118 = pyVar109;
                local_520 = pyVar109;
                if (bVar91 != 0x2e) goto LAB_01259cab;
                goto LAB_0125bbed;
              }
            }
          }
          else {
            local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
            pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 4);
            if ((digi_table[bVar91] & 0x30) != 0) {
              pcVar100 = (char *)0x0;
              sig_cut = (yyjson_val_uni *)0x0;
              pyVar118 = pyVar109;
              local_520 = pyVar109;
              if (bVar91 != 0x2e) goto LAB_01259cab;
              goto LAB_0125bbc4;
            }
          }
        }
        else {
          local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
          pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 3);
          if ((digi_table[bVar91] & 0x30) != 0) {
            pcVar100 = (char *)0x0;
            sig_cut = (yyjson_val_uni *)0x0;
            pyVar118 = pyVar109;
            local_520 = pyVar109;
            if (bVar91 != 0x2e) goto LAB_01259cab;
            goto LAB_0125bb9b;
          }
        }
      }
      else {
        local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
        pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 2);
        if ((digi_table[bVar91] & 0x30) != 0) {
          pcVar100 = (char *)0x0;
          sig_cut = (yyjson_val_uni *)0x0;
          pyVar118 = pyVar109;
          local_520 = pyVar109;
          if (bVar91 != 0x2e) goto LAB_01259cab;
          goto LAB_0125bb72;
        }
      }
      pyVar112->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
      uVar95 = -uVar107;
      if (cVar4 != '-') {
        uVar95 = uVar107;
      }
      pyVar112[1].u64 = uVar95;
    }
    else {
      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
      pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 1);
      if ((digi_table[bVar91] & 0x30) != 0) {
        pcVar100 = (char *)0x0;
        sig_cut = (yyjson_val_uni *)0x0;
        pyVar118 = pyVar109;
        local_520 = pyVar109;
        if (bVar91 != 0x2e) goto LAB_01259cab;
        goto LAB_0125bb49;
      }
      pyVar112->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
      if (cVar4 == '-') {
        uVar107 = 0x30 - uVar95;
      }
      pyVar112[1].u64 = uVar107;
    }
    local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
    local_560 = pyVar109;
    goto LAB_0125cb2f;
  }
  local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
  if (bVar91 != 0x30) {
    if ((flg & 0x10) == 0) goto LAB_0125bae1;
    if ((((bVar91 | 0x20) == 0x69) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x6e)) &&
       ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x66)) {
      uVar84 = (long)pyVar81 - (ulong)(cVar4 == '-');
      pyVar103 = (yyjson_val_uni *)((long)pyVar81 + 3);
      if ((((*(byte *)((long)pyVar81 + 3) | 0x20) == 0x69) &&
          ((*(byte *)((long)pyVar81 + 4) | 0x20) == 0x6e)) &&
         (((*(byte *)((long)pyVar81 + 5) | 0x20) == 0x69 &&
          (((*(byte *)((long)pyVar81 + 6) | 0x20) == 0x74 &&
           ((*(byte *)((long)pyVar81 + 7) | 0x20) == 0x79)))))) {
        pyVar103 = pyVar81 + 1;
      }
      if ((flg & 0xa0) == 0) {
        pyVar112->u64 = 0x14;
        uVar84 = ((ulong)(cVar4 != '-') << 0x3f) + 0xfff0000000000000;
      }
      else {
        if (*ppuVar113 != (u8 *)0x0) {
          **ppuVar113 = '\0';
        }
        *ppuVar113 = (u8 *)pyVar103;
        pyVar112->str = (char *)(((long)pyVar103 - uVar84) * 0x100 + 1);
      }
      pyVar112[1].u64 = uVar84;
      bVar76 = true;
      pyVar81 = pyVar103;
    }
    else {
      bVar76 = false;
    }
    bVar58 = true;
    if (!bVar76) {
      if ((((*(byte *)pyVar81 | 0x20) == 0x6e) && ((*(byte *)((long)pyVar81 + 1) | 0x20) == 0x61))
         && ((*(byte *)((long)pyVar81 + 2) | 0x20) == 0x6e)) {
        if ((flg & 0xa0) == 0) {
          pyVar112->u64 = 0x14;
          pcVar100 = (char *)(((ulong)(cVar4 != '-') << 0x3f) + -0x8000000000000);
        }
        else {
          pcVar100 = (char *)((long)pyVar81 - (ulong)(cVar4 == '-'));
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          *ppuVar113 = (u8 *)((long)pyVar81 + 3);
          pyVar112->str = (char *)((ulong)(cVar4 == '-') * 0x100 + 0x301);
        }
        pyVar112[1].str = pcVar100;
        pyVar81 = (yyjson_val_uni *)((long)pyVar81 + 3);
      }
      else {
        bVar58 = false;
      }
    }
    local_560 = pyVar81;
    if (bVar58) goto LAB_0125cb2f;
    goto LAB_0125bae1;
  }
  pyVar118 = (yyjson_val_uni *)((long)pyVar81 + 1);
  if ((digi_table[*(byte *)((long)pyVar81 + 1)] & 0x33) == 0) {
    pyVar112->str = (char *)((ulong)(cVar4 == '-') * 8 + 4);
    pyVar112[1].u64 = 0;
    local_560 = pyVar118;
    goto LAB_0125cb2f;
  }
  if (*(byte *)((long)pyVar81 + 1) != 0x2e) goto LAB_0125c33c;
  if ((digi_table[*(byte *)((long)pyVar81 + 2)] & 3) == 0) goto LAB_0125bfd7;
  pyVar118 = (yyjson_val_uni *)((long)local_560 + uVar107 + 1);
  do {
    pyVar103 = pyVar118;
    uVar107 = (ulong)*(byte *)((long)pyVar103 + 1);
    pyVar118 = (yyjson_val_uni *)((long)pyVar103 + 1);
  } while (uVar107 == 0x30);
  if ((digi_table[uVar107] & 3) == 0) {
LAB_0125c33c:
    if ((digi_table[*(byte *)pyVar118] & 3) != 0) goto LAB_0125c371;
    if ((digi_table[*(byte *)pyVar118] & 0x20) != 0) {
      yyjson_read_opts();
      pyVar118 = (yyjson_val_uni *)CONCAT44(local_460._4_4_,local_460.used);
      if ((extraout_RAX_02 & 1) == 0) goto LAB_0125c34e;
      goto LAB_0125bfec;
    }
LAB_0125c34e:
    local_548->u64 = 0x14;
    local_548[1].u64 = (ulong)((char)local_558 == '-') << 0x3f;
    pyVar79 = local_528;
    pyVar112 = local_548;
    pyVar102 = local_550;
    pyVar110 = local_538;
    pyVar99 = local_540;
    err = local_518;
    local_560 = pyVar118;
  }
  else {
    uVar107 = uVar107 - 0x30;
LAB_0125bb49:
    pyVar109 = (yyjson_val_uni *)((long)pyVar81 + 1);
    local_520 = (yyjson_val_uni *)((long)pyVar103 + 2);
    uVar95 = (ulong)*(byte *)((long)pyVar103 + 2) - 0x30;
    if (uVar95 < 10) {
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bb72:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 3);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 3) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bb9b:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 4);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 4) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bbc4:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 5);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 5) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bbed:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 6);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 6) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bc16:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 7);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 7) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bc3f:
      local_520 = pyVar103 + 1;
      if (9 < (ulong)*(byte *)(pyVar103 + 1) - 0x30) goto LAB_0125be47;
      uVar107 = ((ulong)*(byte *)(pyVar103 + 1) - 0x30) + uVar107 * 10;
LAB_0125bc68:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 9);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 9) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bc91:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 10);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 10) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bcba:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0xb);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0xb) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bce3:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0xc);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0xc) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bd0c:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0xd);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0xd) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bd35:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0xe);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0xe) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bd5e:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0xf);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0xf) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bd87:
      local_520 = pyVar103 + 2;
      if (9 < (ulong)*(byte *)(pyVar103 + 2) - 0x30) goto LAB_0125be47;
      uVar107 = ((ulong)*(byte *)(pyVar103 + 2) - 0x30) + uVar107 * 10;
LAB_0125bdb0:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0x11);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0x11) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125bdd9:
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0x12);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0x12) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
LAB_0125be02:
      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0x13);
      uVar95 = (ulong)*(byte *)((long)pyVar103 + 0x13) - 0x30;
      if (9 < uVar95) goto LAB_0125be47;
      uVar107 = uVar95 + uVar107 * 10;
      local_520 = (yyjson_val_uni *)((long)pyVar103 + 0x14);
      sig_cut = local_520;
      pyVar93 = pyVar109;
      if ((digi_table[*(byte *)((long)pyVar103 + 0x14)] & 3) == 0) goto LAB_0125be47;
LAB_01259baa:
      pcVar100 = (char *)((long)sig_cut * 0x100 + (long)local_560 * -0x100 + 1);
      pyVar81 = (yyjson_val_uni *)((long)sig_cut + 1);
      do {
        pyVar118 = pyVar81;
        pyVar81 = (yyjson_val_uni *)((long)pyVar118 + 1);
        pcVar100 = pcVar100 + 0x100;
      } while ((digi_table[*(byte *)pyVar118] & 3) != 0);
      uVar107 = uVar107 + (0x34 < *(byte *)sig_cut);
      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
      pyVar109 = pyVar93;
      if (pyVar93 != (yyjson_val_uni *)0x0) {
LAB_01259c5b:
        pyVar103 = pyVar118;
        do {
          do {
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + -1);
          } while (*(char *)pyVar103 == '0');
        } while (*(char *)pyVar103 == '.');
        pcVar100 = (char *)((long)pyVar109 + ((ulong)(pyVar109 < sig_cut) - (long)sig_cut));
        local_520 = pyVar118;
        if (pyVar103 < sig_cut) {
          sig_cut = (yyjson_val_uni *)0x0;
          local_520 = (yyjson_val_uni *)0x0;
        }
        if ((digi_table[*(byte *)pyVar118] & 0x20) != 0) goto LAB_01259cab;
        goto LAB_01259d2b;
      }
      if ((-1 < cVar88) || ((digi_table[*(byte *)pyVar118] & 0x30) != 0)) {
        pyVar109 = pyVar118;
        if (*(byte *)pyVar118 != 0x2e) goto LAB_01259c5b;
        if ((digi_table[*(byte *)pyVar81] & 3) != 0) {
          do {
            pbVar2 = (byte *)((long)pyVar118 + 1);
            pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
          } while ((digi_table[*pbVar2] & 3) != 0);
          goto LAB_01259c5b;
        }
        goto LAB_0125a0e9;
      }
      if (*ppuVar113 != (u8 *)0x0) {
        **ppuVar113 = '\0';
      }
      pyVar112->str = pcVar100;
      pyVar112[1].str = (char *)local_560;
      *ppuVar113 = (u8 *)pyVar118;
      local_560 = pyVar118;
      goto LAB_0125cb2f;
    }
LAB_0125be47:
    local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
    if ((yyjson_val_uni *)((long)pyVar109 + 1) == local_520) {
      local_510 = "no digit after decimal point";
      local_560 = local_520;
      goto LAB_0125ab76;
    }
    pcVar100 = (char *)((long)pyVar109 + (1 - (long)local_520));
    pyVar118 = local_520;
    if ((digi_table[*(byte *)local_520] & 0x20) != 0) {
LAB_01259ac1:
      local_558 = (yyjson_val_uni *)CONCAT71(local_558._1_7_,cVar4);
      sig_cut = (yyjson_val_uni *)0x0;
LAB_01259cab:
      bVar91 = *(byte *)((long)pyVar118 + 1);
      uVar95 = (ulong)((digi_table[bVar91] & 0xc) != 0);
      if ((digi_table[*(byte *)((long)pyVar118 + uVar95 + 1)] & 3) == 0) goto LAB_0125ab63;
      pyVar118 = (yyjson_val_uni *)((long)pyVar118 + uVar95);
      pyVar103 = pyVar118;
      do {
        pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 1);
        pcVar3 = (char *)((long)pyVar118 + 1);
        pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
      } while (*pcVar3 == '0');
      uVar95 = (ulong)*(byte *)pyVar118;
      lVar96 = 0;
      if ((digi_table[uVar95] & 3) != 0) {
        lVar96 = 0;
        do {
          lVar96 = (ulong)(byte)((char)uVar95 - 0x30) + lVar96 * 10;
          uVar95 = (ulong)*(byte *)((long)pyVar118 + 1);
          pyVar118 = (yyjson_val_uni *)((long)pyVar118 + 1);
        } while ((digi_table[uVar95] & 3) != 0);
      }
      if ((long)pyVar118 - (long)pyVar103 < 0x13) {
        lVar97 = -lVar96;
        if (bVar91 != 0x2d) {
          lVar97 = lVar96;
        }
        pcVar100 = pcVar100 + lVar97;
LAB_01259d2b:
        if ((long)pcVar100 < -0x157) {
          pyVar112->u64 = 0x14;
          pyVar112[1].u64 = (ulong)((char)local_558 == '-') << 0x3f;
          local_560 = pyVar118;
          goto LAB_0125cb2f;
        }
        if ((long)pcVar100 < 0x135) goto LAB_01259d4a;
      }
      else if (bVar91 == 0x2d) {
        pyVar112->u64 = 0x14;
        pyVar112[1].u64 = (ulong)((char)local_558 == '-') << 0x3f;
        local_560 = pyVar118;
        goto LAB_0125cb2f;
      }
      if (cVar88 < '\0') {
        if (*ppuVar113 != (u8 *)0x0) {
          **ppuVar113 = '\0';
        }
        pyVar112->str = (char *)(((long)pyVar118 - (long)local_560) * 0x100 + 1);
        pyVar112[1].str = (char *)local_560;
        *ppuVar113 = (u8 *)pyVar118;
        local_560 = pyVar118;
      }
      else {
        if ((flg & 0x10) == 0) goto LAB_0125ac37;
        pyVar112->u64 = 0x14;
        pyVar112[1].str = (char *)(((ulong)((char)local_558 != '-') << 0x3f) + -0x10000000000000);
        local_560 = pyVar118;
      }
      goto LAB_0125cb2f;
    }
    if (-0x158 < (long)pcVar100) {
      sig_cut = (yyjson_val_uni *)0x0;
LAB_01259d4a:
      local_4d4 = (uint)pcVar100;
      if ((uVar107 >> 0x35 == 0) && (local_4d4 + 0x16 < 0x2d)) {
        if ((int)local_4d4 < 0) {
          dVar119 = (double)(long)uVar107 / *(double *)(f64_pow10_table + (ulong)-local_4d4 * 8);
        }
        else {
          dVar119 = (double)(long)uVar107 *
                    *(double *)(f64_pow10_table + (ulong)(local_4d4 & 0x7fffffff) * 8);
        }
        pyVar112->u64 = 0x14;
        dVar128 = -dVar119;
        if ((char)local_558 != '-') {
          dVar128 = dVar119;
        }
        pyVar112[1].u64 = (uint64_t)dVar128;
        local_560 = pyVar118;
        goto LAB_0125cb2f;
      }
      local_4f0 = pyVar109;
      local_530 = ppuVar113;
      if ((local_4d4 + 0x132 < 0x252) && (sig_cut == (yyjson_val_uni *)0x0)) {
        uVar95 = 0x3f;
        if (uVar107 != 0) {
          for (; uVar107 >> uVar95 == 0; uVar95 = uVar95 - 1) {
          }
        }
        uVar116 = uVar107 << ((byte)(uVar95 ^ 0x3f) & 0x3f);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar116;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8);
        auVar25 = auVar25 * auVar51;
        lVar96 = auVar25._8_8_;
        uVar82 = auVar25._0_8_;
        bVar76 = true;
        if (0x1fd < (ulong)(auVar25._8_4_ & 0x1ff) - 1) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar116;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8);
          lVar97 = SUB168(auVar26 * auVar52,8);
          bVar76 = false;
          if ((lVar97 + uVar82) - 1 < 0xfffffffffffffffe) {
            lVar96 = lVar96 + (ulong)(lVar97 + uVar82 < uVar82);
            bVar76 = true;
          }
        }
        if (bVar76) {
          uVar107 = lVar96 << (-1 < lVar96);
          uVar107 = (uVar107 & 0x400) + uVar107;
          pyVar112->u64 = 0x14;
          pyVar112[1].u64 =
               (ulong)((char)local_558 == '-') << 0x3f |
               uVar107 >> 0xb & 0xfffffffffffff |
               (ulong)(((((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) - (int)(uVar95 ^ 0x3f)) -
                       (uint)(-1 < lVar96)) + 0x47e + (uint)(uVar107 < 0x400)) << 0x34;
          local_560 = pyVar118;
          goto LAB_0125cb2f;
        }
      }
      local_4a0 = local_560;
      uVar95 = 0x3f;
      if (uVar107 != 0) {
        for (; uVar107 >> uVar95 == 0; uVar95 = uVar95 - 1) {
        }
      }
      bVar91 = (byte)(uVar95 ^ 0x3f);
      lVar96 = ((ulong)(sig_cut != (yyjson_val_uni *)0x0) << 2) << (bVar91 & 0x3f);
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           *(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2ae) * 8) -
           (*(long *)(pow10_sig_table + (long)(int)(local_4d4 * 2 + 0x2af) * 8) >> 0x3f);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar107 << (bVar91 & 0x3f);
      uVar116 = SUB168(auVar27 * auVar53,8) - (SUB168(auVar27 * auVar53,0) >> 0x3f);
      uVar82 = 0x3f;
      if (uVar116 != 0) {
        for (; uVar116 >> uVar82 == 0; uVar82 = uVar82 - 1) {
        }
      }
      bVar91 = (byte)(uVar82 ^ 0x3f);
      uVar116 = uVar116 << (bVar91 & 0x3f);
      uVar117 = (9 - (ulong)(lVar96 == 0)) + lVar96 << (bVar91 & 0x3f);
      iVar114 = (((int)(local_4d4 * 0x3526a + -0x3f0000) >> 0x10) -
                ((int)(uVar95 ^ 0x3f) + (int)(uVar82 ^ 0x3f))) + 0x40;
      iVar115 = 0xb;
      if (iVar114 < -0x43d) {
        iVar115 = 0x40;
        if (-0x472 < iVar114) {
          iVar115 = -0x432 - iVar114;
        }
      }
      local_4a8 = sig_cut;
      if (0x3c < iVar115) {
        bVar91 = (char)iVar115 - 0x3c;
        uVar116 = uVar116 >> (bVar91 & 0x3f);
        iVar114 = iVar114 + iVar115 + -0x3c;
        uVar117 = (uVar117 >> (bVar91 & 0x3f)) + 9;
        iVar115 = 0x3c;
      }
      bVar91 = (byte)iVar115;
      lVar96 = 8L << (bVar91 - 1 & 0x3f);
      uVar82 = (~(-1L << (bVar91 & 0x3f)) & uVar116) * 8;
      uVar95 = lVar96 + uVar117;
      pbVar101 = (bigint *)0x0;
      uVar116 = (ulong)(uVar95 <= uVar82) + (uVar116 >> (bVar91 & 0x3f));
      if (uVar116 != 0) {
        uVar9 = 0x3f;
        if (uVar116 != 0) {
          for (; uVar116 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        iVar115 = (iVar114 + iVar115) - (int)(uVar9 ^ 0x3f);
        pbVar101 = (bigint *)0x7ff0000000000000;
        if (iVar115 < 0x3c1) {
          uVar116 = (uVar116 << ((byte)(uVar9 ^ 0x3f) & 0x3f)) >> 0xb;
          if (iVar115 < -0x43d) {
            pbVar101 = (bigint *)0x0;
            if (-0x472 < iVar115) {
              pbVar101 = (bigint *)(uVar116 >> (-(char)iVar115 - 0x3dU & 0x3f));
            }
          }
          else {
            pbVar101 = (bigint *)(uVar116 & 0xfffffffffffff | (ulong)(iVar115 + 0x43e) << 0x34);
          }
        }
      }
      uVar84 = 0x7ff0000000000000;
      if (pbVar101 == (bigint *)0x7ff0000000000000) {
        if (cVar88 < '\0') {
          if (*ppuVar113 != (u8 *)0x0) {
            **ppuVar113 = '\0';
          }
          pyVar112->str = (char *)(((long)pyVar118 - (long)local_560) * 0x100 + 1);
          pyVar112[1].str = (char *)local_560;
          *ppuVar113 = (u8 *)pyVar118;
        }
        else {
          if ((flg & 0x10) == 0) {
LAB_0125ad1f:
            local_510 = "number is infinity when parsed as double";
            bVar76 = false;
            pyVar112 = local_548;
            pyVar110 = local_538;
            ppuVar113 = local_530;
            pyVar99 = local_540;
            local_560 = local_4a0;
            goto LAB_0125a086;
          }
          if ((char)local_558 == '-') {
            uVar84 = 0xfff0000000000000;
          }
          pyVar112->u64 = 0x14;
          pyVar112[1].u64 = uVar84;
        }
        bVar76 = true;
        local_560 = pyVar118;
      }
      else if ((lVar96 - uVar117 < uVar82) && (uVar82 < uVar95)) {
        uVar105 = 0xfffffbcd;
        if ((bigint *)0xfffffffffffff < pbVar101) {
          uVar105 = (uint)((ulong)pbVar101 >> 0x34) - 0x434;
        }
        pbVar86 = (bigint *)(((ulong)pbVar101 & 0xfffffffffffff) + 0x10000000000000);
        if ((bigint *)0xfffffffffffff >= pbVar101) {
          pbVar86 = pbVar101;
        }
        local_480 = &local_460;
        local_508 = pyVar80;
        local_498 = pbVar101;
        bigint_set_buf(local_480,uVar107,(i32 *)&local_4d4,(u8 *)&sig_cut->u64,(u8 *)&local_520->u64
                       ,(u8 *)&pyVar109->u64);
        __s = local_258.bits;
        local_258.used = 1;
        local_258.bits[0] = (long)pbVar86 * 2 + 1;
        if ((int)local_4d4 < 0) {
          iVar114 = -local_4d4;
          local_258.used = 1;
          iVar115 = iVar114;
          if ((int)local_4d4 < -0x12) {
            do {
              uVar107 = (ulong)local_258.used;
              uVar95 = 0;
              if (local_258.used != 0) {
                uVar95 = 0;
                do {
                  if (local_258.bits[uVar95] != 0) goto LAB_0125aef4;
                  uVar95 = uVar95 + 1;
                } while (local_258.used != (uint)uVar95);
                uVar95 = (ulong)local_258.used;
              }
LAB_0125aef4:
              if ((uint)uVar95 < local_258.used) {
                uVar95 = uVar95 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar98;
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = local_258.bits[uVar95];
                  auVar72 = ZEXT816(10000000000000000000) * auVar55 + auVar72;
                  uVar98 = auVar72._8_8_;
                  local_258.bits[uVar95] = auVar72._0_8_;
                  uVar95 = uVar95 + 1;
                } while (uVar107 != uVar95);
              }
              else {
                uVar98 = 0;
              }
              if (uVar98 != 0) {
                local_258.used = local_258.used + 1;
                local_258.bits[uVar107] = uVar98;
              }
              iVar115 = iVar114 + -0x13;
              bVar76 = 0x25 < iVar114;
              iVar114 = iVar115;
            } while (bVar76);
          }
          if (iVar115 != 0) {
            uVar95 = *(ulong *)(u64_pow10_table + (long)iVar115 * 8);
            uVar82 = (ulong)local_258.used;
            uVar107 = 0;
            if (uVar82 != 0) {
              uVar107 = 0;
              do {
                if (local_258.bits[uVar107] != 0) goto LAB_0125b794;
                uVar107 = uVar107 + 1;
              } while (local_258.used != (uint)uVar107);
              uVar107 = (ulong)local_258.used;
            }
LAB_0125b794:
            uVar98 = 0;
            if ((uint)uVar107 < local_258.used) {
              uVar107 = uVar107 & 0xffffffff;
              uVar98 = 0;
              do {
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar98;
                auVar29._8_8_ = 0;
                auVar29._0_8_ = uVar95;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = local_258.bits[uVar107];
                auVar74 = auVar29 * auVar57 + auVar74;
                uVar98 = auVar74._8_8_;
                local_258.bits[uVar107] = auVar74._0_8_;
                uVar107 = uVar107 + 1;
              } while (uVar82 != uVar107);
            }
            if (uVar98 != 0) {
              local_480 = &local_258;
              local_258.used = local_258.used + 1;
              goto LAB_0125b7de;
            }
          }
        }
        else {
          uVar77 = local_4d4;
          uVar106 = local_4d4;
          if (0x12 < (int)local_4d4) {
            do {
              uVar107 = (ulong)local_460.used;
              uVar95 = 0;
              if (local_460.used != 0) {
                uVar95 = 0;
                do {
                  if (local_460.bits[uVar95] != 0) goto LAB_0125ae05;
                  uVar95 = uVar95 + 1;
                } while (local_460.used != (uint)uVar95);
                uVar95 = (ulong)local_460.used;
              }
LAB_0125ae05:
              if ((uint)uVar95 < local_460.used) {
                uVar95 = uVar95 & 0xffffffff;
                uVar98 = 0;
                do {
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar98;
                  auVar54._8_8_ = 0;
                  auVar54._0_8_ = local_460.bits[uVar95];
                  auVar71 = ZEXT816(10000000000000000000) * auVar54 + auVar71;
                  uVar98 = auVar71._8_8_;
                  local_460.bits[uVar95] = auVar71._0_8_;
                  uVar95 = uVar95 + 1;
                } while (uVar107 != uVar95);
              }
              else {
                uVar98 = 0;
              }
              if (uVar98 != 0) {
                local_460.used = local_460.used + 1;
                local_460.bits[uVar107] = uVar98;
              }
              uVar77 = uVar106 - 0x13;
              bVar76 = 0x25 < (int)uVar106;
              uVar106 = uVar77;
            } while (bVar76);
          }
          if (uVar77 != 0) {
            uVar95 = *(ulong *)(u64_pow10_table + (long)(int)uVar77 * 8);
            uVar82 = (ulong)local_460.used;
            uVar107 = 0;
            if (uVar82 != 0) {
              uVar107 = 0;
              do {
                if (local_460.bits[uVar107] != 0) goto LAB_0125afac;
                uVar107 = uVar107 + 1;
              } while (local_460.used != (uint)uVar107);
              uVar107 = (ulong)local_460.used;
            }
LAB_0125afac:
            uVar98 = 0;
            if ((uint)uVar107 < local_460.used) {
              uVar107 = uVar107 & 0xffffffff;
              uVar98 = 0;
              do {
                auVar73._8_8_ = 0;
                auVar73._0_8_ = uVar98;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar95;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = local_460.bits[uVar107];
                auVar73 = auVar28 * auVar56 + auVar73;
                uVar98 = auVar73._8_8_;
                local_460.bits[uVar107] = auVar73._0_8_;
                uVar107 = uVar107 + 1;
              } while (uVar82 != uVar107);
            }
            if (uVar98 != 0) {
              local_460.used = local_460.used + 1;
LAB_0125b7de:
              local_480->bits[uVar82] = uVar98;
            }
          }
        }
        if ((int)uVar105 < 1) {
          uVar105 = -uVar105;
          uVar77 = uVar105 >> 6;
          uVar95 = (ulong)local_460.used;
          if ((uVar105 & 0x3f) != 0) {
            __s = local_460.bits;
            local_460.bits[uVar95] = 0;
            sVar89 = (sbyte)(uVar105 & 0x3f);
            if (uVar95 != 0) {
              do {
                local_460.bits[(uVar105 >> 6) + (int)uVar95] =
                     local_460.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                     local_460.bits[uVar95] << sVar89;
                uVar95 = uVar95 - 1;
              } while (uVar95 != 0);
            }
            local_460.bits[uVar77] = local_460.bits[0] << sVar89;
            local_460.used =
                 (local_460.used + uVar77 + 1) -
                 (uint)(local_460.bits[local_460.used + uVar77] == 0);
            goto LAB_0125b944;
          }
          if (uVar95 != 0) {
            do {
              local_460.bits[((uVar105 >> 6) - 1) + (int)uVar95] = local_460.bits[uVar95 - 1];
              uVar95 = uVar95 - 1;
            } while (uVar95 != 0);
          }
          local_460.used = local_460.used + uVar77;
          if (0x3f < uVar105) {
            __s = local_460.bits;
            goto LAB_0125b94a;
          }
        }
        else {
          uVar77 = uVar105 >> 6;
          uVar95 = (ulong)local_258.used;
          if ((uVar105 & 0x3f) == 0) {
            yyjson_read_opts();
          }
          else {
            local_258.bits[uVar95] = 0;
            sVar89 = (sbyte)(uVar105 & 0x3f);
            if (uVar95 != 0) {
              do {
                local_258.bits[(uVar105 >> 6) + (int)uVar95] =
                     local_258.bits[uVar95 - 1] >> (0x40U - sVar89 & 0x3f) |
                     local_258.bits[uVar95] << sVar89;
                uVar95 = uVar95 - 1;
              } while (uVar95 != 0);
            }
            local_258.bits[uVar77] = local_258.bits[0] << sVar89;
            local_258.used =
                 (local_258.used + uVar77 + 1) -
                 (uint)(local_258.bits[local_258.used + uVar77] == 0);
LAB_0125b944:
            if (uVar105 < 0x40) goto LAB_0125b95f;
          }
LAB_0125b94a:
          switchD_00570541::default(__s,0,(ulong)(uVar77 - 1) * 8 + 8);
        }
LAB_0125b95f:
        uVar95 = (ulong)local_460.used;
        iVar115 = -1;
        if (local_258.used <= local_460.used) {
          iVar114 = 1;
          iVar115 = 1;
          if (local_460.used <= local_258.used) {
            do {
              if (uVar95 == 0) {
                iVar115 = 0;
                break;
              }
              uVar107 = local_460.bits[uVar95 - 1];
              uVar82 = local_258.bits[uVar95 - 1];
              iVar115 = iVar114;
              if (uVar107 >= uVar82 && uVar107 != uVar82) {
                iVar115 = 1;
              }
              if (uVar107 < uVar82) {
                iVar115 = -1;
              }
              uVar95 = uVar95 - 1;
              iVar114 = iVar115;
            } while (uVar107 == uVar82);
          }
        }
        if (iVar115 == 0) {
          uVar95 = (ulong)((uint)local_498 & 1);
        }
        else {
          uVar95 = (ulong)(0 < iVar115);
        }
        uVar95 = (long)local_498->bits + (uVar95 - 8);
        uVar84 = 0x7ff0000000000000;
        pyVar80 = local_508;
        if (uVar95 == 0x7ff0000000000000) {
          if (cVar88 < '\0') {
            if (*local_530 != (u8 *)0x0) {
              **local_530 = '\0';
            }
            local_548->str = (char *)(((long)pyVar118 - (long)local_4a0) * 0x100 + 1);
            local_548[1].str = (char *)local_4a0;
            *local_530 = (u8 *)pyVar118;
          }
          else {
            if ((flg & 0x10) == 0) goto LAB_0125ad1f;
            if ((char)local_558 == '-') {
              uVar84 = 0xfff0000000000000;
            }
            local_548->u64 = 0x14;
            local_548[1].u64 = uVar84;
          }
        }
        else {
          local_548->u64 = 0x14;
          local_548[1].u64 = uVar95 | (ulong)((char)local_558 == '-') << 0x3f;
        }
        bVar76 = true;
        pyVar112 = local_548;
        pyVar110 = local_538;
        ppuVar113 = local_530;
        pyVar99 = local_540;
        local_560 = pyVar118;
      }
      else {
        pyVar112->u64 = 0x14;
        pyVar112[1].u64 = (ulong)pbVar101 | (ulong)((char)local_558 == '-') << 0x3f;
        bVar76 = true;
        local_560 = pyVar118;
      }
LAB_0125a086:
      pyVar79 = local_528;
      pyVar102 = local_550;
      err = local_518;
      if (bVar76 == false) goto LAB_0125bfec;
      goto LAB_0125cb2f;
    }
    pyVar112->u64 = 0x14;
    pyVar112[1].u64 = (ulong)(cVar4 == '-') << 0x3f;
    local_560 = local_520;
  }
  goto LAB_0125cb2f;
LAB_0125bfd7:
  sig_cut = (yyjson_val_uni *)((long)pyVar81 + 2);
LAB_0125bfdb:
  local_510 = "no digit after decimal point";
  pyVar81 = sig_cut;
LAB_0125bfe2:
  local_4d4 = 0;
  local_560 = pyVar81;
  goto LAB_0125bfec;
LAB_012596ca:
  pyVar109 = local_560;
  if ((char_table[*(byte *)pyVar109] & 0xc) == 0) {
    pyVar103 = pyVar109 + 1;
    do {
      pyVar109 = pyVar103;
      if ((char_table[*(byte *)((long)pyVar109 + -7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -7);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -6);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -5);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -4);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -3);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -2);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + -1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + -1);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)pyVar109] & 0xc) != 0) goto LAB_01259810;
      if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
        goto LAB_01259810;
      }
      if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
        goto LAB_01259810;
      }
      pyVar103 = pyVar109 + 2;
    } while ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) == 0);
    pyVar109 = pyVar109 + 1;
  }
LAB_01259810:
  uVar95 = 0xd;
  pyVar103 = pyVar109;
  if (*(char *)pyVar109 == '\"') goto LAB_01259a07;
  local_538 = pyVar110;
  local_550 = pyVar102;
  local_530 = ppuVar113;
  local_508 = pyVar80;
  if (*(char *)pyVar109 < '\0') {
    uVar105 = *(uint *)pyVar109;
    local_560 = pyVar109;
    while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
           ((uVar105 & 0x200f) != 0x200d))) {
      puVar1 = (uint *)((long)local_560 + 3);
      local_560 = (yyjson_val_uni *)((long)local_560 + 3);
      uVar105 = *puVar1;
    }
    if ((char)uVar105 < '\0') {
      if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
        do {
          uVar105 = *(uint *)((long)local_560 + 2);
          local_560 = (yyjson_val_uni *)((long)local_560 + 2);
          if ((uVar105 & 0xc0e0) != 0x80c0) break;
        } while ((uVar105 & 0x1e) != 0);
      }
      if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
        while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
          uVar105 = *(uint *)((long)local_560 + 4);
          local_560 = (yyjson_val_uni *)((long)local_560 + 4);
          if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
        }
      }
      if (pyVar109 == local_560) {
        if ((flg & 0x40) == 0) goto LAB_0125bac0;
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      }
    }
    goto LAB_012596ca;
  }
LAB_0125b005:
  cVar4 = *(char *)pyVar109;
  if (cVar4 == '\\') {
    bVar91 = *(byte *)((long)pyVar109 + 1);
    if (bVar91 < 0x62) {
      if (bVar91 == 0x22) {
        *(char *)pyVar103 = '\"';
      }
      else if (bVar91 == 0x2f) {
        *(char *)pyVar103 = '/';
      }
      else {
        if (bVar91 != 0x5c) goto switchD_01250f58_caseD_6f;
        *(char *)pyVar103 = '\\';
      }
    }
    else {
      switch(bVar91) {
      case 0x6e:
        *(char *)pyVar103 = '\n';
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        goto switchD_01250f58_caseD_6f;
      case 0x72:
        *(char *)pyVar103 = '\r';
        break;
      case 0x74:
        *(char *)pyVar103 = '\t';
        break;
      case 0x75:
        uVar75 = CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 3)],
                          hex_conv_table[*(byte *)((long)pyVar109 + 5)]);
        if (((uVar75 | CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                hex_conv_table[*(byte *)((long)pyVar109 + 4)])) & 0xf0f0) != 0)
        goto LAB_0125b745;
        uVar105 = (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 2)],
                                 hex_conv_table[*(byte *)((long)pyVar109 + 4)]) << 4;
        uVar77 = uVar75 | uVar105;
        local_560 = (yyjson_val_uni *)((long)pyVar109 + 6);
        if ((uVar77 & 0xf800) == 0xd800) {
          if ((uVar77 & 0xdc00) == 0xd800) {
            if (*(short *)local_560 == 0x755c) {
              if (((CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                             hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]) |
                   CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                            hex_conv_table[*(byte *)((long)pyVar109 + 10)])) & 0xf0f0) == 0) {
                uVar105 = (CONCAT11(hex_conv_table[*(byte *)(pyVar109 + 1)],
                                    hex_conv_table[*(byte *)((long)pyVar109 + 10)]) & 0xfff) << 4 |
                          (uint)CONCAT11(hex_conv_table[*(byte *)((long)pyVar109 + 9)],
                                         hex_conv_table[*(byte *)((long)pyVar109 + 0xb)]);
                if ((uVar105 & 0xfc00) == 0xdc00) {
                  iVar115 = (uVar77 & 0xdbff) * 0x400;
                  uVar77 = iVar115 + uVar105 + 0xfca02400;
                  *(byte *)pyVar103 = (byte)(uVar77 >> 0x12) | 0xf0;
                  *(byte *)((long)pyVar103 + 1) = (byte)(uVar77 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)pyVar103 + 2) =
                       (byte)(uVar105 + iVar115 + 0x400 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)pyVar103 + 3) = (byte)uVar105 & 0x3f | 0x80;
                  pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 4);
                  local_560 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
                  goto LAB_0125b145;
                }
                goto LAB_0125bfb1;
              }
              goto LAB_0125bfa5;
            }
            goto LAB_0125bf99;
          }
          goto LAB_0125bf8d;
        }
        uVar105 = (uint)uVar75 | uVar105 & 0xffff;
        bVar91 = (byte)uVar77;
        if (uVar105 < 0x800) {
          if (uVar105 < 0x80) {
            *(byte *)pyVar103 = bVar91;
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 1);
          }
          else {
            *(byte *)pyVar103 = (byte)(uVar77 >> 6) | 0xc0;
            *(byte *)((long)pyVar103 + 1) = bVar91 & 0x3f | 0x80;
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
          }
        }
        else {
          *(byte *)pyVar103 = (byte)(uVar105 >> 0xc) | 0xe0;
          *(byte *)((long)pyVar103 + 1) = (byte)(uVar77 >> 6) & 0x3f | 0x80;
          *(byte *)((long)pyVar103 + 2) = bVar91 & 0x3f | 0x80;
          pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 3);
        }
        goto LAB_0125b145;
      default:
        if (bVar91 == 0x62) {
          *(char *)pyVar103 = '\b';
        }
        else {
          if (bVar91 != 0x66) goto switchD_01250f58_caseD_6f;
          *(char *)pyVar103 = '\f';
        }
      }
    }
    pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 1);
    local_560 = (yyjson_val_uni *)((long)pyVar109 + 2);
  }
  else {
    if (cVar4 == '\"') goto LAB_0125ba1e;
    if ((flg & 0x40) == 0) goto LAB_0125bf81;
    if (local_4e0 <= pyVar109) goto LAB_0125bf75;
    *(char *)pyVar103 = cVar4;
    pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 1);
    local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  }
LAB_0125b145:
  do {
    pyVar109 = local_560;
    if ((char_table[*(byte *)pyVar109] & 0xc) != 0) {
LAB_0125b3a8:
      while( true ) {
        if (-1 < *(char *)pyVar109) goto LAB_0125b005;
        uVar105 = *(uint *)pyVar109;
        local_560 = pyVar109;
        while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
               ((uVar105 & 0x200f) != 0x200d))) {
          *(uint *)pyVar103 = uVar105;
          pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 3);
          puVar1 = (uint *)((long)local_560 + 3);
          local_560 = (yyjson_val_uni *)((long)local_560 + 3);
          uVar105 = *puVar1;
        }
        if (-1 < (char)uVar105) break;
        if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
          do {
            *(short *)pyVar103 = (short)uVar105;
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
            uVar105 = *(uint *)((long)local_560 + 2);
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            if ((uVar105 & 0xc0e0) != 0x80c0) break;
          } while ((uVar105 & 0x1e) != 0);
        }
        if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
          while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
            *(uint *)pyVar103 = uVar105;
            pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 4);
            uVar105 = *(uint *)((long)local_560 + 4);
            local_560 = (yyjson_val_uni *)((long)local_560 + 4);
            if (((uVar105 & 0x3007) == 0) || ((uVar105 & 0xc0c0c0f8) != 0x808080f0)) break;
          }
        }
        if (pyVar109 != local_560) break;
        if ((flg & 0x40) == 0) goto LAB_0125b72f;
LAB_0125b496:
        *(undefined2 *)pyVar103 = *(undefined2 *)local_560;
        pyVar109 = (yyjson_val_uni *)((long)local_560 + 1);
        pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 1);
      }
      goto LAB_0125b145;
    }
    local_560 = pyVar109;
    if ((char_table[*(byte *)((long)pyVar109 + 1)] & 0xc) != 0) goto LAB_0125b496;
    if ((char_table[*(byte *)((long)pyVar109 + 2)] & 0xc) != 0) {
      uVar6 = *(undefined2 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
      *(undefined2 *)pyVar103 = uVar6;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 2);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 3)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
      *(undefined4 *)pyVar103 = uVar7;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 3);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 4)] & 0xc) != 0) {
      uVar7 = *(undefined4 *)pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
      *(undefined4 *)pyVar103 = uVar7;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 4);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 5)] & 0xc) != 0) {
      *(undefined4 *)pyVar103 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar103 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 5);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 5);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 6)] & 0xc) != 0) {
      *(undefined4 *)pyVar103 = *(undefined4 *)pyVar109;
      *(undefined2 *)((long)pyVar103 + 4) = *(undefined2 *)((long)pyVar109 + 4);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 6);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 6);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 7)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 7);
      *pyVar103 = yVar8;
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 7);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)(pyVar109 + 1)] & 0xc) != 0) {
      yVar8 = *pyVar109;
      pyVar109 = pyVar109 + 1;
      *pyVar103 = yVar8;
      pyVar103 = pyVar103 + 1;
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 9)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined2 *)(pyVar103 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 9);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 9);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 10)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined2 *)(pyVar103 + 1) = *(undefined2 *)(pyVar109 + 1);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 10);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 10);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xb)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined4 *)(pyVar103 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 0xb);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xb);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xc)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined4 *)(pyVar103 + 1) = *(undefined4 *)(pyVar109 + 1);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 0xc);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xc);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xd)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined4 *)(pyVar103 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar103 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 0xd);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xd);
      goto LAB_0125b3a8;
    }
    if ((char_table[*(byte *)((long)pyVar109 + 0xe)] & 0xc) != 0) {
      *pyVar103 = *pyVar109;
      *(undefined4 *)(pyVar103 + 1) = *(undefined4 *)(pyVar109 + 1);
      *(undefined2 *)((long)pyVar103 + 0xc) = *(undefined2 *)((long)pyVar109 + 0xc);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 0xe);
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xe);
      goto LAB_0125b3a8;
    }
    bVar91 = char_table[*(byte *)((long)pyVar109 + 0xf)];
    yVar8 = pyVar109[1];
    *pyVar103 = *pyVar109;
    pyVar103[1] = yVar8;
    if ((bVar91 & 0xc) != 0) {
      pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 0xf);
      pyVar103 = (yyjson_val_uni *)((long)pyVar103 + 0xf);
      goto LAB_0125b3a8;
    }
    pyVar103 = pyVar103 + 2;
    local_560 = pyVar109 + 2;
  } while( true );
LAB_0125bac0:
  local_510 = "invalid UTF-8 encoding in string";
  goto LAB_0125b656;
LAB_0125ba1e:
  uVar95 = 5;
LAB_01259a07:
  pyVar112->u64 = ((long)pyVar103 - (long)pyVar79) * 0x100 | uVar95;
  pyVar112[1].str = (char *)pyVar79;
  *(char *)pyVar103 = '\0';
  pyVar79 = local_528;
  pyVar99 = local_540;
  err = local_518;
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  goto LAB_0125cb2f;
LAB_0125bf81:
  local_510 = "unexpected control character in string";
  local_560 = pyVar109;
  goto LAB_0125b656;
LAB_0125bf75:
  local_510 = "unclosed string";
  local_560 = pyVar109;
  goto LAB_0125b656;
LAB_0125b745:
  local_510 = "invalid escaped sequence in string";
  local_560 = pyVar109;
  goto LAB_0125b656;
switchD_01250f58_caseD_6f:
  local_510 = "invalid escaped character in string";
  local_560 = (yyjson_val_uni *)((long)pyVar109 + 1);
  goto LAB_0125b656;
LAB_0125b72f:
  local_510 = "invalid UTF-8 encoding in string";
  goto LAB_0125b656;
LAB_0125ca91:
  bVar76 = *(short *)local_560 == 0x2a2f;
  pyVar80 = local_508;
  goto LAB_0125ca9b;
LAB_01255f96:
  while( true ) {
    bVar91 = *(byte *)local_560;
    if (bVar91 == 0x2c) {
      local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      goto LAB_012556a6;
    }
    local_548 = pyVar112;
    local_530 = ppuVar113;
    if (bVar91 == 0x7d) break;
    local_528 = pyVar79;
    if ((char_table[bVar91] & 1) == 0) {
      err = local_518;
      if ((flg & 8) == 0) goto LAB_012561f3;
      bVar76 = skip_spaces_and_comments((u8 **)&local_560);
      if (!bVar76) goto LAB_012573a2;
    }
    else {
      do {
        local_560 = (yyjson_val_uni *)((long)local_560 + 1);
      } while ((char_table[*(byte *)local_560] & 1) != 0);
    }
    pyVar79 = local_528;
    pyVar112 = local_548;
    ppuVar113 = local_530;
    if (*(short *)local_560 == 0xa2c) goto LAB_01255f8d;
  }
  local_560 = (yyjson_val_uni *)((long)local_560 + 1);
  goto LAB_01256ce9;
LAB_012561f3:
  pyVar112 = local_4e0;
  pyVar79 = local_4f8;
  pyVar102 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,6,flg)
  ;
  if (bVar76) {
    pyVar102 = pyVar112;
  }
  pcVar100 = "unexpected character";
  if (bVar76) {
    pcVar100 = "unexpected end of data";
  }
  sVar104 = (long)pyVar102 - (long)pyVar79;
LAB_0125c803:
  pyVar87 = err;
  if (err == (yyjson_read_err *)0x0) {
    pyVar87 = &local_4c0;
  }
  pyVar87->pos = sVar104;
  local_500->code = 6 - bVar76;
  pyVar87->msg = pcVar100;
  pyVar87 = local_500;
  goto LAB_0125c82a;
LAB_01255bf2:
  do {
    do {
      local_560 = pyVar109;
      if ((char_table[*(byte *)local_560] & 0xc) == 0) {
        pyVar112 = local_560 + 1;
        do {
          local_560 = pyVar112;
          if ((char_table[*(byte *)((long)local_560 + -7)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -7);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -6)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -6);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -5)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -5);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -4)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -4);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -3)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -3);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -2)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -2);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + -1)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + -1);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)local_560] & 0xc) != 0) goto LAB_01255d38;
          if ((char_table[*(byte *)((long)local_560 + 1)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 1);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 2)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 2);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 3)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 3);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 4)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 4);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 5)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 5);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 6)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 6);
            goto LAB_01255d38;
          }
          if ((char_table[*(byte *)((long)local_560 + 7)] & 0xc) != 0) {
            local_560 = (yyjson_val_uni *)((long)local_560 + 7);
            goto LAB_01255d38;
          }
          pyVar112 = local_560 + 2;
        } while ((char_table[*(byte *)(local_560 + 1)] & 0xc) == 0);
        local_560 = local_560 + 1;
      }
LAB_01255d38:
      uVar95 = 0xd;
      pyVar112 = local_560;
      if (*(char *)local_560 == '\"') goto LAB_01255f59;
      local_538 = pyVar110;
      local_550 = pyVar102;
      local_540 = pyVar103;
      if (-1 < *(char *)local_560) goto LAB_01257960;
      uVar105 = *(uint *)local_560;
      pyVar109 = local_560;
      while ((((uVar105 & 0xc0c0f0) == 0x8080e0 && ((uVar105 & 0x200f) != 0)) &&
             ((uVar105 & 0x200f) != 0x200d))) {
        puVar1 = (uint *)((long)pyVar109 + 3);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 3);
        uVar105 = *puVar1;
      }
      local_508 = pyVar80;
    } while (-1 < (char)uVar105);
    if ((uVar105 & 0x1e) != 0 && (uVar105 & 0xc0e0) == 0x80c0) {
      do {
        uVar105 = *(uint *)((long)pyVar109 + 2);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 2);
        if ((uVar105 & 0xc0e0) != 0x80c0) break;
      } while ((uVar105 & 0x1e) != 0);
    }
    if ((uVar105 & 0x3007) != 0 && (uVar105 & 0xc0c0c0f8) == 0x808080f0) {
      while (((byte)uVar105 >> 2 & (uVar105 & 0x3003) != 0) == 0) {
        uVar105 = *(uint *)((long)pyVar109 + 4);
        pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 4);
        if (((uVar105 & 0xc0c0c0f8) != 0x808080f0) || ((uVar105 & 0x3007) == 0)) break;
      }
    }
  } while (local_560 != pyVar109);
  if ((flg & 0x40) != 0) {
    pyVar109 = (yyjson_val_uni *)((long)pyVar109 + 1);
    goto LAB_01255bf2;
  }
LAB_012587af:
  local_510 = "invalid UTF-8 encoding in string";
  local_560 = pyVar109;
LAB_0125b656:
  pyVar79 = local_560;
  bVar76 = is_truncated_end((u8 *)&local_4f8->u64,(u8 *)&local_560->u64,(u8 *)&local_4e0->u64,10,flg
                           );
  if (bVar76) {
    pyVar87 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = (long)local_4e0 - (long)local_4f8;
    local_500->code = 5;
    pcVar100 = "unexpected end of data";
  }
  else {
    pyVar87 = local_518;
    if (local_518 == (yyjson_read_err *)0x0) {
      pyVar87 = &local_4c0;
    }
    pyVar87->pos = (long)pyVar79 - (long)local_4f8;
    local_500->code = 10;
    pcVar100 = local_510;
  }
  pyVar87 = local_518;
  if (local_518 == (yyjson_read_err *)0x0) {
    pyVar87 = &local_4c0;
  }
  pyVar87->msg = pcVar100;
  pyVar80 = local_508;
joined_r0x0125cb19:
  if (pyVar80 != (yyjson_doc *)0x0) {
    (*local_4d0)(local_4e8,pyVar80);
  }
  pyVar80 = (yyjson_doc *)0x0;
  pyVar87 = local_500;
  pyVar79 = local_4f8;
  err = local_518;
LAB_0125c844:
  if (pyVar80 != (yyjson_doc *)0x0) {
    *(undefined8 *)pyVar87 = 0;
    pyVar87->msg = (char *)0x0;
    pyVar87->pos = 0;
    return pyVar80;
  }
  if (err == (yyjson_read_err *)0x0) {
    err = &local_4c0;
  }
  if ((err->pos != 0) || (pyVar87->code == 2)) goto LAB_0125c97f;
  cVar88 = *(char *)pyVar79;
  if ((cVar88 == -0x11) &&
     ((*(char *)((long)pyVar79 + 1) == -0x45 && (*(char *)((long)pyVar79 + 2) == -0x41)))) {
    pcVar100 = "byte order mark (BOM) is not supported";
  }
  else {
    pyVar102 = pyVar79;
    if (3 < local_470) {
      if (cVar88 == -1) {
        if (((*(char *)((long)pyVar79 + 1) == -2) && (*(char *)((long)pyVar79 + 2) == '\0')) &&
           (*(char *)((long)pyVar79 + 3) == '\0')) goto LAB_0125c9a1;
      }
      else if (((cVar88 == '\0') && (pyVar102 = local_4f8, *(char *)((long)pyVar79 + 1) == '\0')) &&
              ((*(char *)((long)local_4f8 + 2) == -2 && (*(char *)((long)local_4f8 + 3) == -1)))) {
LAB_0125c9a1:
        pcVar100 = "UTF-32 encoding is not supported";
        goto LAB_0125c964;
      }
    }
    pyVar79 = pyVar102;
    if (local_470 == 1) goto LAB_0125c97f;
    if (cVar88 == -1) {
      if (*(char *)((long)pyVar102 + 1) != -2) goto LAB_0125c97f;
    }
    else if ((cVar88 != -2) || (pyVar79 = local_4f8, *(char *)((long)pyVar102 + 1) != -1))
    goto LAB_0125c97f;
    pcVar100 = "UTF-16 encoding is not supported";
  }
LAB_0125c964:
  pyVar87 = &local_4c0;
  if (local_518 != (yyjson_read_err *)0x0) {
    pyVar87 = local_518;
  }
  pyVar87->msg = pcVar100;
  pyVar79 = local_4f8;
LAB_0125c97f:
  if ((flg & 1) == 0) {
    (*local_4d0)(local_4e8,pyVar79);
  }
  return (yyjson_doc *)0x0;
}

Assistant:

yyjson_doc *yyjson_read_opts(char *dat,
                             usize len,
                             yyjson_read_flag flg,
                             const yyjson_alc *alc_ptr,
                             yyjson_read_err *err) {

#define return_err(_pos, _code, _msg) do { \
    err->pos = (usize)(_pos); \
    err->msg = _msg; \
    err->code = YYJSON_READ_ERROR_##_code; \
    if (!has_read_flag(INSITU) && hdr) alc.free(alc.ctx, (void *)hdr); \
    return NULL; \
} while (false)

    yyjson_read_err dummy_err;
    yyjson_alc alc;
    yyjson_doc *doc;
    u8 *hdr = NULL, *end, *cur;

    /* validate input parameters */
    if (!err) err = &dummy_err;
    if (likely(!alc_ptr)) {
        alc = YYJSON_DEFAULT_ALC;
    } else {
        alc = *alc_ptr;
    }
    if (unlikely(!dat)) {
        return_err(0, INVALID_PARAMETER, "input data is NULL");
    }
    if (unlikely(!len)) {
        return_err(0, INVALID_PARAMETER, "input length is 0");
    }

    /* add 4-byte zero padding for input data if necessary */
    if (has_read_flag(INSITU)) {
        hdr = (u8 *)dat;
        end = (u8 *)dat + len;
        cur = (u8 *)dat;
    } else {
        if (unlikely(len >= USIZE_MAX - YYJSON_PADDING_SIZE)) {
            return_err(0, MEMORY_ALLOCATION, "memory allocation failed");
        }
        hdr = (u8 *)alc.malloc(alc.ctx, len + YYJSON_PADDING_SIZE);
        if (unlikely(!hdr)) {
            return_err(0, MEMORY_ALLOCATION, "memory allocation failed");
        }
        end = hdr + len;
        cur = hdr;
        memcpy(hdr, dat, len);
        memset(end, 0, YYJSON_PADDING_SIZE);
    }

    /* skip empty contents before json document */
    if (unlikely(char_is_space_or_comment(*cur))) {
        if (has_read_flag(ALLOW_COMMENTS)) {
            if (!skip_spaces_and_comments(&cur)) {
                return_err(cur - hdr, INVALID_COMMENT,
                           "unclosed multiline comment");
            }
        } else {
            if (likely(char_is_space(*cur))) {
                while (char_is_space(*++cur));
            }
        }
        if (unlikely(cur >= end)) {
            return_err(0, EMPTY_CONTENT, "input data is empty");
        }
    }

    /* read json document */
    if (likely(char_is_container(*cur))) {
        if (char_is_space(cur[1]) && char_is_space(cur[2])) {
            doc = read_root_pretty(hdr, cur, end, alc, flg, err);
        } else {
            doc = read_root_minify(hdr, cur, end, alc, flg, err);
        }
    } else {
        doc = read_root_single(hdr, cur, end, alc, flg, err);
    }

    /* check result */
    if (likely(doc)) {
        memset(err, 0, sizeof(yyjson_read_err));
    } else {
        /* RFC 8259: JSON text MUST be encoded using UTF-8 */
        if (err->pos == 0 && err->code != YYJSON_READ_ERROR_MEMORY_ALLOCATION) {
            if ((hdr[0] == 0xEF && hdr[1] == 0xBB && hdr[2] == 0xBF)) {
                err->msg = "byte order mark (BOM) is not supported";
            } else if (len >= 4 &&
                       ((hdr[0] == 0x00 && hdr[1] == 0x00 &&
                         hdr[2] == 0xFE && hdr[3] == 0xFF) ||
                        (hdr[0] == 0xFF && hdr[1] == 0xFE &&
                         hdr[2] == 0x00 && hdr[3] == 0x00))) {
                err->msg = "UTF-32 encoding is not supported";
            } else if (len >= 2 &&
                       ((hdr[0] == 0xFE && hdr[1] == 0xFF) ||
                        (hdr[0] == 0xFF && hdr[1] == 0xFE))) {
                err->msg = "UTF-16 encoding is not supported";
            }
        }
        if (!has_read_flag(INSITU)) alc.free(alc.ctx, (void *)hdr);
    }
    return doc;

#undef return_err
}